

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::Deconvolution_x86_avx::forward
          (Deconvolution_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined1 auVar12 [32];
  int iVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  undefined4 uVar23;
  uint uVar24;
  _func_int *p_Var25;
  int *piVar26;
  _func_int **pp_Var27;
  Layer *pLVar28;
  void *pvVar29;
  size_t sVar30;
  size_t sVar31;
  size_t sVar32;
  size_t sVar33;
  _func_int **pp_Var34;
  _func_int **pp_Var35;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined4 uVar50;
  undefined4 uVar51;
  Mat *pMVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  Allocator *pAVar58;
  long lVar59;
  ulong uVar60;
  int iVar61;
  int iVar62;
  ulong uVar63;
  int y_1;
  int iVar64;
  int iVar65;
  float *pfVar66;
  float *pfVar67;
  int w_2;
  ulong uVar68;
  undefined1 (*pauVar69) [32];
  undefined1 (*pauVar70) [16];
  Allocator *pAVar71;
  void *pvVar72;
  int iVar73;
  long lVar74;
  ulong uVar75;
  long lVar76;
  int y_3;
  uint uVar77;
  uint uVar78;
  int y;
  int iVar79;
  long lVar80;
  ulong uVar81;
  int iVar82;
  ulong uVar83;
  void *pvVar84;
  undefined1 auVar86 [16];
  float fVar85;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  float fVar101;
  float fVar130;
  float fVar131;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar132;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar163 [28];
  undefined1 auVar164 [28];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar165 [28];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  float fVar181;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar231;
  float fVar235;
  float fVar236;
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  float fVar237;
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar223 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar228 [32];
  float fVar229;
  float fVar230;
  float fVar232;
  float fVar233;
  float fVar234;
  undefined1 in_ZMM3 [64];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [64];
  undefined1 auVar258 [16];
  float fVar255;
  float fVar302;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  float fVar300;
  float fVar301;
  float fVar303;
  undefined1 in_ZMM7 [64];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [64];
  float fVar321;
  undefined1 auVar320 [64];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [64];
  float fVar336;
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  float fVar352;
  float fVar353;
  float fVar354;
  float fVar355;
  float fVar356;
  float fVar357;
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  int size;
  int h_2;
  int h;
  int outw;
  int outh;
  int outh_2;
  Option opt_b;
  long local_270;
  void *local_250;
  ulong local_248;
  int local_230;
  Allocator *local_228;
  long local_1e8;
  Allocator *local_1d0;
  Mat local_1a8;
  ulong local_160;
  int local_154;
  int local_150;
  int local_14c;
  _func_int **local_148;
  Option *local_140;
  Allocator *local_138;
  long local_130;
  Mat *local_128;
  long local_120;
  long *local_118;
  undefined4 uStack_110;
  int iStack_10c;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  long *local_f8;
  undefined4 uStack_f0;
  int iStack_ec;
  undefined8 uStack_e8;
  undefined4 local_e0;
  undefined8 local_d8;
  void *local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  int local_b0;
  Allocator *local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  int local_90;
  size_t local_88;
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uVar13;
  undefined4 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 auVar219 [32];
  undefined1 auVar222 [32];
  undefined1 auVar224 [32];
  undefined1 auVar227 [32];
  undefined1 auVar289 [32];
  undefined1 auVar294 [32];
  undefined1 auVar299 [32];
  undefined1 auVar333 [64];
  undefined1 auVar334 [64];
  undefined1 auVar335 [64];
  
  auVar182 = in_ZMM5._0_16_;
  iVar19 = bottom_blob->w;
  iVar20 = bottom_blob->h;
  uVar63 = bottom_blob->elemsize;
  local_160 = (ulong)bottom_blob->elempack;
  p_Var25 = this->_vptr_Deconvolution_x86_avx[-3];
  uVar77 = 1;
  if (opt->use_packing_layout == true) {
    uVar77 = 8;
    if ((*(uint *)(&this->field_0xd0 + (long)p_Var25) & 7) != 0) {
      uVar77 = (uint)((*(uint *)(&this->field_0xd0 + (long)p_Var25) & 3) == 0) * 3 + 1;
    }
  }
  iVar82 = *(int *)(&this->field_0xd4 + (long)p_Var25);
  local_150 = *(int *)(&this->field_0xdc + (long)p_Var25);
  iVar61 = *(int *)(&this->field_0xe4 + (long)p_Var25);
  local_14c = (*(int *)(&this->field_0xd8 + (long)p_Var25) + -1) *
              *(int *)(&this->field_0xe0 + (long)p_Var25);
  iVar62 = *(int *)(&this->field_0xe8 + (long)p_Var25);
  iVar64 = *(int *)(&this->field_0xfc + (long)p_Var25);
  iVar73 = *(int *)(&this->field_0x100 + (long)p_Var25);
  uVar81 = (long)*(int *)(&this->field_0xd0 + (long)p_Var25) / (long)(int)uVar77;
  iVar79 = (int)uVar81;
  local_1a8.cstep = 0;
  local_1a8.data = (Allocator *)0x0;
  local_1a8.refcount._0_4_ = 0;
  local_1a8.refcount._4_4_ = 0;
  local_1a8.elemsize._0_4_ = 0;
  local_1a8.elempack = 0;
  p_Var25 = this->_vptr_Deconvolution_x86_avx[-3];
  lVar80 = 0x10;
  local_1a8.elemsize._4_4_ = (int)local_1a8.refcount;
  local_1a8.allocator = (Allocator *)local_1a8.data;
  local_1a8.dims = (int)local_1a8.refcount;
  local_1a8.w = local_1a8.refcount._4_4_;
  local_1a8.h = (int)local_1a8.elemsize;
  local_1a8.d = (int)local_1a8.refcount;
  local_1a8.c = local_1a8.elempack;
  if ((((((*(int *)(&this->field_0xec + (long)p_Var25) < 1) &&
         (*(int *)(&this->field_0xf0 + (long)p_Var25) < 1)) &&
        (*(int *)(&this->field_0xf4 + (long)p_Var25) < 1)) &&
       (*(int *)(&this->field_0xf8 + (long)p_Var25) < 1)) &&
      ((*(int *)(&this->field_0x104 + (long)p_Var25) < 1 ||
       (*(int *)(&this->field_0x108 + (long)p_Var25) < 1)))) && (lVar80 = 8, &local_1a8 != top_blob)
     ) {
    piVar26 = top_blob->refcount;
    if (piVar26 != (int *)0x0) {
      LOCK();
      *piVar26 = *piVar26 + 1;
      UNLOCK();
    }
    local_1a8.data = top_blob->data;
    local_1a8.refcount._0_4_ = (int)top_blob->refcount;
    local_1a8.refcount._4_4_ = (uint)((ulong)top_blob->refcount >> 0x20);
    local_1a8.elemsize._0_4_ = (int)top_blob->elemsize;
    local_1a8.elemsize._4_4_ = (int)(top_blob->elemsize >> 0x20);
    local_1a8.elempack = top_blob->elempack;
    local_1a8.allocator = top_blob->allocator;
    uVar8 = top_blob->dims;
    uVar9 = top_blob->w;
    uVar10 = top_blob->h;
    uVar11 = top_blob->d;
    local_1a8.c = top_blob->c;
    local_1a8.cstep = top_blob->cstep;
    local_1a8.dims = uVar8;
    local_1a8.w = uVar9;
    local_1a8.h = uVar10;
    local_1a8.d = uVar11;
  }
  local_150 = (iVar82 + -1) * local_150;
  iVar64 = (iVar19 + -1) * iVar61 + local_150 + iVar64 + 1;
  local_140 = opt;
  local_128 = top_blob;
  Mat::create(&local_1a8,iVar64,iVar73 + (iVar20 + -1) * iVar62 + local_14c + 1,iVar79,
              (uVar63 / local_160) * (ulong)uVar77,uVar77,*(Allocator **)(&opt->lightmode + lVar80))
  ;
  iVar61 = local_1a8.h;
  iVar82 = local_1a8.w;
  iVar62 = -100;
  if (((Allocator *)local_1a8.data != (Allocator *)0x0) &&
     ((long)local_1a8.c * local_1a8.cstep != 0)) {
    local_148 = this->_vptr_Deconvolution_x86_avx;
    p_Var25 = local_148[-3];
    uVar21 = *(uint *)(&this->field_0xd4 + (long)p_Var25);
    uVar22 = *(uint *)(&this->field_0xd8 + (long)p_Var25);
    local_154 = uVar22 * uVar21;
    if (local_140->use_sgemm_convolution == true) {
      piVar26 = bottom_blob->refcount;
      local_c8 = bottom_blob->data;
      uStack_c0 = SUB84(bottom_blob->refcount,0);
      uStack_bc = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
      local_b8 = (undefined4)bottom_blob->elemsize;
      uStack_b4 = (undefined4)(bottom_blob->elemsize >> 0x20);
      local_b0 = bottom_blob->elempack;
      local_a8 = bottom_blob->allocator;
      uVar50 = bottom_blob->dims;
      uVar51 = bottom_blob->d;
      local_90 = bottom_blob->c;
      local_88 = bottom_blob->cstep;
      if (piVar26 != (int *)0x0) {
        LOCK();
        *piVar26 = *piVar26 + 1;
        UNLOCK();
      }
      local_a0 = CONCAT44(bottom_blob->h * bottom_blob->w,uVar50);
      uStack_98 = CONCAT44(uVar51,1);
      local_d8 = 0;
      local_118 = (long *)0x0;
      uStack_110 = 0;
      iStack_10c = 0;
      local_108 = 0;
      uStack_100 = 0;
      uStack_e8 = 0;
      auVar12[0] = local_140->lightmode;
      auVar12._1_3_ = *(undefined3 *)&local_140->field_0x1;
      auVar12._4_4_ = local_140->num_threads;
      auVar12._8_8_ = local_140->blob_allocator;
      uVar13 = local_140->workspace_allocator;
      uVar14 = local_140->openmp_blocktime;
      uVar15 = local_140->use_winograd_convolution;
      uVar16 = local_140->use_sgemm_convolution;
      uVar17 = local_140->use_int8_inference;
      uVar18 = local_140->use_vulkan_compute;
      auVar12[0x1f] = uVar18;
      auVar12[0x1e] = uVar17;
      auVar12[0x1d] = uVar16;
      auVar12[0x1c] = uVar15;
      auVar12._24_4_ = uVar14;
      auVar12._16_8_ = uVar13;
      local_58._0_1_ = local_140->use_bf16_storage;
      local_58._1_1_ = local_140->use_fp16_packed;
      local_58._2_1_ = local_140->use_fp16_storage;
      local_58._3_1_ = local_140->use_fp16_arithmetic;
      local_58._4_1_ = local_140->use_int8_packed;
      local_58._5_1_ = local_140->use_int8_storage;
      local_58._6_1_ = local_140->use_int8_arithmetic;
      local_58._7_1_ = local_140->use_packing_layout;
      uStack_50._0_1_ = local_140->use_shader_pack8;
      uStack_50._1_1_ = local_140->use_subgroup_basic;
      uStack_50._2_1_ = local_140->use_subgroup_vote;
      uStack_50._3_1_ = local_140->use_subgroup_ballot;
      uStack_50._4_1_ = local_140->use_subgroup_shuffle;
      uStack_50._5_1_ = local_140->use_image_storage;
      uStack_50._6_1_ = local_140->use_tensor_storage;
      uStack_50._7_1_ = local_140->use_reserved_0;
      uStack_48._0_4_ = local_140->flush_denormals;
      uStack_48._4_1_ = local_140->use_local_pool_allocator;
      uStack_48._5_1_ = local_140->use_shader_local_memory;
      uStack_48._6_1_ = local_140->use_cooperative_matrix;
      uStack_48._7_1_ = local_140->use_winograd23_convolution;
      uStack_40._0_1_ = local_140->use_winograd43_convolution;
      uStack_40._1_1_ = local_140->use_winograd63_convolution;
      uStack_40._2_1_ = local_140->use_a53_a55_optimized_kernel;
      uStack_40._3_1_ = local_140->use_reserved_7;
      uStack_40._4_1_ = local_140->use_reserved_8;
      uStack_40._5_1_ = local_140->use_reserved_9;
      uStack_40._6_1_ = local_140->use_reserved_10;
      uStack_40._7_1_ = local_140->use_reserved_11;
      local_78 = auVar12._0_8_;
      pAStack_70 = local_1a8.allocator;
      auStack_68 = auVar12._16_16_;
      uStack_104 = uStack_110;
      local_f8 = local_118;
      uStack_f0 = uStack_110;
      iStack_ec = iStack_10c;
      local_e0 = uStack_100;
      (*this->gemm->_vptr_Layer[7])(this->gemm,&local_c8,&local_118);
      auVar253 = _DAT_005910a0;
      auVar327 = _DAT_00591080;
      iVar82 = (iVar64 * *(int *)(&this->field_0xe8 + (long)this->_vptr_Deconvolution_x86_avx[-3]) -
               *(int *)(&this->field_0xe4 + (long)this->_vptr_Deconvolution_x86_avx[-3]) * iVar19) *
               uVar77;
      if (uVar77 == 1) {
        if (0 < iVar79) {
          uVar83 = CONCAT44(local_1a8.elemsize._4_4_,(int)local_1a8.elemsize);
          uVar75 = (long)local_1a8.h * (long)local_1a8.w;
          local_248 = 0;
          uVar63 = (uVar83 * uVar75 + 0xf & 0xfffffffffffffff0) / uVar83;
          if (local_1a8.dims == 4) {
            uVar63 = uVar75;
          }
          pp_Var27 = this->_vptr_Deconvolution_x86_avx;
          uVar77 = (int)uVar63 * local_1a8.d;
          uVar63 = 1;
          if (1 < iVar79) {
            uVar63 = uVar81 & 0xffffffff;
          }
          auVar87._8_8_ = 0;
          auVar87._0_8_ = (ulong)uVar77 - 1;
          auVar258 = vpshufd_avx(auVar87,0x44);
          uVar81 = auVar258._0_8_;
          auVar238._0_8_ = uVar81 ^ 0x8000000000000000;
          auVar238._8_4_ = auVar258._8_4_;
          uVar21 = auVar258._12_4_;
          auVar238._12_4_ = uVar21 ^ 0x80000000;
          auVar182 = vpcmpeqd_avx(auVar182,auVar182);
          pAVar71 = (Allocator *)local_1a8.data;
          do {
            p_Var25 = pp_Var27[-3];
            auVar258 = ZEXT816(0) << 0x40;
            if ((*(long *)(&this->field_0x1a8 + (long)p_Var25) != 0) &&
               ((long)*(int *)(&this->field_0x1e0 + (long)p_Var25) *
                *(long *)(&this->field_0x1e8 + (long)p_Var25) != 0)) {
              auVar258 = ZEXT416(*(uint *)(*(long *)(&this->field_0x1a8 + (long)p_Var25) +
                                          local_248 * 4));
            }
            if (0 < (int)uVar77) {
              auVar258 = vshufps_avx(auVar258,auVar258,0);
              auVar252._16_16_ = auVar258;
              auVar252._0_16_ = auVar258;
              uVar75 = 0;
              do {
                auVar256._8_8_ = 0;
                auVar256._0_8_ = uVar75;
                auVar258 = vpshufd_avx(auVar256,0x44);
                auVar283._16_16_ = auVar258;
                auVar283._0_16_ = auVar258;
                auVar94 = vorps_avx(auVar283,auVar327);
                auVar172 = vorps_avx(auVar283,auVar253);
                auVar309._0_8_ = auVar172._16_8_ ^ 0x8000000000000000;
                auVar309._8_4_ = auVar172._24_4_;
                auVar309._12_4_ = auVar172._28_4_ ^ 0x80000000;
                auVar258 = vpcmpgtq_avx(auVar309,auVar238);
                auVar314._0_8_ = uVar81 ^ 0x8000000000000000;
                auVar314._8_4_ = auVar238._8_4_;
                auVar314._12_4_ = uVar21 ^ 0x80000000;
                auVar257._0_8_ = auVar172._0_8_ ^ 0x8000000000000000;
                auVar257._8_4_ = auVar172._8_4_;
                auVar257._12_4_ = auVar172._12_4_ ^ 0x80000000;
                auVar323 = vpcmpgtq_avx(auVar257,auVar314);
                auVar258 = vpackssdw_avx(auVar323,auVar258);
                auVar310._0_8_ = auVar94._16_8_ ^ 0x8000000000000000;
                auVar310._8_4_ = auVar94._24_4_;
                auVar310._12_4_ = auVar94._28_4_ ^ 0x80000000;
                auVar323 = vpcmpgtq_avx(auVar310,auVar238);
                auVar315._0_8_ = uVar81 ^ 0x8000000000000000;
                auVar315._8_4_ = auVar238._8_4_;
                auVar315._12_4_ = uVar21 ^ 0x80000000;
                auVar304._0_8_ = auVar94._0_8_ ^ 0x8000000000000000;
                auVar304._8_4_ = auVar94._8_4_;
                auVar304._12_4_ = auVar94._12_4_ ^ 0x80000000;
                auVar305 = vpcmpgtq_avx(auVar304,auVar315);
                auVar323 = vpackssdw_avx(auVar305,auVar323);
                auVar258 = vpackssdw_avx(auVar323 ^ auVar182,auVar258 ^ auVar182);
                auVar323 = vpmovsxwd_avx(auVar258);
                auVar258 = vpunpckhwd_avx(auVar258,auVar258);
                auVar284._16_16_ = auVar258;
                auVar284._0_16_ = auVar323;
                auVar94 = vmaskmovps_avx(auVar284,auVar252);
                *(undefined1 (*) [32])((long)&pAVar71->_vptr_Allocator + uVar75 * 4) = auVar94;
                uVar75 = uVar75 + 8;
              } while ((uVar77 + 7 & 0xfffffff8) != uVar75);
            }
            if (0 < *(int *)(&this->field_0xd8 + (long)pp_Var27[-3])) {
              pfVar66 = (float *)(local_248 *
                                  (long)local_154 * (long)iStack_ec * CONCAT44(uStack_104,local_108)
                                 + (long)local_118);
              iVar61 = 0;
              do {
                p_Var25 = pp_Var27[-3];
                if (0 < *(int *)(&this->field_0xd4 + (long)p_Var25)) {
                  iVar62 = 0;
                  do {
                    if (0 < iVar20) {
                      pfVar67 = (float *)((long)(_func_int ***)local_1a8.data +
                                         (long)iVar62 *
                                         (long)*(int *)(&this->field_0xdc + (long)p_Var25) * 4 +
                                         (long)iVar61 *
                                         (long)*(int *)(&this->field_0xe0 + (long)p_Var25) *
                                         uVar83 * (long)local_1a8.w +
                                         local_1a8.cstep * uVar83 * local_248);
                      iVar64 = 0;
                      do {
                        iVar73 = iVar19;
                        if (0 < iVar19) {
                          do {
                            *pfVar67 = *pfVar67 + *pfVar66;
                            pfVar67 = pfVar67 + *(int *)(&this->field_0xe4 + (long)pp_Var27[-3]);
                            pfVar66 = pfVar66 + 1;
                            iVar73 = iVar73 + -1;
                          } while (iVar73 != 0);
                        }
                        pfVar67 = pfVar67 + iVar82;
                        iVar64 = iVar64 + 1;
                      } while (iVar64 != iVar20);
                    }
                    iVar62 = iVar62 + 1;
                    p_Var25 = pp_Var27[-3];
                  } while (iVar62 < *(int *)(&this->field_0xd4 + (long)p_Var25));
                }
                iVar61 = iVar61 + 1;
              } while (iVar61 < *(int *)(&this->field_0xd8 + (long)pp_Var27[-3]));
            }
            local_248 = local_248 + 1;
            pAVar71 = (Allocator *)((long)&pAVar71->_vptr_Allocator + local_1a8.cstep * uVar83);
          } while (local_248 != uVar63);
        }
      }
      else if (uVar77 == 4) {
        if (0 < iVar79) {
          pp_Var27 = this->_vptr_Deconvolution_x86_avx;
          lVar80 = (long)local_154;
          uVar63 = 0;
          do {
            pfVar66 = (float *)((long)iStack_ec * uVar63 * lVar80 * CONCAT44(uStack_104,local_108) +
                               (long)local_118);
            lVar74 = (long)local_1a8.w;
            uVar83 = CONCAT44(local_1a8.elemsize._4_4_,(int)local_1a8.elemsize);
            pAVar71 = (Allocator *)
                      ((long)(_func_int ***)local_1a8.data + local_1a8.cstep * uVar63 * uVar83);
            uVar68 = local_1a8.h * lVar74;
            uVar75 = (uVar83 * uVar68 + 0xf & 0xfffffffffffffff0) / uVar83;
            if (local_1a8.dims == 4) {
              uVar75 = uVar68;
            }
            p_Var25 = pp_Var27[-3];
            if ((*(long *)(&this->field_0x1a8 + (long)p_Var25) == 0) ||
               ((long)*(int *)(&this->field_0x1e0 + (long)p_Var25) *
                *(long *)(&this->field_0x1e8 + (long)p_Var25) == 0)) {
              uVar77 = local_1a8.d * (int)uVar75;
              if (0 < (int)uVar77) {
                memset(pAVar71,0,(ulong)uVar77 << 4);
              }
            }
            else {
              iVar61 = local_1a8.d * (int)uVar75;
              if (0 < iVar61) {
                auVar182 = *(undefined1 (*) [16])
                            (*(long *)(&this->field_0x1a8 + (long)p_Var25) + uVar63 * 0x10);
                pAVar58 = pAVar71;
                do {
                  *(undefined1 (*) [16])pAVar58 = auVar182;
                  pAVar58 = pAVar58 + 2;
                  iVar61 = iVar61 + -1;
                } while (iVar61 != 0);
              }
            }
            if (0 < *(int *)(&this->field_0xd8 + (long)pp_Var27[-3])) {
              iVar61 = 0;
              do {
                p_Var25 = pp_Var27[-3];
                if (0 < *(int *)(&this->field_0xd4 + (long)p_Var25)) {
                  iVar62 = 0;
                  do {
                    if (0 < iVar20) {
                      pauVar70 = (undefined1 (*) [16])
                                 ((long)&pAVar71->_vptr_Allocator +
                                 (long)(*(int *)(&this->field_0xdc + (long)p_Var25) * iVar62 * 4) *
                                 4 + (long)*(int *)(&this->field_0xe0 + (long)p_Var25) *
                                     (long)iVar61 * uVar83 * lVar74);
                      iVar64 = 0;
                      do {
                        iVar73 = iVar19;
                        if (0 < iVar19) {
                          do {
                            auVar86._0_4_ = *pfVar66 + *(float *)*pauVar70;
                            auVar86._4_4_ = pfVar66[1] + *(float *)(*pauVar70 + 4);
                            auVar86._8_4_ = pfVar66[2] + *(float *)(*pauVar70 + 8);
                            auVar86._12_4_ = pfVar66[3] + *(float *)(*pauVar70 + 0xc);
                            *pauVar70 = auVar86;
                            pauVar70 = pauVar70 + *(int *)(&this->field_0xe4 + (long)pp_Var27[-3]);
                            pfVar66 = pfVar66 + 4;
                            iVar73 = iVar73 + -1;
                          } while (iVar73 != 0);
                        }
                        pauVar70 = (undefined1 (*) [16])(*pauVar70 + (long)iVar82 * 4);
                        iVar64 = iVar64 + 1;
                      } while (iVar64 != iVar20);
                    }
                    iVar62 = iVar62 + 1;
                    p_Var25 = pp_Var27[-3];
                  } while (iVar62 < *(int *)(&this->field_0xd4 + (long)p_Var25));
                }
                iVar61 = iVar61 + 1;
              } while (iVar61 < *(int *)(&this->field_0xd8 + (long)pp_Var27[-3]));
            }
            uVar63 = uVar63 + 1;
          } while (uVar63 != (uVar81 & 0xffffffff));
        }
      }
      else if ((uVar77 == 8) && (0 < iVar79)) {
        pp_Var27 = this->_vptr_Deconvolution_x86_avx;
        lVar80 = (long)local_154;
        uVar63 = 0;
        do {
          pfVar66 = (float *)((long)iStack_ec * uVar63 * lVar80 * CONCAT44(uStack_104,local_108) +
                             (long)local_118);
          lVar74 = (long)local_1a8.w;
          uVar83 = CONCAT44(local_1a8.elemsize._4_4_,(int)local_1a8.elemsize);
          pAVar71 = (Allocator *)
                    ((long)(_func_int ***)local_1a8.data + local_1a8.cstep * uVar63 * uVar83);
          uVar68 = local_1a8.h * lVar74;
          uVar75 = (uVar83 * uVar68 + 0xf & 0xfffffffffffffff0) / uVar83;
          if (local_1a8.dims == 4) {
            uVar75 = uVar68;
          }
          p_Var25 = pp_Var27[-3];
          if ((*(long *)(&this->field_0x1a8 + (long)p_Var25) == 0) ||
             ((long)*(int *)(&this->field_0x1e0 + (long)p_Var25) *
              *(long *)(&this->field_0x1e8 + (long)p_Var25) == 0)) {
            uVar77 = local_1a8.d * (int)uVar75;
            if (0 < (int)uVar77) {
              memset(pAVar71,0,(ulong)uVar77 << 5);
            }
          }
          else {
            iVar61 = local_1a8.d * (int)uVar75;
            if (0 < iVar61) {
              auVar327 = *(undefined1 (*) [32])
                          (*(long *)(&this->field_0x1a8 + (long)p_Var25) + uVar63 * 0x20);
              pAVar58 = pAVar71;
              do {
                *(undefined1 (*) [32])pAVar58 = auVar327;
                pAVar58 = pAVar58 + 4;
                iVar61 = iVar61 + -1;
              } while (iVar61 != 0);
            }
          }
          if (0 < *(int *)(&this->field_0xd8 + (long)pp_Var27[-3])) {
            iVar61 = 0;
            do {
              p_Var25 = pp_Var27[-3];
              if (0 < *(int *)(&this->field_0xd4 + (long)p_Var25)) {
                iVar62 = 0;
                do {
                  if (0 < iVar20) {
                    pauVar69 = (undefined1 (*) [32])
                               ((long)&pAVar71->_vptr_Allocator +
                               (long)(*(int *)(&this->field_0xdc + (long)p_Var25) * iVar62 * 8) * 4
                               + (long)*(int *)(&this->field_0xe0 + (long)p_Var25) * (long)iVar61 *
                                 uVar83 * lVar74);
                    iVar64 = 0;
                    do {
                      iVar73 = iVar19;
                      if (0 < iVar19) {
                        do {
                          auVar93._0_4_ = *pfVar66 + *(float *)*pauVar69;
                          auVar93._4_4_ = pfVar66[1] + *(float *)(*pauVar69 + 4);
                          auVar93._8_4_ = pfVar66[2] + *(float *)(*pauVar69 + 8);
                          auVar93._12_4_ = pfVar66[3] + *(float *)(*pauVar69 + 0xc);
                          auVar93._16_4_ = pfVar66[4] + *(float *)(*pauVar69 + 0x10);
                          auVar93._20_4_ = pfVar66[5] + *(float *)(*pauVar69 + 0x14);
                          auVar93._24_4_ = pfVar66[6] + *(float *)(*pauVar69 + 0x18);
                          auVar93._28_4_ = pfVar66[7] + *(float *)(*pauVar69 + 0x1c);
                          *pauVar69 = auVar93;
                          pauVar69 = pauVar69 + *(int *)(&this->field_0xe4 + (long)pp_Var27[-3]);
                          pfVar66 = pfVar66 + 8;
                          iVar73 = iVar73 + -1;
                        } while (iVar73 != 0);
                      }
                      pauVar69 = (undefined1 (*) [32])(*pauVar69 + (long)iVar82 * 4);
                      iVar64 = iVar64 + 1;
                    } while (iVar64 != iVar20);
                  }
                  iVar62 = iVar62 + 1;
                  p_Var25 = pp_Var27[-3];
                } while (iVar62 < *(int *)(&this->field_0xd4 + (long)p_Var25));
              }
              iVar61 = iVar61 + 1;
            } while (iVar61 < *(int *)(&this->field_0xd8 + (long)pp_Var27[-3]));
          }
          uVar63 = uVar63 + 1;
        } while (uVar63 != (uVar81 & 0xffffffff));
      }
      pLVar28 = this->activation;
      if (pLVar28 != (Layer *)0x0) {
        (*pLVar28->_vptr_Layer[9])(pLVar28,&local_1a8,local_140);
      }
      piVar26 = (int *)CONCAT44(iStack_10c,uStack_110);
      if (piVar26 != (int *)0x0) {
        LOCK();
        *piVar26 = *piVar26 + -1;
        UNLOCK();
        if (*piVar26 == 0) {
          if (local_f8 == (long *)0x0) {
            if (local_118 != (long *)0x0) {
              free(local_118);
            }
          }
          else {
            (**(code **)(*local_f8 + 0x18))();
          }
        }
      }
      local_d8 = 0;
      local_118 = (long *)0x0;
      uStack_110 = 0;
      iStack_10c = 0;
      local_108 = 0;
      uStack_104 = 0;
      uStack_100 = 0;
      uStack_f0 = 0;
      iStack_ec = 0;
      uStack_e8 = 0;
      local_e0 = 0;
      piVar26 = (int *)CONCAT44(uStack_bc,uStack_c0);
      if (piVar26 != (int *)0x0) {
        LOCK();
        *piVar26 = *piVar26 + -1;
        UNLOCK();
        if (*piVar26 == 0) {
          if (local_a8 == (Allocator *)0x0) {
            if (local_c8 != (void *)0x0) {
              free(local_c8);
            }
          }
          else {
            (*local_a8->_vptr_Allocator[3])();
          }
        }
      }
      local_88 = 0;
      local_c8 = (void *)0x0;
      uStack_c0 = 0;
      uStack_bc = 0;
      local_b8 = 0;
      uStack_b4 = 0;
      local_b0 = 0;
      local_a0 = 0;
      uStack_98 = 0;
      local_90 = 0;
    }
    else {
      if ((((int)local_160 == 8) && (uVar77 == 8)) && (0 < (long)local_1a8.c)) {
        iVar19 = *(int *)(&this->field_0xdc + (long)p_Var25);
        iVar20 = *(int *)(&this->field_0xe0 + (long)p_Var25);
        iVar62 = *(int *)(&this->field_0xe4 + (long)p_Var25);
        iVar64 = *(int *)(&this->field_0xe8 + (long)p_Var25);
        uVar23 = *(undefined4 *)(&this->field_0x114 + (long)p_Var25);
        lVar80 = *(long *)(&this->field_0x1a8 + (long)p_Var25);
        local_270 = 0;
        auVar319 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar320 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar254 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        do {
          if (0 < local_1a8.h) {
            iVar73 = bottom_blob->w;
            iVar79 = bottom_blob->h;
            pAVar71 = (Allocator *)
                      ((long)(_func_int ***)local_1a8.data +
                      local_1a8.cstep * local_270 *
                      CONCAT44(local_1a8.elemsize._4_4_,(int)local_1a8.elemsize));
            uVar24 = bottom_blob->c;
            iVar65 = 0;
            do {
              if (0 < local_1a8.w) {
                uVar78 = 0;
                iVar57 = (1 - uVar21) * iVar19;
                do {
                  if (lVar80 == 0) {
                    auVar332 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  else {
                    auVar332 = ZEXT3264(*(undefined1 (*) [32])(lVar80 + local_270 * 0x20));
                  }
                  if (0 < (int)uVar24) {
                    pvVar84 = (void *)((this->weight_data_tm).cstep * local_270 *
                                       (this->weight_data_tm).elemsize +
                                      (long)(this->weight_data_tm).data);
                    pvVar29 = bottom_blob->data;
                    uVar63 = 0;
                    do {
                      if (0 < (int)uVar22) {
                        uVar83 = 0;
                        uVar81 = 0;
                        do {
                          iVar53 = (((int)uVar81 - uVar22) + 1) * iVar20 + iVar65;
                          if (((-1 < iVar53) && (iVar54 = iVar53 / iVar64, iVar53 % iVar64 == 0)) &&
                             ((0 < (int)uVar21 && (iVar54 < iVar79)))) {
                            lVar74 = (long)iVar54 * (long)bottom_blob->w * bottom_blob->elemsize +
                                     bottom_blob->cstep * bottom_blob->elemsize * uVar63;
                            uVar75 = uVar83;
                            uVar68 = (ulong)uVar21;
                            iVar53 = iVar57;
                            do {
                              if (((-1 < iVar53) && (iVar54 = iVar53 / iVar62, iVar53 % iVar62 == 0)
                                  ) && (iVar54 < iVar73)) {
                                lVar59 = (long)(iVar54 << 3);
                                fVar85 = *(float *)((long)pvVar29 + lVar59 * 4 + lVar74);
                                fVar101 = *(float *)((long)pvVar29 + lVar59 * 4 + lVar74 + 4);
                                fVar130 = *(float *)((long)pvVar29 + lVar59 * 4 + lVar74 + 8);
                                fVar131 = *(float *)((long)pvVar29 + lVar59 * 4 + lVar74 + 0xc);
                                fVar237 = *(float *)((long)pvVar29 + lVar59 * 4 + lVar74 + 0x10);
                                fVar132 = *(float *)((long)pvVar29 + lVar59 * 4 + lVar74 + 0x14);
                                fVar234 = *(float *)((long)pvVar29 + lVar59 * 4 + lVar74 + 0x18);
                                fVar236 = *(float *)((long)pvVar29 + lVar59 * 4 + lVar74 + 0x1c);
                                uVar60 = uVar75 & 0xffffffff;
                                pfVar66 = (float *)((long)pvVar84 + uVar60 * 4);
                                pfVar67 = (float *)((long)pvVar84 + uVar60 * 4 + 0x20);
                                pfVar1 = (float *)((long)pvVar84 + uVar60 * 4 + 0x40);
                                pfVar2 = (float *)((long)pvVar84 + uVar60 * 4 + 0x60);
                                pfVar3 = (float *)((long)pvVar84 + uVar60 * 4 + 0x80);
                                in_ZMM7 = ZEXT3264(CONCAT428(fVar131,CONCAT424(fVar237 * pfVar3[6],
                                                                               CONCAT420(fVar237 * 
                                                  pfVar3[5],
                                                  CONCAT416(fVar237 * pfVar3[4],
                                                            CONCAT412(fVar237 * pfVar3[3],
                                                                      CONCAT48(fVar237 * pfVar3[2],
                                                                               CONCAT44(fVar237 * 
                                                  pfVar3[1],fVar237 * *pfVar3))))))));
                                pfVar4 = (float *)((long)pvVar84 + uVar60 * 4 + 0xa0);
                                fVar235 = fVar130 + fVar131 + fVar130;
                                pfVar5 = (float *)((long)pvVar84 + uVar60 * 4 + 0xc0);
                                pfVar6 = (float *)((long)pvVar84 + uVar60 * 4 + 0xe0);
                                fVar181 = fVar234 * *pfVar5 + fVar236 * *pfVar6;
                                fVar229 = fVar234 * pfVar5[1] + fVar236 * pfVar6[1];
                                fVar230 = fVar234 * pfVar5[2] + fVar236 * pfVar6[2];
                                fVar231 = fVar234 * pfVar5[3] + fVar236 * pfVar6[3];
                                fVar232 = fVar234 * pfVar5[4] + fVar236 * pfVar6[4];
                                fVar233 = fVar234 * pfVar5[5] + fVar236 * pfVar6[5];
                                fVar234 = fVar234 * pfVar5[6] + fVar236 * pfVar6[6];
                                fVar236 = fVar235 + fVar130;
                                in_ZMM3 = ZEXT3264(CONCAT428(fVar236,CONCAT424(fVar234,CONCAT420(
                                                  fVar233,CONCAT416(fVar232,CONCAT412(fVar231,
                                                  CONCAT48(fVar230,CONCAT44(fVar229,fVar181))))))));
                                auVar332 = ZEXT3264(CONCAT428(auVar332._28_4_ + fVar85 +
                                                              fVar101 + fVar130 + fVar235 + fVar236,
                                                              CONCAT424(auVar332._24_4_ +
                                                                        fVar85 * pfVar66[6] +
                                                                        fVar101 * pfVar67[6] +
                                                                        fVar130 * pfVar1[6] +
                                                                        fVar131 * pfVar2[6] +
                                                                        fVar237 * pfVar3[6] +
                                                                        fVar132 * pfVar4[6] +
                                                                        fVar234,CONCAT420(auVar332.
                                                  _20_4_ + fVar85 * pfVar66[5] +
                                                  fVar101 * pfVar67[5] + fVar130 * pfVar1[5] +
                                                  fVar131 * pfVar2[5] + fVar237 * pfVar3[5] +
                                                  fVar132 * pfVar4[5] + fVar233,
                                                  CONCAT416(auVar332._16_4_ + fVar85 * pfVar66[4] +
                                                            fVar101 * pfVar67[4] +
                                                            fVar130 * pfVar1[4] +
                                                            fVar131 * pfVar2[4] +
                                                            fVar237 * pfVar3[4] +
                                                            fVar132 * pfVar4[4] + fVar232,
                                                            CONCAT412(auVar332._12_4_ +
                                                                      fVar85 * pfVar66[3] +
                                                                      fVar101 * pfVar67[3] +
                                                                      fVar130 * pfVar1[3] +
                                                                      fVar131 * pfVar2[3] +
                                                                      fVar237 * pfVar3[3] +
                                                                      fVar132 * pfVar4[3] + fVar231,
                                                                      CONCAT48(auVar332._8_4_ +
                                                                               fVar85 * pfVar66[2] +
                                                                               fVar101 * pfVar67[2]
                                                                               + fVar130 * pfVar1[2]
                                                                               + fVar131 * pfVar2[2]
                                                                                 + fVar237 * pfVar3[
                                                  2] + fVar132 * pfVar4[2] + fVar230,
                                                  CONCAT44(auVar332._4_4_ + fVar85 * pfVar66[1] +
                                                           fVar101 * pfVar67[1] +
                                                           fVar130 * pfVar1[1] +
                                                           fVar131 * pfVar2[1] + fVar237 * pfVar3[1]
                                                           + fVar132 * pfVar4[1] + fVar229,
                                                           auVar332._0_4_ + fVar85 * *pfVar66 +
                                                           fVar101 * *pfVar67 + fVar130 * *pfVar1 +
                                                           fVar131 * *pfVar2 + fVar237 * *pfVar3 +
                                                           fVar132 * *pfVar4 + fVar181))))))));
                              }
                              uVar75 = uVar75 + 0x40;
                              iVar53 = iVar53 + iVar19;
                              uVar68 = uVar68 - 1;
                            } while (uVar68 != 0);
                          }
                          uVar81 = uVar81 + 1;
                          uVar83 = uVar83 + (ulong)uVar21 * 0x40;
                        } while (uVar81 != uVar22);
                      }
                      pvVar84 = (void *)((long)pvVar84 + (long)(int)(uVar21 * uVar22 * 0x40) * 4);
                      uVar63 = uVar63 + 1;
                    } while (uVar63 != uVar24);
                  }
                  auVar327 = auVar332._0_32_;
                  auVar94 = auVar319._0_32_;
                  fVar255 = auVar332._8_4_;
                  fVar300 = auVar332._12_4_;
                  fVar301 = auVar332._16_4_;
                  fVar302 = auVar332._20_4_;
                  fVar303 = auVar332._24_4_;
                  fVar181 = auVar320._0_4_;
                  fVar229 = auVar320._4_4_;
                  fVar230 = auVar320._8_4_;
                  fVar231 = auVar320._12_4_;
                  fVar232 = auVar320._16_4_;
                  fVar233 = auVar320._20_4_;
                  fVar235 = auVar320._24_4_;
                  fVar321 = auVar320._28_4_;
                  auVar253 = auVar254._0_32_;
                  fVar85 = auVar254._0_4_;
                  fVar101 = auVar254._4_4_;
                  fVar130 = auVar254._8_4_;
                  fVar131 = auVar254._12_4_;
                  fVar237 = auVar254._16_4_;
                  fVar132 = auVar254._20_4_;
                  fVar234 = auVar254._24_4_;
                  fVar236 = auVar254._28_4_;
                  auVar333._28_36_ = auVar332._28_36_;
                  switch(uVar23) {
                  case 1:
                    auVar327 = vmaxps_avx(auVar327,auVar94);
                    break;
                  case 2:
                    auVar253 = vmaxps_avx(auVar327,auVar94);
                    in_ZMM7 = ZEXT3264(auVar253);
                    auVar94 = vminps_avx(auVar327,auVar94);
                    fVar85 = **(float **)(&this->field_0x118 + (long)p_Var25);
                    auVar327._0_4_ = fVar85 * auVar94._0_4_ + auVar253._0_4_;
                    auVar327._4_4_ = fVar85 * auVar94._4_4_ + auVar253._4_4_;
                    auVar327._8_4_ = fVar85 * auVar94._8_4_ + auVar253._8_4_;
                    auVar327._12_4_ = fVar85 * auVar94._12_4_ + auVar253._12_4_;
                    auVar327._16_4_ = fVar85 * auVar94._16_4_ + auVar253._16_4_;
                    auVar327._20_4_ = fVar85 * auVar94._20_4_ + auVar253._20_4_;
                    auVar327._24_4_ = fVar85 * auVar94._24_4_ + auVar253._24_4_;
                    auVar327._28_4_ = auVar94._28_4_ + auVar253._28_4_;
                    break;
                  case 3:
                    uVar7 = **(undefined4 **)(&this->field_0x118 + (long)p_Var25);
                    auVar287._4_4_ = uVar7;
                    auVar287._0_4_ = uVar7;
                    auVar287._8_4_ = uVar7;
                    auVar287._12_4_ = uVar7;
                    auVar287._16_4_ = uVar7;
                    auVar287._20_4_ = uVar7;
                    auVar287._24_4_ = uVar7;
                    auVar287._28_4_ = uVar7;
                    uVar7 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var25))[1];
                    auVar349._4_4_ = uVar7;
                    auVar349._0_4_ = uVar7;
                    auVar349._8_4_ = uVar7;
                    auVar349._12_4_ = uVar7;
                    auVar349._16_4_ = uVar7;
                    auVar349._20_4_ = uVar7;
                    auVar349._24_4_ = uVar7;
                    auVar349._28_4_ = uVar7;
                    auVar327 = vmaxps_avx(auVar327,auVar287);
                    in_ZMM7 = ZEXT3264(auVar327);
                    auVar327 = vminps_avx(auVar349,auVar327);
                    break;
                  case 4:
                    auVar288._0_8_ = auVar332._0_8_ ^ 0x8000000080000000;
                    auVar288._8_4_ = -fVar255;
                    auVar288._12_4_ = -fVar300;
                    auVar288._16_4_ = -fVar301;
                    auVar288._20_4_ = -fVar302;
                    auVar288._24_4_ = -fVar303;
                    auVar288._28_4_ = -auVar332._28_4_;
                    auVar169._8_4_ = 0x42b0c0a5;
                    auVar169._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar169._12_4_ = 0x42b0c0a5;
                    auVar169._16_4_ = 0x42b0c0a5;
                    auVar169._20_4_ = 0x42b0c0a5;
                    auVar169._24_4_ = 0x42b0c0a5;
                    auVar169._28_4_ = 0x42b0c0a5;
                    auVar327 = vminps_avx(auVar288,auVar169);
                    auVar170._8_4_ = 0xc2b0c0a5;
                    auVar170._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar170._12_4_ = 0xc2b0c0a5;
                    auVar170._16_4_ = 0xc2b0c0a5;
                    auVar170._20_4_ = 0xc2b0c0a5;
                    auVar170._24_4_ = 0xc2b0c0a5;
                    auVar170._28_4_ = 0xc2b0c0a5;
                    auVar94 = vmaxps_avx(auVar327,auVar170);
                    auVar326._0_4_ = auVar94._0_4_ * 1.442695 + fVar181;
                    auVar326._4_4_ = auVar94._4_4_ * 1.442695 + fVar229;
                    auVar326._8_4_ = auVar94._8_4_ * 1.442695 + fVar230;
                    auVar326._12_4_ = auVar94._12_4_ * 1.442695 + fVar231;
                    auVar326._16_4_ = auVar94._16_4_ * 1.442695 + fVar232;
                    auVar326._20_4_ = auVar94._20_4_ * 1.442695 + fVar233;
                    auVar326._24_4_ = auVar94._24_4_ * 1.442695 + fVar235;
                    auVar326._28_4_ = auVar332._28_4_ + fVar321;
                    auVar172 = vroundps_avx(auVar326,1);
                    auVar327 = vcmpps_avx(auVar326,auVar172,1);
                    auVar327 = vandps_avx(auVar327,auVar253);
                    auVar327 = vsubps_avx(auVar172,auVar327);
                    fVar255 = auVar327._0_4_ * -0.6931472 + auVar94._0_4_;
                    fVar300 = auVar327._4_4_ * -0.6931472 + auVar94._4_4_;
                    fVar301 = auVar327._8_4_ * -0.6931472 + auVar94._8_4_;
                    fVar302 = auVar327._12_4_ * -0.6931472 + auVar94._12_4_;
                    fVar303 = auVar327._16_4_ * -0.6931472 + auVar94._16_4_;
                    fVar336 = auVar327._20_4_ * -0.6931472 + auVar94._20_4_;
                    fVar352 = auVar327._24_4_ * -0.6931472 + auVar94._24_4_;
                    in_ZMM3 = ZEXT3264(CONCAT428(0x3ab743ce,
                                                 CONCAT424(0x3ab743ce,
                                                           CONCAT420(0x3ab743ce,
                                                                     CONCAT416(0x3ab743ce,
                                                                               CONCAT412(0x3ab743ce,
                                                                                         CONCAT48(
                                                  0x3ab743ce,0x3ab743ce3ab743ce)))))));
                    auVar259._0_4_ = (int)auVar327._0_4_;
                    auVar259._4_4_ = (int)auVar327._4_4_;
                    auVar259._8_4_ = (int)auVar327._8_4_;
                    auVar259._12_4_ = (int)auVar327._12_4_;
                    auVar289._16_4_ = (int)auVar327._16_4_;
                    auVar289._0_16_ = auVar259;
                    auVar289._20_4_ = (int)auVar327._20_4_;
                    auVar289._24_4_ = (int)auVar327._24_4_;
                    auVar289._28_4_ = (int)auVar327._28_4_;
                    auVar258 = vpslld_avx(auVar259,0x17);
                    auVar182 = vpslld_avx(auVar289._16_16_,0x17);
                    auVar88._8_4_ = 0x3f800000;
                    auVar88._0_8_ = 0x3f8000003f800000;
                    auVar88._12_4_ = 0x3f800000;
                    auVar182 = vpaddd_avx(auVar182,auVar88);
                    auVar258 = vpaddd_avx(auVar258,auVar88);
                    auVar171._0_4_ =
                         (fVar255 + fVar85 +
                         fVar255 * fVar255 *
                         (fVar181 +
                         ((((fVar255 * 0.00019875691 + 0.0013981999) * fVar255 + 0.008333452) *
                           fVar255 + 0.041665796) * fVar255 + 0.16666666) * fVar255)) *
                         auVar258._0_4_ + fVar85;
                    auVar171._4_4_ =
                         (fVar300 + fVar101 +
                         fVar300 * fVar300 *
                         (fVar229 +
                         ((((fVar300 * 0.00019875691 + 0.0013981999) * fVar300 + 0.008333452) *
                           fVar300 + 0.041665796) * fVar300 + 0.16666666) * fVar300)) *
                         auVar258._4_4_ + fVar101;
                    auVar171._8_4_ =
                         (fVar301 + fVar130 +
                         fVar301 * fVar301 *
                         (fVar230 +
                         ((((fVar301 * 0.00019875691 + 0.0013981999) * fVar301 + 0.008333452) *
                           fVar301 + 0.041665796) * fVar301 + 0.16666666) * fVar301)) *
                         auVar258._8_4_ + fVar130;
                    auVar171._12_4_ =
                         (fVar302 + fVar131 +
                         fVar302 * fVar302 *
                         (fVar231 +
                         ((((fVar302 * 0.00019875691 + 0.0013981999) * fVar302 + 0.008333452) *
                           fVar302 + 0.041665796) * fVar302 + 0.16666666) * fVar302)) *
                         auVar258._12_4_ + fVar131;
                    auVar171._16_4_ =
                         (fVar303 + fVar237 +
                         fVar303 * fVar303 *
                         (fVar232 +
                         ((((fVar303 * 0.00019875691 + 0.0013981999) * fVar303 + 0.008333452) *
                           fVar303 + 0.041665796) * fVar303 + 0.16666666) * fVar303)) *
                         auVar182._0_4_ + fVar237;
                    auVar171._20_4_ =
                         (fVar336 + fVar132 +
                         fVar336 * fVar336 *
                         (fVar233 +
                         ((((fVar336 * 0.00019875691 + 0.0013981999) * fVar336 + 0.008333452) *
                           fVar336 + 0.041665796) * fVar336 + 0.16666666) * fVar336)) *
                         auVar182._4_4_ + fVar132;
                    auVar171._24_4_ =
                         (fVar352 + fVar234 +
                         fVar352 * fVar352 *
                         (fVar235 +
                         ((((fVar352 * 0.00019875691 + 0.0013981999) * fVar352 + 0.008333452) *
                           fVar352 + 0.041665796) * fVar352 + 0.16666666) * fVar352)) *
                         auVar182._8_4_ + fVar234;
                    auVar171._28_4_ =
                         auVar172._28_4_ + auVar94._28_4_ + fVar236 + fVar321 + 0.21826287 + fVar236
                    ;
                    auVar94 = vrcpps_avx(auVar171);
                    in_ZMM7 = ZEXT3264(auVar94);
                    fVar85 = auVar94._0_4_;
                    fVar101 = auVar94._4_4_;
                    auVar39._4_4_ = auVar171._4_4_ * fVar101;
                    auVar39._0_4_ = auVar171._0_4_ * fVar85;
                    fVar130 = auVar94._8_4_;
                    auVar39._8_4_ = auVar171._8_4_ * fVar130;
                    fVar131 = auVar94._12_4_;
                    auVar39._12_4_ = auVar171._12_4_ * fVar131;
                    fVar237 = auVar94._16_4_;
                    auVar39._16_4_ = auVar171._16_4_ * fVar237;
                    fVar132 = auVar94._20_4_;
                    auVar39._20_4_ = auVar171._20_4_ * fVar132;
                    fVar234 = auVar94._24_4_;
                    auVar39._24_4_ = auVar171._24_4_ * fVar234;
                    auVar39._28_4_ = auVar171._28_4_;
                    auVar253 = vsubps_avx(auVar253,auVar39);
                    auVar327._0_4_ = fVar85 + fVar85 * auVar253._0_4_;
                    auVar327._4_4_ = fVar101 + fVar101 * auVar253._4_4_;
                    auVar327._8_4_ = fVar130 + fVar130 * auVar253._8_4_;
                    auVar327._12_4_ = fVar131 + fVar131 * auVar253._12_4_;
                    auVar327._16_4_ = fVar237 + fVar237 * auVar253._16_4_;
                    auVar327._20_4_ = fVar132 + fVar132 * auVar253._20_4_;
                    auVar327._24_4_ = fVar234 + fVar234 * auVar253._24_4_;
                    auVar327._28_4_ = auVar94._28_4_ + auVar253._28_4_;
                    break;
                  case 5:
                    auVar311._8_4_ = 0x42b0c0a5;
                    auVar311._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar311._12_4_ = 0x42b0c0a5;
                    auVar311._16_4_ = 0x42b0c0a5;
                    auVar311._20_4_ = 0x42b0c0a5;
                    auVar311._24_4_ = 0x42b0c0a5;
                    auVar311._28_4_ = 0x42b0c0a5;
                    auVar327 = vminps_avx(auVar327,auVar311);
                    auVar316._8_4_ = 0xc2b0c0a5;
                    auVar316._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar316._12_4_ = 0xc2b0c0a5;
                    auVar316._16_4_ = 0xc2b0c0a5;
                    auVar316._20_4_ = 0xc2b0c0a5;
                    auVar316._24_4_ = 0xc2b0c0a5;
                    auVar316._28_4_ = 0xc2b0c0a5;
                    auVar94 = vmaxps_avx(auVar316,auVar327);
                    auVar285._0_4_ = fVar181 + auVar94._0_4_ * 1.442695;
                    auVar285._4_4_ = fVar229 + auVar94._4_4_ * 1.442695;
                    auVar285._8_4_ = fVar230 + auVar94._8_4_ * 1.442695;
                    auVar285._12_4_ = fVar231 + auVar94._12_4_ * 1.442695;
                    auVar285._16_4_ = fVar232 + auVar94._16_4_ * 1.442695;
                    auVar285._20_4_ = fVar233 + auVar94._20_4_ * 1.442695;
                    auVar285._24_4_ = fVar235 + auVar94._24_4_ * 1.442695;
                    auVar285._28_4_ = fVar321 + in_ZMM7._28_4_;
                    auVar172 = vroundps_avx(auVar285,1);
                    auVar327 = vcmpps_avx(auVar285,auVar172,1);
                    auVar327 = vandps_avx(auVar327,auVar253);
                    auVar327 = vsubps_avx(auVar172,auVar327);
                    auVar36._4_4_ = auVar327._4_4_ * 0.6931472;
                    auVar36._0_4_ = auVar327._0_4_ * 0.6931472;
                    auVar36._8_4_ = auVar327._8_4_ * 0.6931472;
                    auVar36._12_4_ = auVar327._12_4_ * 0.6931472;
                    auVar36._16_4_ = auVar327._16_4_ * 0.6931472;
                    auVar36._20_4_ = auVar327._20_4_ * 0.6931472;
                    auVar36._24_4_ = auVar327._24_4_ * 0.6931472;
                    auVar36._28_4_ = auVar172._28_4_;
                    auVar94 = vsubps_avx(auVar94,auVar36);
                    fVar336 = auVar94._0_4_;
                    fVar352 = auVar94._4_4_;
                    fVar353 = auVar94._8_4_;
                    fVar354 = auVar94._12_4_;
                    fVar355 = auVar94._16_4_;
                    fVar356 = auVar94._20_4_;
                    fVar357 = auVar94._24_4_;
                    auVar182._0_4_ = (int)auVar327._0_4_;
                    auVar182._4_4_ = (int)auVar327._4_4_;
                    auVar182._8_4_ = (int)auVar327._8_4_;
                    auVar182._12_4_ = (int)auVar327._12_4_;
                    auVar212._16_4_ = (int)auVar327._16_4_;
                    auVar212._0_16_ = auVar182;
                    auVar212._20_4_ = (int)auVar327._20_4_;
                    auVar212._24_4_ = (int)auVar327._24_4_;
                    auVar212._28_4_ = (int)auVar327._28_4_;
                    auVar258 = vpslld_avx(auVar182,0x17);
                    auVar182 = vpslld_avx(auVar212._16_16_,0x17);
                    auVar323._8_4_ = 0x3f800000;
                    auVar323._0_8_ = 0x3f8000003f800000;
                    auVar323._12_4_ = 0x3f800000;
                    auVar182 = vpaddd_avx(auVar182,auVar323);
                    auVar258 = vpaddd_avx(auVar258,auVar323);
                    auVar286._0_4_ =
                         (fVar336 + fVar85 +
                         fVar336 * fVar336 *
                         (((((fVar336 * 0.00019875691 + 0.0013981999) * fVar336 + 0.008333452) *
                            fVar336 + 0.041665796) * fVar336 + 0.16666666) * fVar336 + fVar181)) *
                         auVar258._0_4_ + fVar85;
                    auVar286._4_4_ =
                         (fVar352 + fVar101 +
                         fVar352 * fVar352 *
                         (((((fVar352 * 0.00019875691 + 0.0013981999) * fVar352 + 0.008333452) *
                            fVar352 + 0.041665796) * fVar352 + 0.16666666) * fVar352 + fVar229)) *
                         auVar258._4_4_ + fVar101;
                    auVar286._8_4_ =
                         (fVar353 + fVar130 +
                         fVar353 * fVar353 *
                         (((((fVar353 * 0.00019875691 + 0.0013981999) * fVar353 + 0.008333452) *
                            fVar353 + 0.041665796) * fVar353 + 0.16666666) * fVar353 + fVar230)) *
                         auVar258._8_4_ + fVar130;
                    auVar286._12_4_ =
                         (fVar354 + fVar131 +
                         fVar354 * fVar354 *
                         (((((fVar354 * 0.00019875691 + 0.0013981999) * fVar354 + 0.008333452) *
                            fVar354 + 0.041665796) * fVar354 + 0.16666666) * fVar354 + fVar231)) *
                         auVar258._12_4_ + fVar131;
                    auVar286._16_4_ =
                         (fVar355 + fVar237 +
                         fVar355 * fVar355 *
                         (((((fVar355 * 0.00019875691 + 0.0013981999) * fVar355 + 0.008333452) *
                            fVar355 + 0.041665796) * fVar355 + 0.16666666) * fVar355 + fVar232)) *
                         auVar182._0_4_ + fVar237;
                    auVar286._20_4_ =
                         (fVar356 + fVar132 +
                         fVar356 * fVar356 *
                         (((((fVar356 * 0.00019875691 + 0.0013981999) * fVar356 + 0.008333452) *
                            fVar356 + 0.041665796) * fVar356 + 0.16666666) * fVar356 + fVar233)) *
                         auVar182._4_4_ + fVar132;
                    auVar286._24_4_ =
                         (fVar357 + fVar234 +
                         fVar357 * fVar357 *
                         (((((fVar357 * 0.00019875691 + 0.0013981999) * fVar357 + 0.008333452) *
                            fVar357 + 0.041665796) * fVar357 + 0.16666666) * fVar357 + fVar235)) *
                         auVar182._8_4_ + fVar234;
                    auVar286._28_4_ =
                         auVar94._28_4_ + fVar236 +
                         in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 +
                         fVar321 + fVar236;
                    auVar166._8_4_ = 0x800000;
                    auVar166._0_8_ = 0x80000000800000;
                    auVar166._12_4_ = 0x800000;
                    auVar166._16_4_ = 0x800000;
                    auVar166._20_4_ = 0x800000;
                    auVar166._24_4_ = 0x800000;
                    auVar166._28_4_ = 0x800000;
                    auVar172 = vmaxps_avx(auVar286,auVar166);
                    auVar182 = vpsrld_avx(auVar172._16_16_,0x17);
                    auVar245._8_4_ = 0x807fffff;
                    auVar245._0_8_ = 0x807fffff807fffff;
                    auVar245._12_4_ = 0x807fffff;
                    auVar245._16_4_ = 0x807fffff;
                    auVar245._20_4_ = 0x807fffff;
                    auVar245._24_4_ = 0x807fffff;
                    auVar245._28_4_ = 0x807fffff;
                    auVar327 = vandps_avx(auVar172,auVar245);
                    auVar218 = vorps_avx(auVar327,auVar320._0_32_);
                    auVar246._8_4_ = 0x3f3504f3;
                    auVar246._0_8_ = 0x3f3504f33f3504f3;
                    auVar246._12_4_ = 0x3f3504f3;
                    auVar246._16_4_ = 0x3f3504f3;
                    auVar246._20_4_ = 0x3f3504f3;
                    auVar246._24_4_ = 0x3f3504f3;
                    auVar246._28_4_ = 0x3f3504f3;
                    auVar94 = vcmpps_avx(auVar246,auVar218,2);
                    auVar327 = vandnps_avx(auVar94,auVar218);
                    fVar336 = auVar218._0_4_ + -1.0 + auVar327._0_4_;
                    fVar352 = auVar218._4_4_ + -1.0 + auVar327._4_4_;
                    fVar353 = auVar218._8_4_ + -1.0 + auVar327._8_4_;
                    fVar354 = auVar218._12_4_ + -1.0 + auVar327._12_4_;
                    fVar355 = auVar218._16_4_ + -1.0 + auVar327._16_4_;
                    fVar356 = auVar218._20_4_ + -1.0 + auVar327._20_4_;
                    fVar357 = auVar218._24_4_ + -1.0 + auVar327._24_4_;
                    auVar182 = vpsubd_avx(auVar182,auVar94._16_16_);
                    auVar258 = vpsrld_avx(auVar172._0_16_,0x17);
                    auVar305._8_4_ = 0xffffff81;
                    auVar305._0_8_ = 0xffffff81ffffff81;
                    auVar305._12_4_ = 0xffffff81;
                    auVar182 = vpaddd_avx(auVar305,auVar182);
                    auVar258 = vpsubd_avx(auVar258,auVar94._0_16_);
                    auVar258 = vpaddd_avx(auVar305,auVar258);
                    auVar167._16_16_ = auVar182;
                    auVar167._0_16_ = auVar258;
                    auVar94 = vcmpps_avx(auVar286,_DAT_00593200,2);
                    auVar172 = vcvtdq2ps_avx(auVar167);
                    auVar37._4_4_ =
                         (fVar352 + auVar172._4_4_ * 0.6931472 +
                         fVar352 * fVar352 *
                         (fVar352 * (fVar352 * (fVar352 * (fVar352 * (fVar352 * (fVar352 * (fVar352 
                                                  * (fVar352 * (fVar352 * 0.070376836 + -0.1151461)
                                                    + 0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                    0.3333333) + -0.5)) * -2.0;
                    auVar37._0_4_ =
                         (fVar336 + auVar172._0_4_ * 0.6931472 +
                         fVar336 * fVar336 *
                         (fVar336 * (fVar336 * (fVar336 * (fVar336 * (fVar336 * (fVar336 * (fVar336 
                                                  * (fVar336 * (fVar336 * 0.070376836 + -0.1151461)
                                                    + 0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                    0.3333333) + -0.5)) * -2.0;
                    auVar37._8_4_ =
                         (fVar353 + auVar172._8_4_ * 0.6931472 +
                         fVar353 * fVar353 *
                         (fVar353 * (fVar353 * (fVar353 * (fVar353 * (fVar353 * (fVar353 * (fVar353 
                                                  * (fVar353 * (fVar353 * 0.070376836 + -0.1151461)
                                                    + 0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                    0.3333333) + -0.5)) * -2.0;
                    auVar37._12_4_ =
                         (fVar354 + auVar172._12_4_ * 0.6931472 +
                         fVar354 * fVar354 *
                         (fVar354 * (fVar354 * (fVar354 * (fVar354 * (fVar354 * (fVar354 * (fVar354 
                                                  * (fVar354 * (fVar354 * 0.070376836 + -0.1151461)
                                                    + 0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                    0.3333333) + -0.5)) * -2.0;
                    auVar37._16_4_ =
                         (fVar355 + auVar172._16_4_ * 0.6931472 +
                         fVar355 * fVar355 *
                         (fVar355 * (fVar355 * (fVar355 * (fVar355 * (fVar355 * (fVar355 * (fVar355 
                                                  * (fVar355 * (fVar355 * 0.070376836 + -0.1151461)
                                                    + 0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                    0.3333333) + -0.5)) * -2.0;
                    auVar37._20_4_ =
                         (fVar356 + auVar172._20_4_ * 0.6931472 +
                         fVar356 * fVar356 *
                         (fVar356 * (fVar356 * (fVar356 * (fVar356 * (fVar356 * (fVar356 * (fVar356 
                                                  * (fVar356 * (fVar356 * 0.070376836 + -0.1151461)
                                                    + 0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                    0.3333333) + -0.5)) * -2.0;
                    auVar37._24_4_ =
                         (fVar357 + auVar172._24_4_ * 0.6931472 +
                         fVar357 * fVar357 *
                         (fVar357 * (fVar357 * (fVar357 * (fVar357 * (fVar357 * (fVar357 * (fVar357 
                                                  * (fVar357 * (fVar357 * 0.070376836 + -0.1151461)
                                                    + 0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                    0.3333333) + -0.5)) * -2.0;
                    auVar37._28_4_ =
                         auVar218._28_4_ + -1.0 + auVar327._28_4_ + auVar172._28_4_ + 0.0;
                    auVar213._8_4_ = 0x7fffffff;
                    auVar213._0_8_ = 0x7fffffff7fffffff;
                    auVar213._12_4_ = 0x7fffffff;
                    auVar213._16_4_ = 0x7fffffff;
                    auVar213._20_4_ = 0x7fffffff;
                    auVar213._24_4_ = 0x7fffffff;
                    auVar213._28_4_ = 0x7fffffff;
                    auVar327 = vblendvps_avx(auVar37,auVar213,auVar94);
                    auVar214._8_4_ = 0x42b0c0a5;
                    auVar214._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar214._12_4_ = 0x42b0c0a5;
                    auVar214._16_4_ = 0x42b0c0a5;
                    auVar214._20_4_ = 0x42b0c0a5;
                    auVar214._24_4_ = 0x42b0c0a5;
                    auVar214._28_4_ = 0x42b0c0a5;
                    auVar327 = vminps_avx(auVar327,auVar214);
                    auVar215._8_4_ = 0xc2b0c0a5;
                    auVar215._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar215._12_4_ = 0xc2b0c0a5;
                    auVar215._16_4_ = 0xc2b0c0a5;
                    auVar215._20_4_ = 0xc2b0c0a5;
                    auVar215._24_4_ = 0xc2b0c0a5;
                    auVar215._28_4_ = 0xc2b0c0a5;
                    auVar94 = vmaxps_avx(auVar327,auVar215);
                    auVar319 = ZEXT864(0) << 0x20;
                    auVar216._0_4_ = auVar94._0_4_ * 1.442695 + fVar181;
                    auVar216._4_4_ = auVar94._4_4_ * 1.442695 + fVar229;
                    auVar216._8_4_ = auVar94._8_4_ * 1.442695 + fVar230;
                    auVar216._12_4_ = auVar94._12_4_ * 1.442695 + fVar231;
                    auVar216._16_4_ = auVar94._16_4_ * 1.442695 + fVar232;
                    auVar216._20_4_ = auVar94._20_4_ * 1.442695 + fVar233;
                    auVar216._24_4_ = auVar94._24_4_ * 1.442695 + fVar235;
                    auVar216._28_4_ = fVar321 + -88.37626;
                    auVar172 = vroundps_avx(auVar216,1);
                    auVar327 = vcmpps_avx(auVar216,auVar172,1);
                    auVar327 = vandps_avx(auVar327,auVar253);
                    auVar327 = vsubps_avx(auVar172,auVar327);
                    auVar38._4_4_ = auVar327._4_4_ * 0.6931472;
                    auVar38._0_4_ = auVar327._0_4_ * 0.6931472;
                    auVar38._8_4_ = auVar327._8_4_ * 0.6931472;
                    auVar38._12_4_ = auVar327._12_4_ * 0.6931472;
                    auVar38._16_4_ = auVar327._16_4_ * 0.6931472;
                    auVar38._20_4_ = auVar327._20_4_ * 0.6931472;
                    auVar38._24_4_ = auVar327._24_4_ * 0.6931472;
                    auVar38._28_4_ = auVar172._28_4_;
                    auVar94 = vsubps_avx(auVar94,auVar38);
                    fVar336 = auVar94._0_4_;
                    fVar352 = auVar94._4_4_;
                    fVar353 = auVar94._8_4_;
                    fVar354 = auVar94._12_4_;
                    fVar355 = auVar94._16_4_;
                    fVar356 = auVar94._20_4_;
                    fVar357 = auVar94._24_4_;
                    auVar254 = ZEXT3264(auVar253);
                    auVar320 = ZEXT3264(auVar320._0_32_);
                    fVar181 = fVar181 + ((((fVar336 * 0.00019875691 + 0.0013981999) * fVar336 +
                                          0.008333452) * fVar336 + 0.041665796) * fVar336 +
                                        0.16666666) * fVar336;
                    fVar229 = fVar229 + ((((fVar352 * 0.00019875691 + 0.0013981999) * fVar352 +
                                          0.008333452) * fVar352 + 0.041665796) * fVar352 +
                                        0.16666666) * fVar352;
                    fVar230 = fVar230 + ((((fVar353 * 0.00019875691 + 0.0013981999) * fVar353 +
                                          0.008333452) * fVar353 + 0.041665796) * fVar353 +
                                        0.16666666) * fVar353;
                    fVar231 = fVar231 + ((((fVar354 * 0.00019875691 + 0.0013981999) * fVar354 +
                                          0.008333452) * fVar354 + 0.041665796) * fVar354 +
                                        0.16666666) * fVar354;
                    fVar232 = fVar232 + ((((fVar355 * 0.00019875691 + 0.0013981999) * fVar355 +
                                          0.008333452) * fVar355 + 0.041665796) * fVar355 +
                                        0.16666666) * fVar355;
                    fVar233 = fVar233 + ((((fVar356 * 0.00019875691 + 0.0013981999) * fVar356 +
                                          0.008333452) * fVar356 + 0.041665796) * fVar356 +
                                        0.16666666) * fVar356;
                    fVar235 = fVar235 + ((((fVar357 * 0.00019875691 + 0.0013981999) * fVar357 +
                                          0.008333452) * fVar357 + 0.041665796) * fVar357 +
                                        0.16666666) * fVar357;
                    in_ZMM7 = ZEXT3264(CONCAT428(fVar321 + auVar286._28_4_ + 0.0013981999 +
                                                           0.008333452 + 0.041665796 + 0.16666666,
                                                 CONCAT424(fVar235,CONCAT420(fVar233,CONCAT416(
                                                  fVar232,CONCAT412(fVar231,CONCAT48(fVar230,
                                                  CONCAT44(fVar229,fVar181))))))));
                    auVar258._0_4_ = (int)auVar327._0_4_;
                    auVar258._4_4_ = (int)auVar327._4_4_;
                    auVar258._8_4_ = (int)auVar327._8_4_;
                    auVar258._12_4_ = (int)auVar327._12_4_;
                    auVar217._16_4_ = (int)auVar327._16_4_;
                    auVar217._0_16_ = auVar258;
                    auVar217._20_4_ = (int)auVar327._20_4_;
                    auVar217._24_4_ = (int)auVar327._24_4_;
                    auVar217._28_4_ = (int)auVar327._28_4_;
                    auVar258 = vpslld_avx(auVar258,0x17);
                    auVar182 = vpslld_avx(auVar217._16_16_,0x17);
                    auVar182 = vpaddd_avx(auVar182,auVar323);
                    auVar258 = vpaddd_avx(auVar258,auVar323);
                    auVar168._0_4_ =
                         (fVar336 + fVar85 + fVar336 * fVar336 * fVar181) * auVar258._0_4_ + fVar85;
                    auVar168._4_4_ =
                         (fVar352 + fVar101 + fVar352 * fVar352 * fVar229) * auVar258._4_4_ +
                         fVar101;
                    auVar168._8_4_ =
                         (fVar353 + fVar130 + fVar353 * fVar353 * fVar230) * auVar258._8_4_ +
                         fVar130;
                    auVar168._12_4_ =
                         (fVar354 + fVar131 + fVar354 * fVar354 * fVar231) * auVar258._12_4_ +
                         fVar131;
                    auVar168._16_4_ =
                         (fVar355 + fVar237 + fVar355 * fVar355 * fVar232) * auVar182._0_4_ +
                         fVar237;
                    auVar168._20_4_ =
                         (fVar356 + fVar132 + fVar356 * fVar356 * fVar233) * auVar182._4_4_ +
                         fVar132;
                    auVar168._24_4_ =
                         (fVar357 + fVar234 + fVar357 * fVar357 * fVar235) * auVar182._8_4_ +
                         fVar234;
                    auVar168._28_4_ = auVar94._28_4_ + fVar236 + auVar172._28_4_ + fVar236;
                    auVar327 = vrcpps_avx(auVar168);
                    fVar85 = auVar327._0_4_;
                    fVar101 = auVar327._4_4_;
                    fVar130 = auVar327._8_4_;
                    fVar131 = auVar327._12_4_;
                    fVar237 = auVar327._16_4_;
                    fVar132 = auVar327._20_4_;
                    fVar234 = auVar327._24_4_;
                    auVar253._4_4_ = auVar168._4_4_ * (fVar101 + fVar101);
                    auVar253._0_4_ = auVar168._0_4_ * (fVar85 + fVar85);
                    auVar253._8_4_ = auVar168._8_4_ * (fVar130 + fVar130);
                    auVar253._12_4_ = auVar168._12_4_ * (fVar131 + fVar131);
                    auVar253._16_4_ = auVar168._16_4_ * (fVar237 + fVar237);
                    auVar253._20_4_ = auVar168._20_4_ * (fVar132 + fVar132);
                    auVar253._24_4_ = auVar168._24_4_ * (fVar234 + fVar234);
                    auVar253._28_4_ = auVar168._28_4_;
                    auVar94._8_4_ = 0x40000000;
                    auVar94._0_8_ = 0x4000000040000000;
                    auVar94._12_4_ = 0x40000000;
                    auVar94._16_4_ = 0x40000000;
                    auVar94._20_4_ = 0x40000000;
                    auVar94._24_4_ = 0x40000000;
                    auVar94._28_4_ = 0x40000000;
                    auVar253 = vsubps_avx(auVar94,auVar253);
                    auVar218._0_4_ = fVar85 + fVar85 + -1.0;
                    auVar218._4_4_ = fVar101 + fVar101 + -1.0;
                    auVar218._8_4_ = fVar130 + fVar130 + -1.0;
                    auVar218._12_4_ = fVar131 + fVar131 + -1.0;
                    auVar218._16_4_ = fVar237 + fVar237 + -1.0;
                    auVar218._20_4_ = fVar132 + fVar132 + -1.0;
                    auVar218._24_4_ = fVar234 + fVar234 + -1.0;
                    auVar218._28_4_ = auVar327._28_4_ + auVar327._28_4_ + -1.0;
                    auVar163._0_4_ = auVar218._0_4_ + fVar85 * auVar253._0_4_;
                    auVar163._4_4_ = auVar218._4_4_ + fVar101 * auVar253._4_4_;
                    auVar163._8_4_ = auVar218._8_4_ + fVar130 * auVar253._8_4_;
                    auVar163._12_4_ = auVar218._12_4_ + fVar131 * auVar253._12_4_;
                    auVar163._16_4_ = auVar218._16_4_ + fVar237 * auVar253._16_4_;
                    auVar163._20_4_ = auVar218._20_4_ + fVar132 * auVar253._20_4_;
                    auVar163._24_4_ = auVar218._24_4_ + fVar234 * auVar253._24_4_;
                    goto LAB_00296138;
                  case 6:
                    fVar85 = **(float **)(&this->field_0x118 + (long)p_Var25);
                    fVar101 = (*(float **)(&this->field_0x118 + (long)p_Var25))[1];
                    auVar218._4_4_ = fVar101;
                    auVar218._0_4_ = fVar101;
                    auVar218._8_4_ = fVar101;
                    auVar218._12_4_ = fVar101;
                    auVar218._16_4_ = fVar101;
                    auVar218._20_4_ = fVar101;
                    auVar218._24_4_ = fVar101;
                    auVar218._28_4_ = fVar101;
                    auVar172._0_4_ = auVar332._0_4_ * fVar85 + fVar101;
                    auVar172._4_4_ = auVar332._4_4_ * fVar85 + fVar101;
                    auVar172._8_4_ = fVar255 * fVar85 + fVar101;
                    auVar172._12_4_ = fVar300 * fVar85 + fVar101;
                    auVar172._16_4_ = fVar301 * fVar85 + fVar101;
                    auVar172._20_4_ = fVar302 * fVar85 + fVar101;
                    auVar172._24_4_ = fVar303 * fVar85 + fVar101;
                    auVar172._28_4_ = fVar85 + fVar101;
                    auVar327 = vmaxps_avx(auVar94,auVar172);
                    auVar327 = vminps_avx(auVar327,auVar253);
                    auVar163 = auVar327._0_28_;
LAB_00296138:
                    in_ZMM3 = ZEXT3264(auVar218);
                    auVar333._0_4_ = auVar332._0_4_ * auVar163._0_4_;
                    auVar333._4_4_ = auVar332._4_4_ * auVar163._4_4_;
                    auVar333._8_4_ = fVar255 * auVar163._8_4_;
                    auVar333._12_4_ = fVar300 * auVar163._12_4_;
                    auVar333._16_4_ = fVar301 * auVar163._16_4_;
                    auVar333._20_4_ = fVar302 * auVar163._20_4_;
                    auVar333._24_4_ = fVar303 * auVar163._24_4_;
                    auVar327 = auVar333._0_32_;
                  }
                  *(undefined1 (*) [32])pAVar71 = auVar327;
                  pAVar71 = pAVar71 + 4;
                  uVar78 = uVar78 + 1;
                  iVar57 = iVar57 + 1;
                } while (uVar78 != local_1a8.w);
              }
              iVar65 = iVar65 + 1;
            } while (iVar65 != local_1a8.h);
          }
          local_270 = local_270 + 1;
        } while (local_270 != local_1a8.c);
      }
      if ((((int)local_160 == 4) && (uVar77 == 8)) && (0 < (long)local_1a8.c)) {
        p_Var25 = local_148[-3];
        iVar19 = *(int *)(&this->field_0xdc + (long)p_Var25);
        iVar20 = *(int *)(&this->field_0xe0 + (long)p_Var25);
        iVar62 = *(int *)(&this->field_0xe4 + (long)p_Var25);
        iVar64 = *(int *)(&this->field_0xe8 + (long)p_Var25);
        uVar23 = *(undefined4 *)(&this->field_0x114 + (long)p_Var25);
        lVar80 = *(long *)(&this->field_0x1a8 + (long)p_Var25);
        uVar21 = *(uint *)(&this->field_0xd4 + (long)p_Var25);
        uVar22 = *(uint *)(&this->field_0xd8 + (long)p_Var25);
        local_270 = 0;
        auVar254 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar320 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar319 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar312._8_4_ = 0x42b0c0a5;
        auVar312._0_8_ = 0x42b0c0a542b0c0a5;
        auVar312._12_4_ = 0x42b0c0a5;
        auVar312._16_4_ = 0x42b0c0a5;
        auVar312._20_4_ = 0x42b0c0a5;
        auVar312._24_4_ = 0x42b0c0a5;
        auVar312._28_4_ = 0x42b0c0a5;
        auVar317._8_4_ = 0xc2b0c0a5;
        auVar317._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar317._12_4_ = 0xc2b0c0a5;
        auVar317._16_4_ = 0xc2b0c0a5;
        auVar317._20_4_ = 0xc2b0c0a5;
        auVar317._24_4_ = 0xc2b0c0a5;
        auVar317._28_4_ = 0xc2b0c0a5;
        do {
          if (0 < local_1a8.h) {
            iVar73 = bottom_blob->w;
            iVar79 = bottom_blob->h;
            pAVar71 = (Allocator *)
                      ((long)(_func_int ***)local_1a8.data +
                      local_1a8.cstep * local_270 *
                      CONCAT44(local_1a8.elemsize._4_4_,(int)local_1a8.elemsize));
            uVar24 = bottom_blob->c;
            iVar65 = 0;
            do {
              if (0 < local_1a8.w) {
                uVar78 = 0;
                iVar57 = (1 - uVar21) * iVar19;
                do {
                  if (lVar80 == 0) {
                    auVar332 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  else {
                    auVar332 = ZEXT3264(*(undefined1 (*) [32])(lVar80 + local_270 * 0x20));
                  }
                  if (0 < (int)uVar24) {
                    pvVar84 = (void *)((this->weight_data_tm).cstep * local_270 *
                                       (this->weight_data_tm).elemsize +
                                      (long)(this->weight_data_tm).data);
                    pvVar29 = bottom_blob->data;
                    uVar63 = 0;
                    do {
                      if (0 < (int)uVar22) {
                        uVar83 = 0;
                        uVar81 = 0;
                        do {
                          iVar53 = (((int)uVar81 - uVar22) + 1) * iVar20 + iVar65;
                          if (((-1 < iVar53) && (iVar54 = iVar53 / iVar64, iVar53 % iVar64 == 0)) &&
                             ((0 < (int)uVar21 && (iVar54 < iVar79)))) {
                            lVar74 = (long)iVar54 * (long)bottom_blob->w * bottom_blob->elemsize +
                                     bottom_blob->cstep * bottom_blob->elemsize * uVar63;
                            uVar75 = uVar83;
                            uVar68 = (ulong)uVar21;
                            iVar53 = iVar57;
                            do {
                              if (((-1 < iVar53) && (iVar54 = iVar53 / iVar62, iVar53 % iVar62 == 0)
                                  ) && (iVar54 < iVar73)) {
                                lVar59 = (long)(iVar54 << 2);
                                fVar85 = *(float *)((long)pvVar29 + lVar59 * 4 + lVar74);
                                fVar101 = *(float *)((long)pvVar29 + lVar59 * 4 + lVar74 + 4);
                                fVar130 = *(float *)((long)pvVar29 + lVar59 * 4 + lVar74 + 8);
                                fVar131 = *(float *)((long)pvVar29 + lVar59 * 4 + lVar74 + 0xc);
                                in_ZMM7 = ZEXT3264(CONCAT428(fVar131,CONCAT424(fVar131,CONCAT420(
                                                  fVar131,CONCAT416(fVar131,CONCAT412(fVar131,
                                                  CONCAT48(fVar131,CONCAT44(fVar131,fVar131))))))));
                                uVar60 = uVar75 & 0xffffffff;
                                pfVar66 = (float *)((long)pvVar84 + uVar60 * 4);
                                pfVar67 = (float *)((long)pvVar84 + uVar60 * 4 + 0x20);
                                pfVar1 = (float *)((long)pvVar84 + uVar60 * 4 + 0x40);
                                fVar237 = fVar101 + fVar130;
                                pfVar2 = (float *)((long)pvVar84 + uVar60 * 4 + 0x60);
                                in_ZMM3 = ZEXT3264(CONCAT428(fVar237,CONCAT424(fVar131 * pfVar2[6],
                                                                               CONCAT420(fVar131 * 
                                                  pfVar2[5],
                                                  CONCAT416(fVar131 * pfVar2[4],
                                                            CONCAT412(fVar131 * pfVar2[3],
                                                                      CONCAT48(fVar131 * pfVar2[2],
                                                                               CONCAT44(fVar131 * 
                                                  pfVar2[1],fVar131 * *pfVar2))))))));
                                auVar332 = ZEXT3264(CONCAT428(auVar332._28_4_ + fVar85 + fVar237 +
                                                              fVar237,CONCAT424(auVar332._24_4_ +
                                                                                fVar85 * pfVar66[6]
                                                                                + fVar101 * pfVar67[
                                                  6] + fVar130 * pfVar1[6] + fVar131 * pfVar2[6],
                                                  CONCAT420(auVar332._20_4_ + fVar85 * pfVar66[5] +
                                                            fVar101 * pfVar67[5] +
                                                            fVar130 * pfVar1[5] +
                                                            fVar131 * pfVar2[5],
                                                            CONCAT416(auVar332._16_4_ +
                                                                      fVar85 * pfVar66[4] +
                                                                      fVar101 * pfVar67[4] +
                                                                      fVar130 * pfVar1[4] +
                                                                      fVar131 * pfVar2[4],
                                                                      CONCAT412(auVar332._12_4_ +
                                                                                fVar85 * pfVar66[3]
                                                                                + fVar101 * pfVar67[
                                                  3] + fVar130 * pfVar1[3] + fVar131 * pfVar2[3],
                                                  CONCAT48(auVar332._8_4_ + fVar85 * pfVar66[2] +
                                                           fVar101 * pfVar67[2] +
                                                           fVar130 * pfVar1[2] + fVar131 * pfVar2[2]
                                                           ,CONCAT44(auVar332._4_4_ +
                                                                     fVar85 * pfVar66[1] +
                                                                     fVar101 * pfVar67[1] +
                                                                     fVar130 * pfVar1[1] +
                                                                     fVar131 * pfVar2[1],
                                                                     auVar332._0_4_ +
                                                                     fVar85 * *pfVar66 +
                                                                     fVar101 * *pfVar67 +
                                                                     fVar130 * *pfVar1 +
                                                                     fVar131 * *pfVar2))))))));
                              }
                              uVar75 = uVar75 + 0x20;
                              iVar53 = iVar53 + iVar19;
                              uVar68 = uVar68 - 1;
                            } while (uVar68 != 0);
                          }
                          uVar81 = uVar81 + 1;
                          uVar83 = uVar83 + (ulong)uVar21 * 0x20;
                        } while (uVar81 != uVar22);
                      }
                      pvVar84 = (void *)((long)pvVar84 + (long)(int)(uVar21 * uVar22 * 0x20) * 4);
                      uVar63 = uVar63 + 1;
                    } while (uVar63 != uVar24);
                  }
                  auVar329 = auVar332._0_32_;
                  fVar255 = auVar332._8_4_;
                  fVar300 = auVar332._12_4_;
                  fVar301 = auVar332._16_4_;
                  fVar302 = auVar332._20_4_;
                  fVar303 = auVar332._24_4_;
                  fVar181 = auVar320._0_4_;
                  fVar229 = auVar320._4_4_;
                  fVar230 = auVar320._8_4_;
                  fVar231 = auVar320._12_4_;
                  fVar232 = auVar320._16_4_;
                  fVar233 = auVar320._20_4_;
                  fVar235 = auVar320._24_4_;
                  fVar321 = auVar320._28_4_;
                  auVar327 = auVar319._0_32_;
                  fVar85 = auVar319._0_4_;
                  fVar101 = auVar319._4_4_;
                  fVar130 = auVar319._8_4_;
                  fVar131 = auVar319._12_4_;
                  fVar237 = auVar319._16_4_;
                  fVar132 = auVar319._20_4_;
                  fVar234 = auVar319._24_4_;
                  fVar236 = auVar319._28_4_;
                  auVar334._28_36_ = auVar332._28_36_;
                  switch(uVar23) {
                  case 1:
                    auVar329 = vmaxps_avx(auVar329,auVar254._0_32_);
                    break;
                  case 2:
                    auVar327 = vmaxps_avx(auVar329,ZEXT1632(ZEXT816(0) << 0x40));
                    in_ZMM7 = ZEXT3264(auVar327);
                    auVar254 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar253 = vminps_avx(auVar329,ZEXT1632(ZEXT816(0) << 0x40));
                    fVar85 = **(float **)(&this->field_0x118 + (long)p_Var25);
                    auVar329._0_4_ = fVar85 * auVar253._0_4_ + auVar327._0_4_;
                    auVar329._4_4_ = fVar85 * auVar253._4_4_ + auVar327._4_4_;
                    auVar329._8_4_ = fVar85 * auVar253._8_4_ + auVar327._8_4_;
                    auVar329._12_4_ = fVar85 * auVar253._12_4_ + auVar327._12_4_;
                    auVar329._16_4_ = fVar85 * auVar253._16_4_ + auVar327._16_4_;
                    auVar329._20_4_ = fVar85 * auVar253._20_4_ + auVar327._20_4_;
                    auVar329._24_4_ = fVar85 * auVar253._24_4_ + auVar327._24_4_;
                    auVar329._28_4_ = auVar253._28_4_ + auVar327._28_4_;
                    break;
                  case 3:
                    uVar7 = **(undefined4 **)(&this->field_0x118 + (long)p_Var25);
                    auVar292._4_4_ = uVar7;
                    auVar292._0_4_ = uVar7;
                    auVar292._8_4_ = uVar7;
                    auVar292._12_4_ = uVar7;
                    auVar292._16_4_ = uVar7;
                    auVar292._20_4_ = uVar7;
                    auVar292._24_4_ = uVar7;
                    auVar292._28_4_ = uVar7;
                    uVar7 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var25))[1];
                    auVar350._4_4_ = uVar7;
                    auVar350._0_4_ = uVar7;
                    auVar350._8_4_ = uVar7;
                    auVar350._12_4_ = uVar7;
                    auVar350._16_4_ = uVar7;
                    auVar350._20_4_ = uVar7;
                    auVar350._24_4_ = uVar7;
                    auVar350._28_4_ = uVar7;
                    auVar327 = vmaxps_avx(auVar329,auVar292);
                    in_ZMM7 = ZEXT3264(auVar327);
                    auVar329 = vminps_avx(auVar350,auVar327);
                    break;
                  case 4:
                    auVar293._0_8_ = auVar332._0_8_ ^ 0x8000000080000000;
                    auVar293._8_4_ = -fVar255;
                    auVar293._12_4_ = -fVar300;
                    auVar293._16_4_ = -fVar301;
                    auVar293._20_4_ = -fVar302;
                    auVar293._24_4_ = -fVar303;
                    auVar293._28_4_ = -auVar332._28_4_;
                    auVar125._8_4_ = 0x42b0c0a5;
                    auVar125._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar125._12_4_ = 0x42b0c0a5;
                    auVar125._16_4_ = 0x42b0c0a5;
                    auVar125._20_4_ = 0x42b0c0a5;
                    auVar125._24_4_ = 0x42b0c0a5;
                    auVar125._28_4_ = 0x42b0c0a5;
                    auVar253 = vminps_avx(auVar293,auVar125);
                    auVar126._8_4_ = 0xc2b0c0a5;
                    auVar126._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar126._12_4_ = 0xc2b0c0a5;
                    auVar126._16_4_ = 0xc2b0c0a5;
                    auVar126._20_4_ = 0xc2b0c0a5;
                    auVar126._24_4_ = 0xc2b0c0a5;
                    auVar126._28_4_ = 0xc2b0c0a5;
                    auVar94 = vmaxps_avx(auVar253,auVar126);
                    auVar328._0_4_ = auVar94._0_4_ * 1.442695 + fVar181;
                    auVar328._4_4_ = auVar94._4_4_ * 1.442695 + fVar229;
                    auVar328._8_4_ = auVar94._8_4_ * 1.442695 + fVar230;
                    auVar328._12_4_ = auVar94._12_4_ * 1.442695 + fVar231;
                    auVar328._16_4_ = auVar94._16_4_ * 1.442695 + fVar232;
                    auVar328._20_4_ = auVar94._20_4_ * 1.442695 + fVar233;
                    auVar328._24_4_ = auVar94._24_4_ * 1.442695 + fVar235;
                    auVar328._28_4_ = auVar332._28_4_ + fVar321;
                    auVar172 = vroundps_avx(auVar328,1);
                    auVar253 = vcmpps_avx(auVar328,auVar172,1);
                    auVar253 = vandps_avx(auVar253,auVar327);
                    auVar253 = vsubps_avx(auVar172,auVar253);
                    fVar255 = auVar253._0_4_ * -0.6931472 + auVar94._0_4_;
                    fVar300 = auVar253._4_4_ * -0.6931472 + auVar94._4_4_;
                    fVar301 = auVar253._8_4_ * -0.6931472 + auVar94._8_4_;
                    fVar302 = auVar253._12_4_ * -0.6931472 + auVar94._12_4_;
                    fVar303 = auVar253._16_4_ * -0.6931472 + auVar94._16_4_;
                    fVar336 = auVar253._20_4_ * -0.6931472 + auVar94._20_4_;
                    fVar352 = auVar253._24_4_ * -0.6931472 + auVar94._24_4_;
                    auVar260._0_4_ = (int)auVar253._0_4_;
                    auVar260._4_4_ = (int)auVar253._4_4_;
                    auVar260._8_4_ = (int)auVar253._8_4_;
                    auVar260._12_4_ = (int)auVar253._12_4_;
                    auVar294._16_4_ = (int)auVar253._16_4_;
                    auVar294._0_16_ = auVar260;
                    auVar294._20_4_ = (int)auVar253._20_4_;
                    auVar294._24_4_ = (int)auVar253._24_4_;
                    auVar294._28_4_ = (int)auVar253._28_4_;
                    auVar258 = vpslld_avx(auVar260,0x17);
                    auVar182 = vpslld_avx(auVar294._16_16_,0x17);
                    auVar103._8_4_ = 0x3f800000;
                    auVar103._0_8_ = 0x3f8000003f800000;
                    auVar103._12_4_ = 0x3f800000;
                    auVar182 = vpaddd_avx(auVar182,auVar103);
                    auVar258 = vpaddd_avx(auVar258,auVar103);
                    auVar175._0_4_ =
                         (fVar255 + fVar85 +
                         fVar255 * fVar255 *
                         (fVar181 +
                         ((((fVar255 * 0.00019875691 + 0.0013981999) * fVar255 + 0.008333452) *
                           fVar255 + 0.041665796) * fVar255 + 0.16666666) * fVar255)) *
                         auVar258._0_4_ + fVar85;
                    auVar175._4_4_ =
                         (fVar300 + fVar101 +
                         fVar300 * fVar300 *
                         (fVar229 +
                         ((((fVar300 * 0.00019875691 + 0.0013981999) * fVar300 + 0.008333452) *
                           fVar300 + 0.041665796) * fVar300 + 0.16666666) * fVar300)) *
                         auVar258._4_4_ + fVar101;
                    auVar175._8_4_ =
                         (fVar301 + fVar130 +
                         fVar301 * fVar301 *
                         (fVar230 +
                         ((((fVar301 * 0.00019875691 + 0.0013981999) * fVar301 + 0.008333452) *
                           fVar301 + 0.041665796) * fVar301 + 0.16666666) * fVar301)) *
                         auVar258._8_4_ + fVar130;
                    auVar175._12_4_ =
                         (fVar302 + fVar131 +
                         fVar302 * fVar302 *
                         (fVar231 +
                         ((((fVar302 * 0.00019875691 + 0.0013981999) * fVar302 + 0.008333452) *
                           fVar302 + 0.041665796) * fVar302 + 0.16666666) * fVar302)) *
                         auVar258._12_4_ + fVar131;
                    auVar175._16_4_ =
                         (fVar303 + fVar237 +
                         fVar303 * fVar303 *
                         (fVar232 +
                         ((((fVar303 * 0.00019875691 + 0.0013981999) * fVar303 + 0.008333452) *
                           fVar303 + 0.041665796) * fVar303 + 0.16666666) * fVar303)) *
                         auVar182._0_4_ + fVar237;
                    auVar175._20_4_ =
                         (fVar336 + fVar132 +
                         fVar336 * fVar336 *
                         (fVar233 +
                         ((((fVar336 * 0.00019875691 + 0.0013981999) * fVar336 + 0.008333452) *
                           fVar336 + 0.041665796) * fVar336 + 0.16666666) * fVar336)) *
                         auVar182._4_4_ + fVar132;
                    auVar175._24_4_ =
                         (fVar352 + fVar234 +
                         fVar352 * fVar352 *
                         (fVar235 +
                         ((((fVar352 * 0.00019875691 + 0.0013981999) * fVar352 + 0.008333452) *
                           fVar352 + 0.041665796) * fVar352 + 0.16666666) * fVar352)) *
                         auVar182._8_4_ + fVar234;
                    auVar175._28_4_ =
                         auVar172._28_4_ + auVar94._28_4_ + fVar236 + fVar321 + -0.47508308 +
                         fVar236;
                    auVar253 = vrcpps_avx(auVar175);
                    in_ZMM7 = ZEXT3264(auVar253);
                    fVar85 = auVar253._0_4_;
                    fVar101 = auVar253._4_4_;
                    auVar44._4_4_ = auVar175._4_4_ * fVar101;
                    auVar44._0_4_ = auVar175._0_4_ * fVar85;
                    fVar130 = auVar253._8_4_;
                    auVar44._8_4_ = auVar175._8_4_ * fVar130;
                    fVar131 = auVar253._12_4_;
                    auVar44._12_4_ = auVar175._12_4_ * fVar131;
                    fVar237 = auVar253._16_4_;
                    auVar44._16_4_ = auVar175._16_4_ * fVar237;
                    fVar132 = auVar253._20_4_;
                    auVar44._20_4_ = auVar175._20_4_ * fVar132;
                    fVar234 = auVar253._24_4_;
                    auVar44._24_4_ = auVar175._24_4_ * fVar234;
                    auVar44._28_4_ = auVar175._28_4_;
                    auVar327 = vsubps_avx(auVar327,auVar44);
                    auVar329._0_4_ = fVar85 + fVar85 * auVar327._0_4_;
                    auVar329._4_4_ = fVar101 + fVar101 * auVar327._4_4_;
                    auVar329._8_4_ = fVar130 + fVar130 * auVar327._8_4_;
                    auVar329._12_4_ = fVar131 + fVar131 * auVar327._12_4_;
                    auVar329._16_4_ = fVar237 + fVar237 * auVar327._16_4_;
                    auVar329._20_4_ = fVar132 + fVar132 * auVar327._20_4_;
                    auVar329._24_4_ = fVar234 + fVar234 * auVar327._24_4_;
                    auVar329._28_4_ = auVar253._28_4_ + auVar327._28_4_;
                    break;
                  case 5:
                    auVar253 = vminps_avx(auVar329,auVar312);
                    auVar94 = vmaxps_avx(auVar317,auVar253);
                    auVar290._0_4_ = fVar181 + auVar94._0_4_ * 1.442695;
                    auVar290._4_4_ = fVar229 + auVar94._4_4_ * 1.442695;
                    auVar290._8_4_ = fVar230 + auVar94._8_4_ * 1.442695;
                    auVar290._12_4_ = fVar231 + auVar94._12_4_ * 1.442695;
                    auVar290._16_4_ = fVar232 + auVar94._16_4_ * 1.442695;
                    auVar290._20_4_ = fVar233 + auVar94._20_4_ * 1.442695;
                    auVar290._24_4_ = fVar235 + auVar94._24_4_ * 1.442695;
                    auVar290._28_4_ = fVar321 + in_ZMM7._28_4_;
                    auVar172 = vroundps_avx(auVar290,1);
                    auVar253 = vcmpps_avx(auVar290,auVar172,1);
                    auVar253 = vandps_avx(auVar253,auVar327);
                    auVar253 = vsubps_avx(auVar172,auVar253);
                    auVar40._4_4_ = auVar253._4_4_ * 0.6931472;
                    auVar40._0_4_ = auVar253._0_4_ * 0.6931472;
                    auVar40._8_4_ = auVar253._8_4_ * 0.6931472;
                    auVar40._12_4_ = auVar253._12_4_ * 0.6931472;
                    auVar40._16_4_ = auVar253._16_4_ * 0.6931472;
                    auVar40._20_4_ = auVar253._20_4_ * 0.6931472;
                    auVar40._24_4_ = auVar253._24_4_ * 0.6931472;
                    auVar40._28_4_ = auVar172._28_4_;
                    auVar94 = vsubps_avx(auVar94,auVar40);
                    fVar336 = auVar94._0_4_;
                    fVar352 = auVar94._4_4_;
                    fVar353 = auVar94._8_4_;
                    fVar354 = auVar94._12_4_;
                    fVar355 = auVar94._16_4_;
                    fVar356 = auVar94._20_4_;
                    fVar357 = auVar94._24_4_;
                    auVar183._0_4_ = (int)auVar253._0_4_;
                    auVar183._4_4_ = (int)auVar253._4_4_;
                    auVar183._8_4_ = (int)auVar253._8_4_;
                    auVar183._12_4_ = (int)auVar253._12_4_;
                    auVar219._16_4_ = (int)auVar253._16_4_;
                    auVar219._0_16_ = auVar183;
                    auVar219._20_4_ = (int)auVar253._20_4_;
                    auVar219._24_4_ = (int)auVar253._24_4_;
                    auVar219._28_4_ = (int)auVar253._28_4_;
                    auVar258 = vpslld_avx(auVar183,0x17);
                    auVar182 = vpslld_avx(auVar219._16_16_,0x17);
                    auVar247._8_4_ = 0x3f800000;
                    auVar247._0_8_ = 0x3f8000003f800000;
                    auVar247._12_4_ = 0x3f800000;
                    auVar182 = vpaddd_avx(auVar182,auVar247);
                    auVar258 = vpaddd_avx(auVar258,auVar247);
                    auVar291._0_4_ =
                         (fVar336 + fVar85 +
                         fVar336 * fVar336 *
                         (((((fVar336 * 0.00019875691 + 0.0013981999) * fVar336 + 0.008333452) *
                            fVar336 + 0.041665796) * fVar336 + 0.16666666) * fVar336 + fVar181)) *
                         auVar258._0_4_ + fVar85;
                    auVar291._4_4_ =
                         (fVar352 + fVar101 +
                         fVar352 * fVar352 *
                         (((((fVar352 * 0.00019875691 + 0.0013981999) * fVar352 + 0.008333452) *
                            fVar352 + 0.041665796) * fVar352 + 0.16666666) * fVar352 + fVar229)) *
                         auVar258._4_4_ + fVar101;
                    auVar291._8_4_ =
                         (fVar353 + fVar130 +
                         fVar353 * fVar353 *
                         (((((fVar353 * 0.00019875691 + 0.0013981999) * fVar353 + 0.008333452) *
                            fVar353 + 0.041665796) * fVar353 + 0.16666666) * fVar353 + fVar230)) *
                         auVar258._8_4_ + fVar130;
                    auVar291._12_4_ =
                         (fVar354 + fVar131 +
                         fVar354 * fVar354 *
                         (((((fVar354 * 0.00019875691 + 0.0013981999) * fVar354 + 0.008333452) *
                            fVar354 + 0.041665796) * fVar354 + 0.16666666) * fVar354 + fVar231)) *
                         auVar258._12_4_ + fVar131;
                    auVar291._16_4_ =
                         (fVar355 + fVar237 +
                         fVar355 * fVar355 *
                         (((((fVar355 * 0.00019875691 + 0.0013981999) * fVar355 + 0.008333452) *
                            fVar355 + 0.041665796) * fVar355 + 0.16666666) * fVar355 + fVar232)) *
                         auVar182._0_4_ + fVar237;
                    auVar291._20_4_ =
                         (fVar356 + fVar132 +
                         fVar356 * fVar356 *
                         (((((fVar356 * 0.00019875691 + 0.0013981999) * fVar356 + 0.008333452) *
                            fVar356 + 0.041665796) * fVar356 + 0.16666666) * fVar356 + fVar233)) *
                         auVar182._4_4_ + fVar132;
                    auVar291._24_4_ =
                         (fVar357 + fVar234 +
                         fVar357 * fVar357 *
                         (((((fVar357 * 0.00019875691 + 0.0013981999) * fVar357 + 0.008333452) *
                            fVar357 + 0.041665796) * fVar357 + 0.16666666) * fVar357 + fVar235)) *
                         auVar182._8_4_ + fVar234;
                    auVar291._28_4_ =
                         auVar94._28_4_ + fVar236 +
                         in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 +
                         fVar321 + fVar236;
                    auVar95._8_4_ = 0x800000;
                    auVar95._0_8_ = 0x80000000800000;
                    auVar95._12_4_ = 0x800000;
                    auVar95._16_4_ = 0x800000;
                    auVar95._20_4_ = 0x800000;
                    auVar95._24_4_ = 0x800000;
                    auVar95._28_4_ = 0x800000;
                    auVar172 = vmaxps_avx(auVar291,auVar95);
                    auVar182 = vpsrld_avx(auVar172._16_16_,0x17);
                    auVar96._8_4_ = 0x807fffff;
                    auVar96._0_8_ = 0x807fffff807fffff;
                    auVar96._12_4_ = 0x807fffff;
                    auVar96._16_4_ = 0x807fffff;
                    auVar96._20_4_ = 0x807fffff;
                    auVar96._24_4_ = 0x807fffff;
                    auVar96._28_4_ = 0x807fffff;
                    auVar253 = vandps_avx(auVar172,auVar96);
                    auVar218 = vorps_avx(auVar253,auVar320._0_32_);
                    auVar97._8_4_ = 0x3f3504f3;
                    auVar97._0_8_ = 0x3f3504f33f3504f3;
                    auVar97._12_4_ = 0x3f3504f3;
                    auVar97._16_4_ = 0x3f3504f3;
                    auVar97._20_4_ = 0x3f3504f3;
                    auVar97._24_4_ = 0x3f3504f3;
                    auVar97._28_4_ = 0x3f3504f3;
                    auVar94 = vcmpps_avx(auVar97,auVar218,2);
                    auVar253 = vandnps_avx(auVar94,auVar218);
                    fVar336 = auVar218._0_4_ + -1.0 + auVar253._0_4_;
                    fVar352 = auVar218._4_4_ + -1.0 + auVar253._4_4_;
                    fVar353 = auVar218._8_4_ + -1.0 + auVar253._8_4_;
                    fVar354 = auVar218._12_4_ + -1.0 + auVar253._12_4_;
                    fVar355 = auVar218._16_4_ + -1.0 + auVar253._16_4_;
                    fVar356 = auVar218._20_4_ + -1.0 + auVar253._20_4_;
                    fVar357 = auVar218._24_4_ + -1.0 + auVar253._24_4_;
                    auVar182 = vpsubd_avx(auVar182,auVar94._16_16_);
                    auVar258 = vpsrld_avx(auVar172._0_16_,0x17);
                    auVar89._8_4_ = 0xffffff81;
                    auVar89._0_8_ = 0xffffff81ffffff81;
                    auVar89._12_4_ = 0xffffff81;
                    auVar182 = vpaddd_avx(auVar182,auVar89);
                    auVar258 = vpsubd_avx(auVar258,auVar94._0_16_);
                    auVar258 = vpaddd_avx(auVar258,auVar89);
                    auVar173._16_16_ = auVar182;
                    auVar173._0_16_ = auVar258;
                    auVar254 = ZEXT864(0) << 0x20;
                    auVar94 = vcmpps_avx(auVar291,ZEXT832(0) << 0x20,2);
                    auVar172 = vcvtdq2ps_avx(auVar173);
                    auVar41._4_4_ =
                         (fVar352 + auVar172._4_4_ * 0.6931472 +
                         fVar352 * fVar352 *
                         (fVar352 * (fVar352 * (fVar352 * (fVar352 * (fVar352 * (fVar352 * (fVar352 
                                                  * (fVar352 * (fVar352 * 0.070376836 + -0.1151461)
                                                    + 0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                    0.3333333) + -0.5)) * -2.0;
                    auVar41._0_4_ =
                         (fVar336 + auVar172._0_4_ * 0.6931472 +
                         fVar336 * fVar336 *
                         (fVar336 * (fVar336 * (fVar336 * (fVar336 * (fVar336 * (fVar336 * (fVar336 
                                                  * (fVar336 * (fVar336 * 0.070376836 + -0.1151461)
                                                    + 0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                    0.3333333) + -0.5)) * -2.0;
                    auVar41._8_4_ =
                         (fVar353 + auVar172._8_4_ * 0.6931472 +
                         fVar353 * fVar353 *
                         (fVar353 * (fVar353 * (fVar353 * (fVar353 * (fVar353 * (fVar353 * (fVar353 
                                                  * (fVar353 * (fVar353 * 0.070376836 + -0.1151461)
                                                    + 0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                    0.3333333) + -0.5)) * -2.0;
                    auVar41._12_4_ =
                         (fVar354 + auVar172._12_4_ * 0.6931472 +
                         fVar354 * fVar354 *
                         (fVar354 * (fVar354 * (fVar354 * (fVar354 * (fVar354 * (fVar354 * (fVar354 
                                                  * (fVar354 * (fVar354 * 0.070376836 + -0.1151461)
                                                    + 0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                    0.3333333) + -0.5)) * -2.0;
                    auVar41._16_4_ =
                         (fVar355 + auVar172._16_4_ * 0.6931472 +
                         fVar355 * fVar355 *
                         (fVar355 * (fVar355 * (fVar355 * (fVar355 * (fVar355 * (fVar355 * (fVar355 
                                                  * (fVar355 * (fVar355 * 0.070376836 + -0.1151461)
                                                    + 0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                    0.3333333) + -0.5)) * -2.0;
                    auVar41._20_4_ =
                         (fVar356 + auVar172._20_4_ * 0.6931472 +
                         fVar356 * fVar356 *
                         (fVar356 * (fVar356 * (fVar356 * (fVar356 * (fVar356 * (fVar356 * (fVar356 
                                                  * (fVar356 * (fVar356 * 0.070376836 + -0.1151461)
                                                    + 0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                    0.3333333) + -0.5)) * -2.0;
                    auVar41._24_4_ =
                         (fVar357 + auVar172._24_4_ * 0.6931472 +
                         fVar357 * fVar357 *
                         (fVar357 * (fVar357 * (fVar357 * (fVar357 * (fVar357 * (fVar357 * (fVar357 
                                                  * (fVar357 * (fVar357 * 0.070376836 + -0.1151461)
                                                    + 0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                    0.3333333) + -0.5)) * -2.0;
                    auVar41._28_4_ =
                         auVar218._28_4_ + -1.0 + auVar253._28_4_ + auVar172._28_4_ + 0.0;
                    auVar220._8_4_ = 0x7fffffff;
                    auVar220._0_8_ = 0x7fffffff7fffffff;
                    auVar220._12_4_ = 0x7fffffff;
                    auVar220._16_4_ = 0x7fffffff;
                    auVar220._20_4_ = 0x7fffffff;
                    auVar220._24_4_ = 0x7fffffff;
                    auVar220._28_4_ = 0x7fffffff;
                    auVar253 = vblendvps_avx(auVar41,auVar220,auVar94);
                    auVar253 = vminps_avx(auVar312,auVar253);
                    auVar94 = vmaxps_avx(auVar317,auVar253);
                    auVar221._0_4_ = auVar94._0_4_ * 1.442695 + fVar181;
                    auVar221._4_4_ = auVar94._4_4_ * 1.442695 + fVar229;
                    auVar221._8_4_ = auVar94._8_4_ * 1.442695 + fVar230;
                    auVar221._12_4_ = auVar94._12_4_ * 1.442695 + fVar231;
                    auVar221._16_4_ = auVar94._16_4_ * 1.442695 + fVar232;
                    auVar221._20_4_ = auVar94._20_4_ * 1.442695 + fVar233;
                    auVar221._24_4_ = auVar94._24_4_ * 1.442695 + fVar235;
                    auVar221._28_4_ = fVar321 + NAN;
                    auVar172 = vroundps_avx(auVar221,1);
                    auVar253 = vcmpps_avx(auVar221,auVar172,1);
                    auVar253 = vandps_avx(auVar253,auVar327);
                    auVar253 = vsubps_avx(auVar172,auVar253);
                    auVar42._4_4_ = auVar253._4_4_ * 0.6931472;
                    auVar42._0_4_ = auVar253._0_4_ * 0.6931472;
                    auVar42._8_4_ = auVar253._8_4_ * 0.6931472;
                    auVar42._12_4_ = auVar253._12_4_ * 0.6931472;
                    auVar42._16_4_ = auVar253._16_4_ * 0.6931472;
                    auVar42._20_4_ = auVar253._20_4_ * 0.6931472;
                    auVar42._24_4_ = auVar253._24_4_ * 0.6931472;
                    auVar42._28_4_ = auVar172._28_4_;
                    auVar94 = vsubps_avx(auVar94,auVar42);
                    fVar336 = auVar94._0_4_;
                    fVar352 = auVar94._4_4_;
                    fVar353 = auVar94._8_4_;
                    fVar354 = auVar94._12_4_;
                    fVar355 = auVar94._16_4_;
                    fVar356 = auVar94._20_4_;
                    fVar357 = auVar94._24_4_;
                    auVar319 = ZEXT3264(auVar327);
                    auVar320 = ZEXT3264(auVar320._0_32_);
                    fVar181 = fVar181 + ((((fVar336 * 0.00019875691 + 0.0013981999) * fVar336 +
                                          0.008333452) * fVar336 + 0.041665796) * fVar336 +
                                        0.16666666) * fVar336;
                    fVar229 = fVar229 + ((((fVar352 * 0.00019875691 + 0.0013981999) * fVar352 +
                                          0.008333452) * fVar352 + 0.041665796) * fVar352 +
                                        0.16666666) * fVar352;
                    fVar230 = fVar230 + ((((fVar353 * 0.00019875691 + 0.0013981999) * fVar353 +
                                          0.008333452) * fVar353 + 0.041665796) * fVar353 +
                                        0.16666666) * fVar353;
                    fVar231 = fVar231 + ((((fVar354 * 0.00019875691 + 0.0013981999) * fVar354 +
                                          0.008333452) * fVar354 + 0.041665796) * fVar354 +
                                        0.16666666) * fVar354;
                    fVar232 = fVar232 + ((((fVar355 * 0.00019875691 + 0.0013981999) * fVar355 +
                                          0.008333452) * fVar355 + 0.041665796) * fVar355 +
                                        0.16666666) * fVar355;
                    fVar233 = fVar233 + ((((fVar356 * 0.00019875691 + 0.0013981999) * fVar356 +
                                          0.008333452) * fVar356 + 0.041665796) * fVar356 +
                                        0.16666666) * fVar356;
                    fVar235 = fVar235 + ((((fVar357 * 0.00019875691 + 0.0013981999) * fVar357 +
                                          0.008333452) * fVar357 + 0.041665796) * fVar357 +
                                        0.16666666) * fVar357;
                    in_ZMM7 = ZEXT3264(CONCAT428(fVar321 + auVar291._28_4_ + 0.0013981999 +
                                                           0.008333452 + 0.041665796 + 0.16666666,
                                                 CONCAT424(fVar235,CONCAT420(fVar233,CONCAT416(
                                                  fVar232,CONCAT412(fVar231,CONCAT48(fVar230,
                                                  CONCAT44(fVar229,fVar181))))))));
                    auVar184._0_4_ = (int)auVar253._0_4_;
                    auVar184._4_4_ = (int)auVar253._4_4_;
                    auVar184._8_4_ = (int)auVar253._8_4_;
                    auVar184._12_4_ = (int)auVar253._12_4_;
                    auVar222._16_4_ = (int)auVar253._16_4_;
                    auVar222._0_16_ = auVar184;
                    auVar222._20_4_ = (int)auVar253._20_4_;
                    auVar222._24_4_ = (int)auVar253._24_4_;
                    auVar222._28_4_ = (int)auVar253._28_4_;
                    auVar258 = vpslld_avx(auVar184,0x17);
                    auVar182 = vpslld_avx(auVar222._16_16_,0x17);
                    auVar102._8_4_ = 0x3f800000;
                    auVar102._0_8_ = 0x3f8000003f800000;
                    auVar102._12_4_ = 0x3f800000;
                    auVar182 = vpaddd_avx(auVar182,auVar102);
                    auVar258 = vpaddd_avx(auVar258,auVar102);
                    auVar174._0_4_ =
                         (fVar336 + fVar85 + fVar336 * fVar336 * fVar181) * auVar258._0_4_ + fVar85;
                    auVar174._4_4_ =
                         (fVar352 + fVar101 + fVar352 * fVar352 * fVar229) * auVar258._4_4_ +
                         fVar101;
                    auVar174._8_4_ =
                         (fVar353 + fVar130 + fVar353 * fVar353 * fVar230) * auVar258._8_4_ +
                         fVar130;
                    auVar174._12_4_ =
                         (fVar354 + fVar131 + fVar354 * fVar354 * fVar231) * auVar258._12_4_ +
                         fVar131;
                    auVar174._16_4_ =
                         (fVar355 + fVar237 + fVar355 * fVar355 * fVar232) * auVar182._0_4_ +
                         fVar237;
                    auVar174._20_4_ =
                         (fVar356 + fVar132 + fVar356 * fVar356 * fVar233) * auVar182._4_4_ +
                         fVar132;
                    auVar174._24_4_ =
                         (fVar357 + fVar234 + fVar357 * fVar357 * fVar235) * auVar182._8_4_ +
                         fVar234;
                    auVar174._28_4_ = auVar94._28_4_ + fVar236 + auVar172._28_4_ + fVar236;
                    auVar327 = vrcpps_avx(auVar174);
                    fVar85 = auVar327._0_4_;
                    fVar101 = auVar327._4_4_;
                    fVar130 = auVar327._8_4_;
                    fVar131 = auVar327._12_4_;
                    fVar237 = auVar327._16_4_;
                    fVar132 = auVar327._20_4_;
                    fVar234 = auVar327._24_4_;
                    auVar43._4_4_ = auVar174._4_4_ * (fVar101 + fVar101);
                    auVar43._0_4_ = auVar174._0_4_ * (fVar85 + fVar85);
                    auVar43._8_4_ = auVar174._8_4_ * (fVar130 + fVar130);
                    auVar43._12_4_ = auVar174._12_4_ * (fVar131 + fVar131);
                    auVar43._16_4_ = auVar174._16_4_ * (fVar237 + fVar237);
                    auVar43._20_4_ = auVar174._20_4_ * (fVar132 + fVar132);
                    auVar43._24_4_ = auVar174._24_4_ * (fVar234 + fVar234);
                    auVar43._28_4_ = auVar174._28_4_;
                    auVar124._8_4_ = 0x40000000;
                    auVar124._0_8_ = 0x4000000040000000;
                    auVar124._12_4_ = 0x40000000;
                    auVar124._16_4_ = 0x40000000;
                    auVar124._20_4_ = 0x40000000;
                    auVar124._24_4_ = 0x40000000;
                    auVar124._28_4_ = 0x40000000;
                    auVar253 = vsubps_avx(auVar124,auVar43);
                    auVar223._0_4_ = fVar85 + fVar85 + -1.0;
                    auVar223._4_4_ = fVar101 + fVar101 + -1.0;
                    auVar223._8_4_ = fVar130 + fVar130 + -1.0;
                    auVar223._12_4_ = fVar131 + fVar131 + -1.0;
                    auVar223._16_4_ = fVar237 + fVar237 + -1.0;
                    auVar223._20_4_ = fVar132 + fVar132 + -1.0;
                    auVar223._24_4_ = fVar234 + fVar234 + -1.0;
                    auVar223._28_4_ = auVar327._28_4_ + auVar327._28_4_ + -1.0;
                    auVar164._0_4_ = auVar223._0_4_ + fVar85 * auVar253._0_4_;
                    auVar164._4_4_ = auVar223._4_4_ + fVar101 * auVar253._4_4_;
                    auVar164._8_4_ = auVar223._8_4_ + fVar130 * auVar253._8_4_;
                    auVar164._12_4_ = auVar223._12_4_ + fVar131 * auVar253._12_4_;
                    auVar164._16_4_ = auVar223._16_4_ + fVar237 * auVar253._16_4_;
                    auVar164._20_4_ = auVar223._20_4_ + fVar132 * auVar253._20_4_;
                    auVar164._24_4_ = auVar223._24_4_ + fVar234 * auVar253._24_4_;
                    goto LAB_002969ce;
                  case 6:
                    fVar85 = **(float **)(&this->field_0x118 + (long)p_Var25);
                    fVar101 = (*(float **)(&this->field_0x118 + (long)p_Var25))[1];
                    auVar223._4_4_ = fVar101;
                    auVar223._0_4_ = fVar101;
                    auVar223._8_4_ = fVar101;
                    auVar223._12_4_ = fVar101;
                    auVar223._16_4_ = fVar101;
                    auVar223._20_4_ = fVar101;
                    auVar223._24_4_ = fVar101;
                    auVar223._28_4_ = fVar101;
                    auVar176._0_4_ = auVar332._0_4_ * fVar85 + fVar101;
                    auVar176._4_4_ = auVar332._4_4_ * fVar85 + fVar101;
                    auVar176._8_4_ = fVar255 * fVar85 + fVar101;
                    auVar176._12_4_ = fVar300 * fVar85 + fVar101;
                    auVar176._16_4_ = fVar301 * fVar85 + fVar101;
                    auVar176._20_4_ = fVar302 * fVar85 + fVar101;
                    auVar176._24_4_ = fVar303 * fVar85 + fVar101;
                    auVar176._28_4_ = fVar85 + fVar101;
                    auVar253 = vmaxps_avx(auVar176,auVar254._0_32_);
                    auVar327 = vminps_avx(auVar253,auVar327);
                    auVar164 = auVar327._0_28_;
LAB_002969ce:
                    in_ZMM3 = ZEXT3264(auVar223);
                    auVar334._0_4_ = auVar332._0_4_ * auVar164._0_4_;
                    auVar334._4_4_ = auVar332._4_4_ * auVar164._4_4_;
                    auVar334._8_4_ = fVar255 * auVar164._8_4_;
                    auVar334._12_4_ = fVar300 * auVar164._12_4_;
                    auVar334._16_4_ = fVar301 * auVar164._16_4_;
                    auVar334._20_4_ = fVar302 * auVar164._20_4_;
                    auVar334._24_4_ = fVar303 * auVar164._24_4_;
                    auVar329 = auVar334._0_32_;
                  }
                  *(undefined1 (*) [32])pAVar71 = auVar329;
                  pAVar71 = pAVar71 + 4;
                  uVar78 = uVar78 + 1;
                  iVar57 = iVar57 + 1;
                } while (uVar78 != local_1a8.w);
              }
              iVar65 = iVar65 + 1;
            } while (iVar65 != local_1a8.h);
          }
          local_270 = local_270 + 1;
        } while (local_270 != local_1a8.c);
      }
      if ((((int)local_160 == 8) && (uVar77 == 4)) && (0 < (long)local_1a8.c)) {
        p_Var25 = local_148[-3];
        iVar19 = *(int *)(&this->field_0xdc + (long)p_Var25);
        iVar20 = *(int *)(&this->field_0xe0 + (long)p_Var25);
        iVar62 = *(int *)(&this->field_0xe4 + (long)p_Var25);
        iVar64 = *(int *)(&this->field_0xe8 + (long)p_Var25);
        uVar23 = *(undefined4 *)(&this->field_0x114 + (long)p_Var25);
        lVar80 = *(long *)(&this->field_0x1a8 + (long)p_Var25);
        uVar21 = *(uint *)(&this->field_0xd4 + (long)p_Var25);
        uVar22 = *(uint *)(&this->field_0xd8 + (long)p_Var25);
        local_270 = 0;
        auVar319 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar248._8_4_ = 0x3f000000;
        auVar248._0_8_ = 0x3f0000003f000000;
        auVar248._12_4_ = 0x3f000000;
        auVar254 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        do {
          if (0 < local_1a8.h) {
            iVar73 = bottom_blob->w;
            iVar79 = bottom_blob->h;
            pAVar71 = (Allocator *)
                      ((long)(_func_int ***)local_1a8.data +
                      local_1a8.cstep * local_270 *
                      CONCAT44(local_1a8.elemsize._4_4_,(int)local_1a8.elemsize));
            uVar24 = bottom_blob->c;
            iVar65 = 0;
            do {
              if (0 < local_1a8.w) {
                uVar78 = 0;
                iVar57 = (1 - uVar21) * iVar19;
                do {
                  if (lVar80 == 0) {
                    auVar104 = ZEXT816(0) << 0x40;
                  }
                  else {
                    auVar104 = *(undefined1 (*) [16])(lVar80 + local_270 * 0x10);
                  }
                  auVar320 = ZEXT1664(auVar104);
                  if (0 < (int)uVar24) {
                    pvVar84 = (void *)((this->weight_data_tm).cstep * local_270 *
                                       (this->weight_data_tm).elemsize +
                                      (long)(this->weight_data_tm).data);
                    pvVar29 = bottom_blob->data;
                    uVar63 = 0;
                    do {
                      if (0 < (int)uVar22) {
                        uVar83 = 0;
                        uVar81 = 0;
                        do {
                          iVar53 = (((int)uVar81 - uVar22) + 1) * iVar20 + iVar65;
                          if (((-1 < iVar53) && (iVar54 = iVar53 / iVar64, iVar53 % iVar64 == 0)) &&
                             ((0 < (int)uVar21 && (iVar54 < iVar79)))) {
                            lVar74 = (long)iVar54 * (long)bottom_blob->w * bottom_blob->elemsize +
                                     bottom_blob->cstep * bottom_blob->elemsize * uVar63;
                            uVar75 = uVar83;
                            uVar68 = (ulong)uVar21;
                            iVar53 = iVar57;
                            do {
                              if (((-1 < iVar53) && (iVar54 = iVar53 / iVar62, iVar53 % iVar62 == 0)
                                  ) && (iVar54 < iVar73)) {
                                lVar59 = (long)(iVar54 << 3);
                                fVar85 = *(float *)((long)pvVar29 + lVar59 * 4 + lVar74);
                                fVar101 = *(float *)((long)pvVar29 + lVar59 * 4 + lVar74 + 4);
                                fVar130 = *(float *)((long)pvVar29 + lVar59 * 4 + lVar74 + 8);
                                fVar131 = *(float *)((long)pvVar29 + lVar59 * 4 + lVar74 + 0xc);
                                fVar237 = *(float *)((long)pvVar29 + lVar59 * 4 + lVar74 + 0x10);
                                fVar132 = *(float *)((long)pvVar29 + lVar59 * 4 + lVar74 + 0x14);
                                fVar234 = *(float *)((long)pvVar29 + lVar59 * 4 + lVar74 + 0x18);
                                fVar236 = *(float *)((long)pvVar29 + lVar59 * 4 + lVar74 + 0x1c);
                                uVar60 = uVar75 & 0xffffffff;
                                pfVar66 = (float *)((long)pvVar84 + uVar60 * 4);
                                pfVar67 = (float *)((long)pvVar84 + uVar60 * 4 + 0x10);
                                pfVar1 = (float *)((long)pvVar84 + uVar60 * 4 + 0x20);
                                pfVar2 = (float *)((long)pvVar84 + uVar60 * 4 + 0x30);
                                pfVar3 = (float *)((long)pvVar84 + uVar60 * 4 + 0x40);
                                in_ZMM7 = ZEXT1664(CONCAT412(fVar237 * pfVar3[3],
                                                             CONCAT48(fVar237 * pfVar3[2],
                                                                      CONCAT44(fVar237 * pfVar3[1],
                                                                               fVar237 * *pfVar3))))
                                ;
                                pfVar4 = (float *)((long)pvVar84 + uVar60 * 4 + 0x50);
                                pfVar5 = (float *)((long)pvVar84 + uVar60 * 4 + 0x60);
                                pfVar6 = (float *)((long)pvVar84 + uVar60 * 4 + 0x70);
                                in_ZMM3 = ZEXT1664(CONCAT412(fVar236 * pfVar6[3],
                                                             CONCAT48(fVar236 * pfVar6[2],
                                                                      CONCAT44(fVar236 * pfVar6[1],
                                                                               fVar236 * *pfVar6))))
                                ;
                                auVar320 = ZEXT1664(CONCAT412(fVar85 * pfVar66[3] + auVar320._12_4_
                                                              + fVar101 * pfVar67[3] +
                                                                fVar130 * pfVar1[3] +
                                                              fVar131 * pfVar2[3] +
                                                              fVar237 * pfVar3[3] +
                                                              fVar132 * pfVar4[3] +
                                                              fVar234 * pfVar5[3] +
                                                              fVar236 * pfVar6[3],
                                                              CONCAT48(fVar85 * pfVar66[2] +
                                                                       auVar320._8_4_ +
                                                                       fVar101 * pfVar67[2] +
                                                                       fVar130 * pfVar1[2] +
                                                                       fVar131 * pfVar2[2] +
                                                                       fVar237 * pfVar3[2] +
                                                                       fVar132 * pfVar4[2] +
                                                                       fVar234 * pfVar5[2] +
                                                                       fVar236 * pfVar6[2],
                                                                       CONCAT44(fVar85 * pfVar66[1]
                                                                                + auVar320._4_4_ +
                                                                                fVar101 * pfVar67[1]
                                                                                + fVar130 * pfVar1[1
                                                  ] + fVar131 * pfVar2[1] + fVar237 * pfVar3[1] +
                                                      fVar132 * pfVar4[1] +
                                                  fVar234 * pfVar5[1] + fVar236 * pfVar6[1],
                                                  fVar85 * *pfVar66 + auVar320._0_4_ +
                                                  fVar101 * *pfVar67 + fVar130 * *pfVar1 +
                                                  fVar131 * *pfVar2 + fVar237 * *pfVar3 +
                                                  fVar132 * *pfVar4 +
                                                  fVar234 * *pfVar5 + fVar236 * *pfVar6))));
                              }
                              uVar75 = uVar75 + 0x20;
                              iVar53 = iVar53 + iVar19;
                              uVar68 = uVar68 - 1;
                            } while (uVar68 != 0);
                          }
                          uVar81 = uVar81 + 1;
                          uVar83 = uVar83 + (ulong)uVar21 * 0x20;
                        } while (uVar81 != uVar22);
                      }
                      auVar104 = auVar320._0_16_;
                      pvVar84 = (void *)((long)pvVar84 + (long)(int)(uVar21 * uVar22 * 0x20) * 4);
                      uVar63 = uVar63 + 1;
                    } while (uVar63 != uVar24);
                  }
                  auVar258 = auVar319._0_16_;
                  auVar182 = auVar254._0_16_;
                  fVar85 = auVar254._0_4_;
                  fVar101 = auVar254._4_4_;
                  fVar130 = auVar254._8_4_;
                  fVar131 = auVar254._12_4_;
                  fVar237 = auVar104._4_4_;
                  fVar132 = auVar104._8_4_;
                  fVar234 = auVar104._12_4_;
                  switch(uVar23) {
                  case 1:
                    auVar104 = vmaxps_avx(auVar258,auVar104);
                    break;
                  case 2:
                    auVar182 = vmaxps_avx(auVar258,auVar104);
                    in_ZMM7 = ZEXT1664(auVar182);
                    auVar258 = vminps_avx(auVar258,auVar104);
                    fVar85 = **(float **)(&this->field_0x118 + (long)p_Var25);
                    auVar104._0_4_ = fVar85 * auVar258._0_4_ + auVar182._0_4_;
                    auVar104._4_4_ = fVar85 * auVar258._4_4_ + auVar182._4_4_;
                    auVar104._8_4_ = fVar85 * auVar258._8_4_ + auVar182._8_4_;
                    auVar104._12_4_ = fVar85 * auVar258._12_4_ + auVar182._12_4_;
                    break;
                  case 3:
                    uVar7 = **(undefined4 **)(&this->field_0x118 + (long)p_Var25);
                    auVar265._4_4_ = uVar7;
                    auVar265._0_4_ = uVar7;
                    auVar265._8_4_ = uVar7;
                    auVar265._12_4_ = uVar7;
                    in_ZMM7 = ZEXT1664(auVar265);
                    uVar7 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var25))[1];
                    auVar339._4_4_ = uVar7;
                    auVar339._0_4_ = uVar7;
                    auVar339._8_4_ = uVar7;
                    auVar339._12_4_ = uVar7;
                    auVar182 = vmaxps_avx(auVar104,auVar265);
                    auVar104 = vminps_avx(auVar339,auVar182);
                    break;
                  case 4:
                    auVar105._0_8_ = auVar104._0_8_ ^ 0x8000000080000000;
                    auVar105._8_4_ = -fVar132;
                    auVar105._12_4_ = -fVar234;
                    auVar138._8_4_ = 0x42b0c0a5;
                    auVar138._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar138._12_4_ = 0x42b0c0a5;
                    auVar258 = vminps_avx(auVar105,auVar138);
                    auVar139._8_4_ = 0xc2b0c0a5;
                    auVar139._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar139._12_4_ = 0xc2b0c0a5;
                    auVar305 = vmaxps_avx(auVar258,auVar139);
                    auVar266._0_4_ = auVar305._0_4_ * 1.442695 + 0.5;
                    auVar266._4_4_ = auVar305._4_4_ * 1.442695 + 0.5;
                    auVar266._8_4_ = auVar305._8_4_ * 1.442695 + 0.5;
                    auVar266._12_4_ = auVar305._12_4_ * 1.442695 + 0.5;
                    auVar340._0_4_ = (int)auVar266._0_4_;
                    auVar340._4_4_ = (int)auVar266._4_4_;
                    auVar340._8_4_ = (int)auVar266._8_4_;
                    auVar340._12_4_ = (int)auVar266._12_4_;
                    auVar323 = vcvtdq2ps_avx(auVar340);
                    auVar258 = vcmpps_avx(auVar266,auVar323,1);
                    auVar258 = vandps_avx(auVar258,auVar182);
                    auVar258 = vsubps_avx(auVar323,auVar258);
                    fVar237 = auVar258._0_4_ * -0.6931472 + auVar305._0_4_;
                    fVar132 = auVar258._4_4_ * -0.6931472 + auVar305._4_4_;
                    fVar234 = auVar258._8_4_ * -0.6931472 + auVar305._8_4_;
                    fVar236 = auVar258._12_4_ * -0.6931472 + auVar305._12_4_;
                    auVar267._0_4_ = (int)auVar258._0_4_;
                    auVar267._4_4_ = (int)auVar258._4_4_;
                    auVar267._8_4_ = (int)auVar258._8_4_;
                    auVar267._12_4_ = (int)auVar258._12_4_;
                    auVar258 = vpslld_avx(auVar267,0x17);
                    auVar258 = vpaddd_avx(auVar258,auVar182);
                    auVar106._0_4_ =
                         (fVar237 * fVar237 *
                          (((((fVar237 * 0.00019875691 + 0.0013981999) * fVar237 + 0.008333452) *
                             fVar237 + 0.041665796) * fVar237 + 0.16666666) * fVar237 + 0.5) +
                         fVar237 + fVar85) * auVar258._0_4_ + fVar85;
                    auVar106._4_4_ =
                         (fVar132 * fVar132 *
                          (((((fVar132 * 0.00019875691 + 0.0013981999) * fVar132 + 0.008333452) *
                             fVar132 + 0.041665796) * fVar132 + 0.16666666) * fVar132 + 0.5) +
                         fVar132 + fVar101) * auVar258._4_4_ + fVar101;
                    auVar106._8_4_ =
                         (fVar234 * fVar234 *
                          (((((fVar234 * 0.00019875691 + 0.0013981999) * fVar234 + 0.008333452) *
                             fVar234 + 0.041665796) * fVar234 + 0.16666666) * fVar234 + 0.5) +
                         fVar234 + fVar130) * auVar258._8_4_ + fVar130;
                    auVar106._12_4_ =
                         (fVar236 * fVar236 *
                          (((((fVar236 * 0.00019875691 + 0.0013981999) * fVar236 + 0.008333452) *
                             fVar236 + 0.041665796) * fVar236 + 0.16666666) * fVar236 + 0.5) +
                         fVar236 + fVar131) * auVar258._12_4_ + fVar131;
                    auVar258 = vrcpps_avx(auVar106);
                    in_ZMM7 = ZEXT1664(auVar258);
                    fVar85 = auVar258._0_4_;
                    auVar107._0_4_ = auVar106._0_4_ * fVar85;
                    fVar101 = auVar258._4_4_;
                    auVar107._4_4_ = auVar106._4_4_ * fVar101;
                    fVar130 = auVar258._8_4_;
                    auVar107._8_4_ = auVar106._8_4_ * fVar130;
                    fVar131 = auVar258._12_4_;
                    auVar107._12_4_ = auVar106._12_4_ * fVar131;
                    auVar182 = vsubps_avx(auVar182,auVar107);
                    auVar104._0_4_ = fVar85 + fVar85 * auVar182._0_4_;
                    auVar104._4_4_ = fVar101 + fVar101 * auVar182._4_4_;
                    auVar104._8_4_ = fVar130 + fVar130 * auVar182._8_4_;
                    auVar104._12_4_ = fVar131 + fVar131 * auVar182._12_4_;
                    break;
                  case 5:
                    auVar239._8_4_ = 0x42b0c0a5;
                    auVar239._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar239._12_4_ = 0x42b0c0a5;
                    auVar258 = vminps_avx(auVar104,auVar239);
                    auVar306._8_4_ = 0xc2b0c0a5;
                    auVar306._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar306._12_4_ = 0xc2b0c0a5;
                    auVar305 = vmaxps_avx(auVar306,auVar258);
                    auVar322._0_4_ = auVar305._0_4_ * 1.442695 + 0.5;
                    auVar322._4_4_ = auVar305._4_4_ * 1.442695 + 0.5;
                    auVar322._8_4_ = auVar305._8_4_ * 1.442695 + 0.5;
                    auVar322._12_4_ = auVar305._12_4_ * 1.442695 + 0.5;
                    auVar337._0_4_ = (int)auVar322._0_4_;
                    auVar337._4_4_ = (int)auVar322._4_4_;
                    auVar337._8_4_ = (int)auVar322._8_4_;
                    auVar337._12_4_ = (int)auVar322._12_4_;
                    auVar323 = vcvtdq2ps_avx(auVar337);
                    auVar258 = vcmpps_avx(auVar322,auVar323,1);
                    auVar258 = vandps_avx(auVar258,auVar182);
                    auVar258 = vsubps_avx(auVar323,auVar258);
                    auVar338._0_4_ = auVar258._0_4_ * 0.6931472;
                    auVar338._4_4_ = auVar258._4_4_ * 0.6931472;
                    auVar338._8_4_ = auVar258._8_4_ * 0.6931472;
                    auVar338._12_4_ = auVar258._12_4_ * 0.6931472;
                    auVar323 = vsubps_avx(auVar305,auVar338);
                    fVar236 = auVar323._0_4_;
                    fVar181 = auVar323._4_4_;
                    fVar229 = auVar323._8_4_;
                    fVar230 = auVar323._12_4_;
                    auVar261._0_4_ = (int)auVar258._0_4_;
                    auVar261._4_4_ = (int)auVar258._4_4_;
                    auVar261._8_4_ = (int)auVar258._8_4_;
                    auVar261._12_4_ = (int)auVar258._12_4_;
                    auVar258 = vpslld_avx(auVar261,0x17);
                    auVar258 = vpaddd_avx(auVar258,auVar182);
                    auVar262._0_4_ =
                         (fVar236 + fVar85 +
                         fVar236 * fVar236 *
                         (((((fVar236 * 0.00019875691 + 0.0013981999) * fVar236 + 0.008333452) *
                            fVar236 + 0.041665796) * fVar236 + 0.16666666) * fVar236 + 0.5)) *
                         auVar258._0_4_ + fVar85;
                    auVar262._4_4_ =
                         (fVar181 + fVar101 +
                         fVar181 * fVar181 *
                         (((((fVar181 * 0.00019875691 + 0.0013981999) * fVar181 + 0.008333452) *
                            fVar181 + 0.041665796) * fVar181 + 0.16666666) * fVar181 + 0.5)) *
                         auVar258._4_4_ + fVar101;
                    auVar262._8_4_ =
                         (fVar229 + fVar130 +
                         fVar229 * fVar229 *
                         (((((fVar229 * 0.00019875691 + 0.0013981999) * fVar229 + 0.008333452) *
                            fVar229 + 0.041665796) * fVar229 + 0.16666666) * fVar229 + 0.5)) *
                         auVar258._8_4_ + fVar130;
                    auVar262._12_4_ =
                         (fVar230 + fVar131 +
                         fVar230 * fVar230 *
                         (((((fVar230 * 0.00019875691 + 0.0013981999) * fVar230 + 0.008333452) *
                            fVar230 + 0.041665796) * fVar230 + 0.16666666) * fVar230 + 0.5)) *
                         auVar258._12_4_ + fVar131;
                    auVar133._8_4_ = 0x800000;
                    auVar133._0_8_ = 0x80000000800000;
                    auVar133._12_4_ = 0x800000;
                    auVar258 = vmaxps_avx(auVar262,auVar133);
                    auVar323 = vpsrld_avx(auVar258,0x17);
                    auVar185._8_4_ = 0xffffff82;
                    auVar185._0_8_ = 0xffffff82ffffff82;
                    auVar185._12_4_ = 0xffffff82;
                    auVar323 = vpaddd_avx(auVar323,auVar185);
                    auVar186._8_4_ = 0x807fffff;
                    auVar186._0_8_ = 0x807fffff807fffff;
                    auVar186._12_4_ = 0x807fffff;
                    auVar258 = vandps_avx(auVar258,auVar186);
                    auVar88 = vorps_avx(auVar258,auVar248);
                    auVar305 = vcvtdq2ps_avx(auVar323);
                    auVar187._8_4_ = 0x3f3504f3;
                    auVar187._0_8_ = 0x3f3504f33f3504f3;
                    auVar187._12_4_ = 0x3f3504f3;
                    auVar323 = vcmpps_avx(auVar88,auVar187,1);
                    auVar258 = vandps_avx(auVar323,auVar88);
                    fVar236 = auVar88._0_4_ + -1.0 + auVar258._0_4_;
                    fVar181 = auVar88._4_4_ + -1.0 + auVar258._4_4_;
                    fVar229 = auVar88._8_4_ + -1.0 + auVar258._8_4_;
                    fVar230 = auVar88._12_4_ + -1.0 + auVar258._12_4_;
                    auVar258 = vandps_avx(auVar323,auVar182);
                    auVar323 = vsubps_avx(auVar305,auVar258);
                    auVar258 = vcmpps_avx(auVar262,_DAT_005930d0,2);
                    auVar134._0_4_ =
                         (fVar236 * fVar236 *
                          (((((((((fVar236 * 0.070376836 + -0.1151461) * fVar236 + 0.116769984) *
                                 fVar236 + -0.12420141) * fVar236 + 0.14249323) * fVar236 +
                              -0.16668057) * fVar236 + 0.20000714) * fVar236 + -0.24999994) *
                            fVar236 + 0.3333333) * fVar236 + -0.5) +
                         auVar323._0_4_ * 0.6931472 + fVar236) * -2.0;
                    auVar134._4_4_ =
                         (fVar181 * fVar181 *
                          (((((((((fVar181 * 0.070376836 + -0.1151461) * fVar181 + 0.116769984) *
                                 fVar181 + -0.12420141) * fVar181 + 0.14249323) * fVar181 +
                              -0.16668057) * fVar181 + 0.20000714) * fVar181 + -0.24999994) *
                            fVar181 + 0.3333333) * fVar181 + -0.5) +
                         auVar323._4_4_ * 0.6931472 + fVar181) * -2.0;
                    auVar134._8_4_ =
                         (fVar229 * fVar229 *
                          (((((((((fVar229 * 0.070376836 + -0.1151461) * fVar229 + 0.116769984) *
                                 fVar229 + -0.12420141) * fVar229 + 0.14249323) * fVar229 +
                              -0.16668057) * fVar229 + 0.20000714) * fVar229 + -0.24999994) *
                            fVar229 + 0.3333333) * fVar229 + -0.5) +
                         auVar323._8_4_ * 0.6931472 + fVar229) * -2.0;
                    auVar134._12_4_ =
                         (fVar230 * fVar230 *
                          (((((((((fVar230 * 0.070376836 + -0.1151461) * fVar230 + 0.116769984) *
                                 fVar230 + -0.12420141) * fVar230 + 0.14249323) * fVar230 +
                              -0.16668057) * fVar230 + 0.20000714) * fVar230 + -0.24999994) *
                            fVar230 + 0.3333333) * fVar230 + -0.5) +
                         auVar323._12_4_ * 0.6931472 + fVar230) * -2.0;
                    auVar188._8_4_ = 0x7fffffff;
                    auVar188._0_8_ = 0x7fffffff7fffffff;
                    auVar188._12_4_ = 0x7fffffff;
                    auVar258 = vblendvps_avx(auVar134,auVar188,auVar258);
                    auVar189._8_4_ = 0x42b0c0a5;
                    auVar189._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar189._12_4_ = 0x42b0c0a5;
                    auVar258 = vminps_avx(auVar258,auVar189);
                    auVar190._8_4_ = 0xc2b0c0a5;
                    auVar190._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar190._12_4_ = 0xc2b0c0a5;
                    auVar305 = vmaxps_avx(auVar258,auVar190);
                    auVar191._0_4_ = auVar305._0_4_ * 1.442695 + 0.5;
                    auVar191._4_4_ = auVar305._4_4_ * 1.442695 + 0.5;
                    auVar191._8_4_ = auVar305._8_4_ * 1.442695 + 0.5;
                    auVar191._12_4_ = auVar305._12_4_ * 1.442695 + 0.5;
                    auVar263._0_4_ = (int)auVar191._0_4_;
                    auVar263._4_4_ = (int)auVar191._4_4_;
                    auVar263._8_4_ = (int)auVar191._8_4_;
                    auVar263._12_4_ = (int)auVar191._12_4_;
                    auVar323 = vcvtdq2ps_avx(auVar263);
                    auVar258 = vcmpps_avx(auVar191,auVar323,1);
                    auVar258 = vandps_avx(auVar258,auVar182);
                    auVar258 = vsubps_avx(auVar323,auVar258);
                    auVar264._0_4_ = auVar258._0_4_ * 0.6931472;
                    auVar264._4_4_ = auVar258._4_4_ * 0.6931472;
                    auVar264._8_4_ = auVar258._8_4_ * 0.6931472;
                    auVar264._12_4_ = auVar258._12_4_ * 0.6931472;
                    auVar254 = ZEXT1664(auVar182);
                    auVar323 = vsubps_avx(auVar305,auVar264);
                    fVar236 = auVar323._0_4_;
                    fVar181 = auVar323._4_4_;
                    fVar229 = auVar323._8_4_;
                    fVar230 = auVar323._12_4_;
                    auVar319 = ZEXT864(0) << 0x20;
                    auVar192._0_4_ = (int)auVar258._0_4_;
                    auVar192._4_4_ = (int)auVar258._4_4_;
                    auVar192._8_4_ = (int)auVar258._8_4_;
                    auVar192._12_4_ = (int)auVar258._12_4_;
                    auVar258 = vpslld_avx(auVar192,0x17);
                    auVar182 = vpaddd_avx(auVar258,auVar182);
                    auVar135._0_4_ =
                         (fVar236 + fVar85 +
                         (((((fVar236 * 0.00019875691 + 0.0013981999) * fVar236 + 0.008333452) *
                            fVar236 + 0.041665796) * fVar236 + 0.16666666) * fVar236 + 0.5) *
                         fVar236 * fVar236) * auVar182._0_4_ + fVar85;
                    auVar135._4_4_ =
                         (fVar181 + fVar101 +
                         (((((fVar181 * 0.00019875691 + 0.0013981999) * fVar181 + 0.008333452) *
                            fVar181 + 0.041665796) * fVar181 + 0.16666666) * fVar181 + 0.5) *
                         fVar181 * fVar181) * auVar182._4_4_ + fVar101;
                    auVar135._8_4_ =
                         (fVar229 + fVar130 +
                         (((((fVar229 * 0.00019875691 + 0.0013981999) * fVar229 + 0.008333452) *
                            fVar229 + 0.041665796) * fVar229 + 0.16666666) * fVar229 + 0.5) *
                         fVar229 * fVar229) * auVar182._8_4_ + fVar130;
                    auVar135._12_4_ =
                         (fVar230 + fVar131 +
                         (((((fVar230 * 0.00019875691 + 0.0013981999) * fVar230 + 0.008333452) *
                            fVar230 + 0.041665796) * fVar230 + 0.16666666) * fVar230 + 0.5) *
                         fVar230 * fVar230) * auVar182._12_4_ + fVar131;
                    auVar182 = vrcpps_avx(auVar135);
                    fVar85 = auVar182._0_4_;
                    fVar236 = fVar85 + fVar85;
                    fVar101 = auVar182._4_4_;
                    fVar181 = fVar101 + fVar101;
                    fVar130 = auVar182._8_4_;
                    fVar229 = fVar130 + fVar130;
                    fVar131 = auVar182._12_4_;
                    fVar230 = fVar131 + fVar131;
                    in_ZMM7 = ZEXT1664(CONCAT412(fVar230,CONCAT48(fVar229,CONCAT44(fVar181,fVar236))
                                                ));
                    auVar136._0_4_ = auVar135._0_4_ * fVar236;
                    auVar136._4_4_ = auVar135._4_4_ * fVar181;
                    auVar136._8_4_ = auVar135._8_4_ * fVar229;
                    auVar136._12_4_ = auVar135._12_4_ * fVar230;
                    auVar240._8_4_ = 0x40000000;
                    auVar240._0_8_ = 0x4000000040000000;
                    auVar240._12_4_ = 0x40000000;
                    auVar182 = vsubps_avx(auVar240,auVar136);
                    auVar193._0_4_ = fVar236 + -1.0;
                    auVar193._4_4_ = fVar181 + -1.0;
                    auVar193._8_4_ = fVar229 + -1.0;
                    auVar193._12_4_ = fVar230 + -1.0;
                    auVar137._0_4_ = auVar193._0_4_ + fVar85 * auVar182._0_4_;
                    auVar137._4_4_ = auVar193._4_4_ + fVar101 * auVar182._4_4_;
                    auVar137._8_4_ = auVar193._8_4_ + fVar130 * auVar182._8_4_;
                    auVar137._12_4_ = auVar193._12_4_ + fVar131 * auVar182._12_4_;
                    goto LAB_00297225;
                  case 6:
                    fVar85 = **(float **)(&this->field_0x118 + (long)p_Var25);
                    fVar101 = (*(float **)(&this->field_0x118 + (long)p_Var25))[1];
                    auVar193._4_4_ = fVar101;
                    auVar193._0_4_ = fVar101;
                    auVar193._8_4_ = fVar101;
                    auVar193._12_4_ = fVar101;
                    auVar140._0_4_ = fVar85 * auVar104._0_4_ + fVar101;
                    auVar140._4_4_ = fVar85 * fVar237 + fVar101;
                    auVar140._8_4_ = fVar85 * fVar132 + fVar101;
                    auVar140._12_4_ = fVar85 * fVar234 + fVar101;
                    auVar258 = vmaxps_avx(auVar258,auVar140);
                    auVar137 = vminps_avx(auVar258,auVar182);
LAB_00297225:
                    in_ZMM3 = ZEXT1664(auVar193);
                    auVar104._0_4_ = auVar137._0_4_ * auVar104._0_4_;
                    auVar104._4_4_ = auVar137._4_4_ * fVar237;
                    auVar104._8_4_ = auVar137._8_4_ * fVar132;
                    auVar104._12_4_ = auVar137._12_4_ * fVar234;
                  }
                  *(undefined1 (*) [16])pAVar71 = auVar104;
                  pAVar71 = pAVar71 + 2;
                  uVar78 = uVar78 + 1;
                  iVar57 = iVar57 + 1;
                } while (uVar78 != local_1a8.w);
              }
              iVar65 = iVar65 + 1;
            } while (iVar65 != local_1a8.h);
          }
          local_270 = local_270 + 1;
        } while (local_270 != local_1a8.c);
      }
      if ((((int)local_160 == 1) && (uVar77 == 8)) && (0 < (long)local_1a8.c)) {
        p_Var25 = local_148[-3];
        iVar19 = *(int *)(&this->field_0xdc + (long)p_Var25);
        iVar20 = *(int *)(&this->field_0xe0 + (long)p_Var25);
        iVar62 = *(int *)(&this->field_0xe4 + (long)p_Var25);
        iVar64 = *(int *)(&this->field_0xe8 + (long)p_Var25);
        uVar23 = *(undefined4 *)(&this->field_0x114 + (long)p_Var25);
        lVar80 = *(long *)(&this->field_0x1a8 + (long)p_Var25);
        uVar21 = *(uint *)(&this->field_0xd4 + (long)p_Var25);
        uVar22 = *(uint *)(&this->field_0xd8 + (long)p_Var25);
        local_270 = 0;
        auVar254 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar320 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar319 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar313._8_4_ = 0x42b0c0a5;
        auVar313._0_8_ = 0x42b0c0a542b0c0a5;
        auVar313._12_4_ = 0x42b0c0a5;
        auVar313._16_4_ = 0x42b0c0a5;
        auVar313._20_4_ = 0x42b0c0a5;
        auVar313._24_4_ = 0x42b0c0a5;
        auVar313._28_4_ = 0x42b0c0a5;
        auVar318._8_4_ = 0xc2b0c0a5;
        auVar318._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar318._12_4_ = 0xc2b0c0a5;
        auVar318._16_4_ = 0xc2b0c0a5;
        auVar318._20_4_ = 0xc2b0c0a5;
        auVar318._24_4_ = 0xc2b0c0a5;
        auVar318._28_4_ = 0xc2b0c0a5;
        do {
          if (0 < local_1a8.h) {
            iVar73 = bottom_blob->w;
            iVar79 = bottom_blob->h;
            pAVar71 = (Allocator *)
                      ((long)(_func_int ***)local_1a8.data +
                      local_1a8.cstep * local_270 *
                      CONCAT44(local_1a8.elemsize._4_4_,(int)local_1a8.elemsize));
            uVar24 = bottom_blob->c;
            iVar65 = 0;
            do {
              if (0 < local_1a8.w) {
                uVar78 = 0;
                iVar57 = (1 - uVar21) * iVar19;
                do {
                  if (lVar80 == 0) {
                    auVar332 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  else {
                    auVar332 = ZEXT3264(*(undefined1 (*) [32])(lVar80 + local_270 * 0x20));
                  }
                  if (0 < (int)uVar24) {
                    pvVar84 = (void *)((this->weight_data_tm).cstep * local_270 *
                                       (this->weight_data_tm).elemsize +
                                      (long)(this->weight_data_tm).data);
                    uVar63 = 0;
                    do {
                      if (0 < (int)uVar22) {
                        uVar81 = 0;
                        uVar83 = 0;
                        do {
                          iVar53 = (((int)uVar83 - uVar22) + 1) * iVar20 + iVar65;
                          if (((-1 < iVar53) && (iVar54 = iVar53 / iVar64, iVar53 % iVar64 == 0)) &&
                             ((iVar54 < iVar79 && (0 < (int)uVar21)))) {
                            uVar75 = uVar81;
                            uVar68 = (ulong)uVar21;
                            iVar53 = iVar57;
                            do {
                              if (((-1 < iVar53) && (iVar55 = iVar53 / iVar62, iVar53 % iVar62 == 0)
                                  ) && (iVar55 < iVar73)) {
                                fVar85 = *(float *)((long)bottom_blob->data +
                                                   (long)iVar55 * 4 +
                                                   (long)iVar54 *
                                                   (long)bottom_blob->w * bottom_blob->elemsize +
                                                   bottom_blob->cstep * bottom_blob->elemsize *
                                                   uVar63);
                                pfVar66 = (float *)((long)pvVar84 + (uVar75 & 0xffffffff) * 4);
                                auVar332 = ZEXT3264(CONCAT428(auVar332._28_4_ + fVar85,
                                                              CONCAT424(auVar332._24_4_ +
                                                                        fVar85 * pfVar66[6],
                                                                        CONCAT420(auVar332._20_4_ +
                                                                                  fVar85 * pfVar66[5
                                                  ],CONCAT416(auVar332._16_4_ + fVar85 * pfVar66[4],
                                                              CONCAT412(auVar332._12_4_ +
                                                                        fVar85 * pfVar66[3],
                                                                        CONCAT48(auVar332._8_4_ +
                                                                                 fVar85 * pfVar66[2]
                                                                                 ,CONCAT44(auVar332.
                                                  _4_4_ + fVar85 * pfVar66[1],
                                                  auVar332._0_4_ + fVar85 * *pfVar66))))))));
                              }
                              uVar75 = uVar75 + 8;
                              iVar53 = iVar53 + iVar19;
                              uVar68 = uVar68 - 1;
                            } while (uVar68 != 0);
                          }
                          uVar83 = uVar83 + 1;
                          uVar81 = uVar81 + (ulong)uVar21 * 8;
                        } while (uVar83 != uVar22);
                      }
                      pvVar84 = (void *)((long)pvVar84 + (long)(int)(uVar21 * uVar22 * 8) * 4);
                      uVar63 = uVar63 + 1;
                    } while (uVar63 != uVar24);
                  }
                  auVar331 = auVar332._0_32_;
                  fVar255 = auVar332._8_4_;
                  fVar300 = auVar332._12_4_;
                  fVar301 = auVar332._16_4_;
                  fVar302 = auVar332._20_4_;
                  fVar303 = auVar332._24_4_;
                  fVar181 = auVar320._0_4_;
                  fVar229 = auVar320._4_4_;
                  fVar230 = auVar320._8_4_;
                  fVar231 = auVar320._12_4_;
                  fVar232 = auVar320._16_4_;
                  fVar233 = auVar320._20_4_;
                  fVar235 = auVar320._24_4_;
                  fVar321 = auVar320._28_4_;
                  auVar327 = auVar319._0_32_;
                  fVar85 = auVar319._0_4_;
                  fVar101 = auVar319._4_4_;
                  fVar130 = auVar319._8_4_;
                  fVar131 = auVar319._12_4_;
                  fVar237 = auVar319._16_4_;
                  fVar132 = auVar319._20_4_;
                  fVar234 = auVar319._24_4_;
                  fVar236 = auVar319._28_4_;
                  auVar335._28_36_ = auVar332._28_36_;
                  switch(uVar23) {
                  case 1:
                    auVar331 = vmaxps_avx(auVar331,auVar254._0_32_);
                    break;
                  case 2:
                    auVar327 = vmaxps_avx(auVar331,ZEXT1632(ZEXT816(0) << 0x40));
                    in_ZMM7 = ZEXT3264(auVar327);
                    auVar254 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar253 = vminps_avx(auVar331,ZEXT1632(ZEXT816(0) << 0x40));
                    fVar85 = **(float **)(&this->field_0x118 + (long)p_Var25);
                    auVar331._0_4_ = fVar85 * auVar253._0_4_ + auVar327._0_4_;
                    auVar331._4_4_ = fVar85 * auVar253._4_4_ + auVar327._4_4_;
                    auVar331._8_4_ = fVar85 * auVar253._8_4_ + auVar327._8_4_;
                    auVar331._12_4_ = fVar85 * auVar253._12_4_ + auVar327._12_4_;
                    auVar331._16_4_ = fVar85 * auVar253._16_4_ + auVar327._16_4_;
                    auVar331._20_4_ = fVar85 * auVar253._20_4_ + auVar327._20_4_;
                    auVar331._24_4_ = fVar85 * auVar253._24_4_ + auVar327._24_4_;
                    auVar331._28_4_ = auVar253._28_4_ + auVar327._28_4_;
                    break;
                  case 3:
                    uVar7 = **(undefined4 **)(&this->field_0x118 + (long)p_Var25);
                    auVar297._4_4_ = uVar7;
                    auVar297._0_4_ = uVar7;
                    auVar297._8_4_ = uVar7;
                    auVar297._12_4_ = uVar7;
                    auVar297._16_4_ = uVar7;
                    auVar297._20_4_ = uVar7;
                    auVar297._24_4_ = uVar7;
                    auVar297._28_4_ = uVar7;
                    uVar7 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var25))[1];
                    auVar351._4_4_ = uVar7;
                    auVar351._0_4_ = uVar7;
                    auVar351._8_4_ = uVar7;
                    auVar351._12_4_ = uVar7;
                    auVar351._16_4_ = uVar7;
                    auVar351._20_4_ = uVar7;
                    auVar351._24_4_ = uVar7;
                    auVar351._28_4_ = uVar7;
                    auVar327 = vmaxps_avx(auVar331,auVar297);
                    in_ZMM7 = ZEXT3264(auVar327);
                    auVar331 = vminps_avx(auVar351,auVar327);
                    break;
                  case 4:
                    auVar298._0_8_ = auVar332._0_8_ ^ 0x8000000080000000;
                    auVar298._8_4_ = -fVar255;
                    auVar298._12_4_ = -fVar300;
                    auVar298._16_4_ = -fVar301;
                    auVar298._20_4_ = -fVar302;
                    auVar298._24_4_ = -fVar303;
                    auVar298._28_4_ = -auVar332._28_4_;
                    auVar128._8_4_ = 0x42b0c0a5;
                    auVar128._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar128._12_4_ = 0x42b0c0a5;
                    auVar128._16_4_ = 0x42b0c0a5;
                    auVar128._20_4_ = 0x42b0c0a5;
                    auVar128._24_4_ = 0x42b0c0a5;
                    auVar128._28_4_ = 0x42b0c0a5;
                    auVar253 = vminps_avx(auVar298,auVar128);
                    auVar129._8_4_ = 0xc2b0c0a5;
                    auVar129._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar129._12_4_ = 0xc2b0c0a5;
                    auVar129._16_4_ = 0xc2b0c0a5;
                    auVar129._20_4_ = 0xc2b0c0a5;
                    auVar129._24_4_ = 0xc2b0c0a5;
                    auVar129._28_4_ = 0xc2b0c0a5;
                    auVar94 = vmaxps_avx(auVar253,auVar129);
                    auVar330._0_4_ = auVar94._0_4_ * 1.442695 + fVar181;
                    auVar330._4_4_ = auVar94._4_4_ * 1.442695 + fVar229;
                    auVar330._8_4_ = auVar94._8_4_ * 1.442695 + fVar230;
                    auVar330._12_4_ = auVar94._12_4_ * 1.442695 + fVar231;
                    auVar330._16_4_ = auVar94._16_4_ * 1.442695 + fVar232;
                    auVar330._20_4_ = auVar94._20_4_ * 1.442695 + fVar233;
                    auVar330._24_4_ = auVar94._24_4_ * 1.442695 + fVar235;
                    auVar330._28_4_ = auVar332._28_4_ + fVar321;
                    auVar172 = vroundps_avx(auVar330,1);
                    auVar253 = vcmpps_avx(auVar330,auVar172,1);
                    auVar253 = vandps_avx(auVar253,auVar327);
                    auVar253 = vsubps_avx(auVar172,auVar253);
                    fVar255 = auVar253._0_4_ * -0.6931472 + auVar94._0_4_;
                    fVar300 = auVar253._4_4_ * -0.6931472 + auVar94._4_4_;
                    fVar301 = auVar253._8_4_ * -0.6931472 + auVar94._8_4_;
                    fVar302 = auVar253._12_4_ * -0.6931472 + auVar94._12_4_;
                    fVar303 = auVar253._16_4_ * -0.6931472 + auVar94._16_4_;
                    fVar336 = auVar253._20_4_ * -0.6931472 + auVar94._20_4_;
                    fVar352 = auVar253._24_4_ * -0.6931472 + auVar94._24_4_;
                    auVar268._0_4_ = (int)auVar253._0_4_;
                    auVar268._4_4_ = (int)auVar253._4_4_;
                    auVar268._8_4_ = (int)auVar253._8_4_;
                    auVar268._12_4_ = (int)auVar253._12_4_;
                    auVar299._16_4_ = (int)auVar253._16_4_;
                    auVar299._0_16_ = auVar268;
                    auVar299._20_4_ = (int)auVar253._20_4_;
                    auVar299._24_4_ = (int)auVar253._24_4_;
                    auVar299._28_4_ = (int)auVar253._28_4_;
                    auVar258 = vpslld_avx(auVar268,0x17);
                    auVar182 = vpslld_avx(auVar299._16_16_,0x17);
                    auVar109._8_4_ = 0x3f800000;
                    auVar109._0_8_ = 0x3f8000003f800000;
                    auVar109._12_4_ = 0x3f800000;
                    auVar182 = vpaddd_avx(auVar182,auVar109);
                    auVar258 = vpaddd_avx(auVar258,auVar109);
                    auVar179._0_4_ =
                         (fVar255 + fVar85 +
                         fVar255 * fVar255 *
                         (fVar181 +
                         ((((fVar255 * 0.00019875691 + 0.0013981999) * fVar255 + 0.008333452) *
                           fVar255 + 0.041665796) * fVar255 + 0.16666666) * fVar255)) *
                         auVar258._0_4_ + fVar85;
                    auVar179._4_4_ =
                         (fVar300 + fVar101 +
                         fVar300 * fVar300 *
                         (fVar229 +
                         ((((fVar300 * 0.00019875691 + 0.0013981999) * fVar300 + 0.008333452) *
                           fVar300 + 0.041665796) * fVar300 + 0.16666666) * fVar300)) *
                         auVar258._4_4_ + fVar101;
                    auVar179._8_4_ =
                         (fVar301 + fVar130 +
                         fVar301 * fVar301 *
                         (fVar230 +
                         ((((fVar301 * 0.00019875691 + 0.0013981999) * fVar301 + 0.008333452) *
                           fVar301 + 0.041665796) * fVar301 + 0.16666666) * fVar301)) *
                         auVar258._8_4_ + fVar130;
                    auVar179._12_4_ =
                         (fVar302 + fVar131 +
                         fVar302 * fVar302 *
                         (fVar231 +
                         ((((fVar302 * 0.00019875691 + 0.0013981999) * fVar302 + 0.008333452) *
                           fVar302 + 0.041665796) * fVar302 + 0.16666666) * fVar302)) *
                         auVar258._12_4_ + fVar131;
                    auVar179._16_4_ =
                         (fVar303 + fVar237 +
                         fVar303 * fVar303 *
                         (fVar232 +
                         ((((fVar303 * 0.00019875691 + 0.0013981999) * fVar303 + 0.008333452) *
                           fVar303 + 0.041665796) * fVar303 + 0.16666666) * fVar303)) *
                         auVar182._0_4_ + fVar237;
                    auVar179._20_4_ =
                         (fVar336 + fVar132 +
                         fVar336 * fVar336 *
                         (fVar233 +
                         ((((fVar336 * 0.00019875691 + 0.0013981999) * fVar336 + 0.008333452) *
                           fVar336 + 0.041665796) * fVar336 + 0.16666666) * fVar336)) *
                         auVar182._4_4_ + fVar132;
                    auVar179._24_4_ =
                         (fVar352 + fVar234 +
                         fVar352 * fVar352 *
                         (fVar235 +
                         ((((fVar352 * 0.00019875691 + 0.0013981999) * fVar352 + 0.008333452) *
                           fVar352 + 0.041665796) * fVar352 + 0.16666666) * fVar352)) *
                         auVar182._8_4_ + fVar234;
                    auVar179._28_4_ =
                         auVar172._28_4_ + auVar94._28_4_ + fVar236 + fVar321 + -0.47508308 +
                         fVar236;
                    auVar253 = vrcpps_avx(auVar179);
                    in_ZMM7 = ZEXT3264(auVar253);
                    fVar85 = auVar253._0_4_;
                    fVar101 = auVar253._4_4_;
                    auVar49._4_4_ = auVar179._4_4_ * fVar101;
                    auVar49._0_4_ = auVar179._0_4_ * fVar85;
                    fVar130 = auVar253._8_4_;
                    auVar49._8_4_ = auVar179._8_4_ * fVar130;
                    fVar131 = auVar253._12_4_;
                    auVar49._12_4_ = auVar179._12_4_ * fVar131;
                    fVar237 = auVar253._16_4_;
                    auVar49._16_4_ = auVar179._16_4_ * fVar237;
                    fVar132 = auVar253._20_4_;
                    auVar49._20_4_ = auVar179._20_4_ * fVar132;
                    fVar234 = auVar253._24_4_;
                    auVar49._24_4_ = auVar179._24_4_ * fVar234;
                    auVar49._28_4_ = auVar179._28_4_;
                    auVar327 = vsubps_avx(auVar327,auVar49);
                    auVar331._0_4_ = fVar85 + fVar85 * auVar327._0_4_;
                    auVar331._4_4_ = fVar101 + fVar101 * auVar327._4_4_;
                    auVar331._8_4_ = fVar130 + fVar130 * auVar327._8_4_;
                    auVar331._12_4_ = fVar131 + fVar131 * auVar327._12_4_;
                    auVar331._16_4_ = fVar237 + fVar237 * auVar327._16_4_;
                    auVar331._20_4_ = fVar132 + fVar132 * auVar327._20_4_;
                    auVar331._24_4_ = fVar234 + fVar234 * auVar327._24_4_;
                    auVar331._28_4_ = auVar253._28_4_ + auVar327._28_4_;
                    break;
                  case 5:
                    auVar253 = vminps_avx(auVar331,auVar313);
                    auVar94 = vmaxps_avx(auVar318,auVar253);
                    auVar295._0_4_ = fVar181 + auVar94._0_4_ * 1.442695;
                    auVar295._4_4_ = fVar229 + auVar94._4_4_ * 1.442695;
                    auVar295._8_4_ = fVar230 + auVar94._8_4_ * 1.442695;
                    auVar295._12_4_ = fVar231 + auVar94._12_4_ * 1.442695;
                    auVar295._16_4_ = fVar232 + auVar94._16_4_ * 1.442695;
                    auVar295._20_4_ = fVar233 + auVar94._20_4_ * 1.442695;
                    auVar295._24_4_ = fVar235 + auVar94._24_4_ * 1.442695;
                    auVar295._28_4_ = fVar321 + in_ZMM7._28_4_;
                    auVar172 = vroundps_avx(auVar295,1);
                    auVar253 = vcmpps_avx(auVar295,auVar172,1);
                    auVar253 = vandps_avx(auVar253,auVar327);
                    auVar253 = vsubps_avx(auVar172,auVar253);
                    auVar45._4_4_ = auVar253._4_4_ * 0.6931472;
                    auVar45._0_4_ = auVar253._0_4_ * 0.6931472;
                    auVar45._8_4_ = auVar253._8_4_ * 0.6931472;
                    auVar45._12_4_ = auVar253._12_4_ * 0.6931472;
                    auVar45._16_4_ = auVar253._16_4_ * 0.6931472;
                    auVar45._20_4_ = auVar253._20_4_ * 0.6931472;
                    auVar45._24_4_ = auVar253._24_4_ * 0.6931472;
                    auVar45._28_4_ = auVar172._28_4_;
                    auVar94 = vsubps_avx(auVar94,auVar45);
                    fVar336 = auVar94._0_4_;
                    fVar352 = auVar94._4_4_;
                    fVar353 = auVar94._8_4_;
                    fVar354 = auVar94._12_4_;
                    fVar355 = auVar94._16_4_;
                    fVar356 = auVar94._20_4_;
                    fVar357 = auVar94._24_4_;
                    auVar194._0_4_ = (int)auVar253._0_4_;
                    auVar194._4_4_ = (int)auVar253._4_4_;
                    auVar194._8_4_ = (int)auVar253._8_4_;
                    auVar194._12_4_ = (int)auVar253._12_4_;
                    auVar224._16_4_ = (int)auVar253._16_4_;
                    auVar224._0_16_ = auVar194;
                    auVar224._20_4_ = (int)auVar253._20_4_;
                    auVar224._24_4_ = (int)auVar253._24_4_;
                    auVar224._28_4_ = (int)auVar253._28_4_;
                    auVar258 = vpslld_avx(auVar194,0x17);
                    auVar182 = vpslld_avx(auVar224._16_16_,0x17);
                    auVar249._8_4_ = 0x3f800000;
                    auVar249._0_8_ = 0x3f8000003f800000;
                    auVar249._12_4_ = 0x3f800000;
                    auVar182 = vpaddd_avx(auVar182,auVar249);
                    auVar258 = vpaddd_avx(auVar258,auVar249);
                    auVar296._0_4_ =
                         (fVar336 + fVar85 +
                         fVar336 * fVar336 *
                         (((((fVar336 * 0.00019875691 + 0.0013981999) * fVar336 + 0.008333452) *
                            fVar336 + 0.041665796) * fVar336 + 0.16666666) * fVar336 + fVar181)) *
                         auVar258._0_4_ + fVar85;
                    auVar296._4_4_ =
                         (fVar352 + fVar101 +
                         fVar352 * fVar352 *
                         (((((fVar352 * 0.00019875691 + 0.0013981999) * fVar352 + 0.008333452) *
                            fVar352 + 0.041665796) * fVar352 + 0.16666666) * fVar352 + fVar229)) *
                         auVar258._4_4_ + fVar101;
                    auVar296._8_4_ =
                         (fVar353 + fVar130 +
                         fVar353 * fVar353 *
                         (((((fVar353 * 0.00019875691 + 0.0013981999) * fVar353 + 0.008333452) *
                            fVar353 + 0.041665796) * fVar353 + 0.16666666) * fVar353 + fVar230)) *
                         auVar258._8_4_ + fVar130;
                    auVar296._12_4_ =
                         (fVar354 + fVar131 +
                         fVar354 * fVar354 *
                         (((((fVar354 * 0.00019875691 + 0.0013981999) * fVar354 + 0.008333452) *
                            fVar354 + 0.041665796) * fVar354 + 0.16666666) * fVar354 + fVar231)) *
                         auVar258._12_4_ + fVar131;
                    auVar296._16_4_ =
                         (fVar355 + fVar237 +
                         fVar355 * fVar355 *
                         (((((fVar355 * 0.00019875691 + 0.0013981999) * fVar355 + 0.008333452) *
                            fVar355 + 0.041665796) * fVar355 + 0.16666666) * fVar355 + fVar232)) *
                         auVar182._0_4_ + fVar237;
                    auVar296._20_4_ =
                         (fVar356 + fVar132 +
                         fVar356 * fVar356 *
                         (((((fVar356 * 0.00019875691 + 0.0013981999) * fVar356 + 0.008333452) *
                            fVar356 + 0.041665796) * fVar356 + 0.16666666) * fVar356 + fVar233)) *
                         auVar182._4_4_ + fVar132;
                    auVar296._24_4_ =
                         (fVar357 + fVar234 +
                         fVar357 * fVar357 *
                         (((((fVar357 * 0.00019875691 + 0.0013981999) * fVar357 + 0.008333452) *
                            fVar357 + 0.041665796) * fVar357 + 0.16666666) * fVar357 + fVar235)) *
                         auVar182._8_4_ + fVar234;
                    auVar296._28_4_ =
                         auVar94._28_4_ + fVar236 +
                         in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 +
                         fVar321 + fVar236;
                    auVar98._8_4_ = 0x800000;
                    auVar98._0_8_ = 0x80000000800000;
                    auVar98._12_4_ = 0x800000;
                    auVar98._16_4_ = 0x800000;
                    auVar98._20_4_ = 0x800000;
                    auVar98._24_4_ = 0x800000;
                    auVar98._28_4_ = 0x800000;
                    auVar172 = vmaxps_avx(auVar296,auVar98);
                    auVar182 = vpsrld_avx(auVar172._16_16_,0x17);
                    auVar99._8_4_ = 0x807fffff;
                    auVar99._0_8_ = 0x807fffff807fffff;
                    auVar99._12_4_ = 0x807fffff;
                    auVar99._16_4_ = 0x807fffff;
                    auVar99._20_4_ = 0x807fffff;
                    auVar99._24_4_ = 0x807fffff;
                    auVar99._28_4_ = 0x807fffff;
                    auVar253 = vandps_avx(auVar172,auVar99);
                    auVar218 = vorps_avx(auVar253,auVar320._0_32_);
                    auVar100._8_4_ = 0x3f3504f3;
                    auVar100._0_8_ = 0x3f3504f33f3504f3;
                    auVar100._12_4_ = 0x3f3504f3;
                    auVar100._16_4_ = 0x3f3504f3;
                    auVar100._20_4_ = 0x3f3504f3;
                    auVar100._24_4_ = 0x3f3504f3;
                    auVar100._28_4_ = 0x3f3504f3;
                    auVar94 = vcmpps_avx(auVar100,auVar218,2);
                    auVar253 = vandnps_avx(auVar94,auVar218);
                    fVar336 = auVar218._0_4_ + -1.0 + auVar253._0_4_;
                    fVar352 = auVar218._4_4_ + -1.0 + auVar253._4_4_;
                    fVar353 = auVar218._8_4_ + -1.0 + auVar253._8_4_;
                    fVar354 = auVar218._12_4_ + -1.0 + auVar253._12_4_;
                    fVar355 = auVar218._16_4_ + -1.0 + auVar253._16_4_;
                    fVar356 = auVar218._20_4_ + -1.0 + auVar253._20_4_;
                    fVar357 = auVar218._24_4_ + -1.0 + auVar253._24_4_;
                    auVar182 = vpsubd_avx(auVar182,auVar94._16_16_);
                    auVar258 = vpsrld_avx(auVar172._0_16_,0x17);
                    auVar90._8_4_ = 0xffffff81;
                    auVar90._0_8_ = 0xffffff81ffffff81;
                    auVar90._12_4_ = 0xffffff81;
                    auVar182 = vpaddd_avx(auVar182,auVar90);
                    auVar258 = vpsubd_avx(auVar258,auVar94._0_16_);
                    auVar258 = vpaddd_avx(auVar258,auVar90);
                    auVar177._16_16_ = auVar182;
                    auVar177._0_16_ = auVar258;
                    auVar254 = ZEXT864(0) << 0x20;
                    auVar94 = vcmpps_avx(auVar296,ZEXT832(0) << 0x20,2);
                    auVar172 = vcvtdq2ps_avx(auVar177);
                    auVar46._4_4_ =
                         (fVar352 + auVar172._4_4_ * 0.6931472 +
                         fVar352 * fVar352 *
                         (fVar352 * (fVar352 * (fVar352 * (fVar352 * (fVar352 * (fVar352 * (fVar352 
                                                  * (fVar352 * (fVar352 * 0.070376836 + -0.1151461)
                                                    + 0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                    0.3333333) + -0.5)) * -2.0;
                    auVar46._0_4_ =
                         (fVar336 + auVar172._0_4_ * 0.6931472 +
                         fVar336 * fVar336 *
                         (fVar336 * (fVar336 * (fVar336 * (fVar336 * (fVar336 * (fVar336 * (fVar336 
                                                  * (fVar336 * (fVar336 * 0.070376836 + -0.1151461)
                                                    + 0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                    0.3333333) + -0.5)) * -2.0;
                    auVar46._8_4_ =
                         (fVar353 + auVar172._8_4_ * 0.6931472 +
                         fVar353 * fVar353 *
                         (fVar353 * (fVar353 * (fVar353 * (fVar353 * (fVar353 * (fVar353 * (fVar353 
                                                  * (fVar353 * (fVar353 * 0.070376836 + -0.1151461)
                                                    + 0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                    0.3333333) + -0.5)) * -2.0;
                    auVar46._12_4_ =
                         (fVar354 + auVar172._12_4_ * 0.6931472 +
                         fVar354 * fVar354 *
                         (fVar354 * (fVar354 * (fVar354 * (fVar354 * (fVar354 * (fVar354 * (fVar354 
                                                  * (fVar354 * (fVar354 * 0.070376836 + -0.1151461)
                                                    + 0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                    0.3333333) + -0.5)) * -2.0;
                    auVar46._16_4_ =
                         (fVar355 + auVar172._16_4_ * 0.6931472 +
                         fVar355 * fVar355 *
                         (fVar355 * (fVar355 * (fVar355 * (fVar355 * (fVar355 * (fVar355 * (fVar355 
                                                  * (fVar355 * (fVar355 * 0.070376836 + -0.1151461)
                                                    + 0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                    0.3333333) + -0.5)) * -2.0;
                    auVar46._20_4_ =
                         (fVar356 + auVar172._20_4_ * 0.6931472 +
                         fVar356 * fVar356 *
                         (fVar356 * (fVar356 * (fVar356 * (fVar356 * (fVar356 * (fVar356 * (fVar356 
                                                  * (fVar356 * (fVar356 * 0.070376836 + -0.1151461)
                                                    + 0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                    0.3333333) + -0.5)) * -2.0;
                    auVar46._24_4_ =
                         (fVar357 + auVar172._24_4_ * 0.6931472 +
                         fVar357 * fVar357 *
                         (fVar357 * (fVar357 * (fVar357 * (fVar357 * (fVar357 * (fVar357 * (fVar357 
                                                  * (fVar357 * (fVar357 * 0.070376836 + -0.1151461)
                                                    + 0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                    0.3333333) + -0.5)) * -2.0;
                    auVar46._28_4_ =
                         auVar218._28_4_ + -1.0 + auVar253._28_4_ + auVar172._28_4_ + 0.0;
                    auVar225._8_4_ = 0x7fffffff;
                    auVar225._0_8_ = 0x7fffffff7fffffff;
                    auVar225._12_4_ = 0x7fffffff;
                    auVar225._16_4_ = 0x7fffffff;
                    auVar225._20_4_ = 0x7fffffff;
                    auVar225._24_4_ = 0x7fffffff;
                    auVar225._28_4_ = 0x7fffffff;
                    auVar253 = vblendvps_avx(auVar46,auVar225,auVar94);
                    auVar253 = vminps_avx(auVar313,auVar253);
                    auVar94 = vmaxps_avx(auVar318,auVar253);
                    auVar226._0_4_ = auVar94._0_4_ * 1.442695 + fVar181;
                    auVar226._4_4_ = auVar94._4_4_ * 1.442695 + fVar229;
                    auVar226._8_4_ = auVar94._8_4_ * 1.442695 + fVar230;
                    auVar226._12_4_ = auVar94._12_4_ * 1.442695 + fVar231;
                    auVar226._16_4_ = auVar94._16_4_ * 1.442695 + fVar232;
                    auVar226._20_4_ = auVar94._20_4_ * 1.442695 + fVar233;
                    auVar226._24_4_ = auVar94._24_4_ * 1.442695 + fVar235;
                    auVar226._28_4_ = fVar321 + NAN;
                    auVar172 = vroundps_avx(auVar226,1);
                    auVar253 = vcmpps_avx(auVar226,auVar172,1);
                    auVar253 = vandps_avx(auVar253,auVar327);
                    auVar253 = vsubps_avx(auVar172,auVar253);
                    auVar47._4_4_ = auVar253._4_4_ * 0.6931472;
                    auVar47._0_4_ = auVar253._0_4_ * 0.6931472;
                    auVar47._8_4_ = auVar253._8_4_ * 0.6931472;
                    auVar47._12_4_ = auVar253._12_4_ * 0.6931472;
                    auVar47._16_4_ = auVar253._16_4_ * 0.6931472;
                    auVar47._20_4_ = auVar253._20_4_ * 0.6931472;
                    auVar47._24_4_ = auVar253._24_4_ * 0.6931472;
                    auVar47._28_4_ = auVar172._28_4_;
                    auVar94 = vsubps_avx(auVar94,auVar47);
                    fVar336 = auVar94._0_4_;
                    fVar352 = auVar94._4_4_;
                    fVar353 = auVar94._8_4_;
                    fVar354 = auVar94._12_4_;
                    fVar355 = auVar94._16_4_;
                    fVar356 = auVar94._20_4_;
                    fVar357 = auVar94._24_4_;
                    auVar319 = ZEXT3264(auVar327);
                    auVar320 = ZEXT3264(auVar320._0_32_);
                    fVar181 = fVar181 + ((((fVar336 * 0.00019875691 + 0.0013981999) * fVar336 +
                                          0.008333452) * fVar336 + 0.041665796) * fVar336 +
                                        0.16666666) * fVar336;
                    fVar229 = fVar229 + ((((fVar352 * 0.00019875691 + 0.0013981999) * fVar352 +
                                          0.008333452) * fVar352 + 0.041665796) * fVar352 +
                                        0.16666666) * fVar352;
                    fVar230 = fVar230 + ((((fVar353 * 0.00019875691 + 0.0013981999) * fVar353 +
                                          0.008333452) * fVar353 + 0.041665796) * fVar353 +
                                        0.16666666) * fVar353;
                    fVar231 = fVar231 + ((((fVar354 * 0.00019875691 + 0.0013981999) * fVar354 +
                                          0.008333452) * fVar354 + 0.041665796) * fVar354 +
                                        0.16666666) * fVar354;
                    fVar232 = fVar232 + ((((fVar355 * 0.00019875691 + 0.0013981999) * fVar355 +
                                          0.008333452) * fVar355 + 0.041665796) * fVar355 +
                                        0.16666666) * fVar355;
                    fVar233 = fVar233 + ((((fVar356 * 0.00019875691 + 0.0013981999) * fVar356 +
                                          0.008333452) * fVar356 + 0.041665796) * fVar356 +
                                        0.16666666) * fVar356;
                    fVar235 = fVar235 + ((((fVar357 * 0.00019875691 + 0.0013981999) * fVar357 +
                                          0.008333452) * fVar357 + 0.041665796) * fVar357 +
                                        0.16666666) * fVar357;
                    in_ZMM7 = ZEXT3264(CONCAT428(fVar321 + auVar296._28_4_ + 0.0013981999 +
                                                           0.008333452 + 0.041665796 + 0.16666666,
                                                 CONCAT424(fVar235,CONCAT420(fVar233,CONCAT416(
                                                  fVar232,CONCAT412(fVar231,CONCAT48(fVar230,
                                                  CONCAT44(fVar229,fVar181))))))));
                    auVar195._0_4_ = (int)auVar253._0_4_;
                    auVar195._4_4_ = (int)auVar253._4_4_;
                    auVar195._8_4_ = (int)auVar253._8_4_;
                    auVar195._12_4_ = (int)auVar253._12_4_;
                    auVar227._16_4_ = (int)auVar253._16_4_;
                    auVar227._0_16_ = auVar195;
                    auVar227._20_4_ = (int)auVar253._20_4_;
                    auVar227._24_4_ = (int)auVar253._24_4_;
                    auVar227._28_4_ = (int)auVar253._28_4_;
                    auVar258 = vpslld_avx(auVar195,0x17);
                    auVar182 = vpslld_avx(auVar227._16_16_,0x17);
                    auVar108._8_4_ = 0x3f800000;
                    auVar108._0_8_ = 0x3f8000003f800000;
                    auVar108._12_4_ = 0x3f800000;
                    auVar182 = vpaddd_avx(auVar182,auVar108);
                    auVar258 = vpaddd_avx(auVar258,auVar108);
                    auVar178._0_4_ =
                         (fVar336 + fVar85 + fVar336 * fVar336 * fVar181) * auVar258._0_4_ + fVar85;
                    auVar178._4_4_ =
                         (fVar352 + fVar101 + fVar352 * fVar352 * fVar229) * auVar258._4_4_ +
                         fVar101;
                    auVar178._8_4_ =
                         (fVar353 + fVar130 + fVar353 * fVar353 * fVar230) * auVar258._8_4_ +
                         fVar130;
                    auVar178._12_4_ =
                         (fVar354 + fVar131 + fVar354 * fVar354 * fVar231) * auVar258._12_4_ +
                         fVar131;
                    auVar178._16_4_ =
                         (fVar355 + fVar237 + fVar355 * fVar355 * fVar232) * auVar182._0_4_ +
                         fVar237;
                    auVar178._20_4_ =
                         (fVar356 + fVar132 + fVar356 * fVar356 * fVar233) * auVar182._4_4_ +
                         fVar132;
                    auVar178._24_4_ =
                         (fVar357 + fVar234 + fVar357 * fVar357 * fVar235) * auVar182._8_4_ +
                         fVar234;
                    auVar178._28_4_ = auVar94._28_4_ + fVar236 + auVar172._28_4_ + fVar236;
                    auVar327 = vrcpps_avx(auVar178);
                    fVar85 = auVar327._0_4_;
                    fVar101 = auVar327._4_4_;
                    fVar130 = auVar327._8_4_;
                    fVar131 = auVar327._12_4_;
                    fVar237 = auVar327._16_4_;
                    fVar132 = auVar327._20_4_;
                    fVar234 = auVar327._24_4_;
                    auVar48._4_4_ = auVar178._4_4_ * (fVar101 + fVar101);
                    auVar48._0_4_ = auVar178._0_4_ * (fVar85 + fVar85);
                    auVar48._8_4_ = auVar178._8_4_ * (fVar130 + fVar130);
                    auVar48._12_4_ = auVar178._12_4_ * (fVar131 + fVar131);
                    auVar48._16_4_ = auVar178._16_4_ * (fVar237 + fVar237);
                    auVar48._20_4_ = auVar178._20_4_ * (fVar132 + fVar132);
                    auVar48._24_4_ = auVar178._24_4_ * (fVar234 + fVar234);
                    auVar48._28_4_ = auVar178._28_4_;
                    auVar127._8_4_ = 0x40000000;
                    auVar127._0_8_ = 0x4000000040000000;
                    auVar127._12_4_ = 0x40000000;
                    auVar127._16_4_ = 0x40000000;
                    auVar127._20_4_ = 0x40000000;
                    auVar127._24_4_ = 0x40000000;
                    auVar127._28_4_ = 0x40000000;
                    auVar253 = vsubps_avx(auVar127,auVar48);
                    auVar228._0_4_ = fVar85 + fVar85 + -1.0;
                    auVar228._4_4_ = fVar101 + fVar101 + -1.0;
                    auVar228._8_4_ = fVar130 + fVar130 + -1.0;
                    auVar228._12_4_ = fVar131 + fVar131 + -1.0;
                    auVar228._16_4_ = fVar237 + fVar237 + -1.0;
                    auVar228._20_4_ = fVar132 + fVar132 + -1.0;
                    auVar228._24_4_ = fVar234 + fVar234 + -1.0;
                    auVar228._28_4_ = auVar327._28_4_ + auVar327._28_4_ + -1.0;
                    auVar165._0_4_ = auVar228._0_4_ + fVar85 * auVar253._0_4_;
                    auVar165._4_4_ = auVar228._4_4_ + fVar101 * auVar253._4_4_;
                    auVar165._8_4_ = auVar228._8_4_ + fVar130 * auVar253._8_4_;
                    auVar165._12_4_ = auVar228._12_4_ + fVar131 * auVar253._12_4_;
                    auVar165._16_4_ = auVar228._16_4_ + fVar237 * auVar253._16_4_;
                    auVar165._20_4_ = auVar228._20_4_ + fVar132 * auVar253._20_4_;
                    auVar165._24_4_ = auVar228._24_4_ + fVar234 * auVar253._24_4_;
                    goto LAB_00297a74;
                  case 6:
                    fVar85 = **(float **)(&this->field_0x118 + (long)p_Var25);
                    fVar101 = (*(float **)(&this->field_0x118 + (long)p_Var25))[1];
                    auVar228._4_4_ = fVar101;
                    auVar228._0_4_ = fVar101;
                    auVar228._8_4_ = fVar101;
                    auVar228._12_4_ = fVar101;
                    auVar228._16_4_ = fVar101;
                    auVar228._20_4_ = fVar101;
                    auVar228._24_4_ = fVar101;
                    auVar228._28_4_ = fVar101;
                    auVar180._0_4_ = auVar332._0_4_ * fVar85 + fVar101;
                    auVar180._4_4_ = auVar332._4_4_ * fVar85 + fVar101;
                    auVar180._8_4_ = fVar255 * fVar85 + fVar101;
                    auVar180._12_4_ = fVar300 * fVar85 + fVar101;
                    auVar180._16_4_ = fVar301 * fVar85 + fVar101;
                    auVar180._20_4_ = fVar302 * fVar85 + fVar101;
                    auVar180._24_4_ = fVar303 * fVar85 + fVar101;
                    auVar180._28_4_ = fVar85 + fVar101;
                    auVar253 = vmaxps_avx(auVar180,auVar254._0_32_);
                    auVar327 = vminps_avx(auVar253,auVar327);
                    auVar165 = auVar327._0_28_;
LAB_00297a74:
                    in_ZMM3 = ZEXT3264(auVar228);
                    auVar335._0_4_ = auVar332._0_4_ * auVar165._0_4_;
                    auVar335._4_4_ = auVar332._4_4_ * auVar165._4_4_;
                    auVar335._8_4_ = fVar255 * auVar165._8_4_;
                    auVar335._12_4_ = fVar300 * auVar165._12_4_;
                    auVar335._16_4_ = fVar301 * auVar165._16_4_;
                    auVar335._20_4_ = fVar302 * auVar165._20_4_;
                    auVar335._24_4_ = fVar303 * auVar165._24_4_;
                    auVar331 = auVar335._0_32_;
                  }
                  *(undefined1 (*) [32])pAVar71 = auVar331;
                  pAVar71 = pAVar71 + 4;
                  uVar78 = uVar78 + 1;
                  iVar57 = iVar57 + 1;
                } while (uVar78 != local_1a8.w);
              }
              iVar65 = iVar65 + 1;
            } while (iVar65 != local_1a8.h);
          }
          local_270 = local_270 + 1;
        } while (local_270 != local_1a8.c);
      }
      if ((((int)local_160 == 8) && (uVar77 == 1)) && (local_120 = (long)local_1a8.c, 0 < local_120)
         ) {
        p_Var25 = local_148[-3];
        iVar19 = *(int *)(&this->field_0xdc + (long)p_Var25);
        iVar20 = *(int *)(&this->field_0xe0 + (long)p_Var25);
        iVar62 = *(int *)(&this->field_0xe4 + (long)p_Var25);
        iVar64 = *(int *)(&this->field_0xe8 + (long)p_Var25);
        uVar23 = *(undefined4 *)(&this->field_0x114 + (long)p_Var25);
        lVar80 = *(long *)(&this->field_0x1a8 + (long)p_Var25);
        uVar21 = *(uint *)(&this->field_0xd4 + (long)p_Var25);
        uVar22 = *(uint *)(&this->field_0xd8 + (long)p_Var25);
        local_130 = CONCAT44(local_1a8.elemsize._4_4_,(int)local_1a8.elemsize) * local_1a8.cstep;
        local_138 = (Allocator *)local_1a8.data;
        iVar73 = bottom_blob->w;
        iVar79 = bottom_blob->h;
        uVar24 = bottom_blob->c;
        local_270 = 0;
        do {
          if (0 < iVar61) {
            sVar30 = (this->weight_data_tm).cstep;
            sVar31 = (this->weight_data_tm).elemsize;
            local_228 = (Allocator *)((long)&local_138->_vptr_Allocator + local_130 * local_270);
            pvVar84 = (this->weight_data_tm).data;
            iVar65 = 0;
            do {
              if (0 < iVar82) {
                iVar53 = bottom_blob->w;
                pvVar29 = bottom_blob->data;
                sVar32 = bottom_blob->elemsize;
                sVar33 = bottom_blob->cstep;
                pfVar66 = *(float **)(&this->field_0x118 + (long)p_Var25);
                uVar78 = 0;
                iVar57 = (1 - uVar21) * iVar19;
                do {
                  if (lVar80 == 0) {
                    fVar85 = 0.0;
                  }
                  else {
                    fVar85 = *(float *)(lVar80 + local_270 * 4);
                  }
                  if ((int)uVar24 < 1) {
                    fVar101 = 0.0;
                    fVar130 = 0.0;
                    fVar131 = 0.0;
                    fVar237 = 0.0;
                    fVar132 = 0.0;
                    fVar234 = 0.0;
                    fVar236 = 0.0;
                    fVar181 = 0.0;
                  }
                  else {
                    fVar101 = 0.0;
                    fVar130 = 0.0;
                    fVar131 = 0.0;
                    fVar237 = 0.0;
                    fVar132 = 0.0;
                    fVar234 = 0.0;
                    fVar236 = 0.0;
                    fVar181 = 0.0;
                    uVar63 = 0;
                    pvVar72 = (void *)(sVar30 * local_270 * sVar31 + (long)pvVar84);
                    do {
                      if (0 < (int)uVar22) {
                        uVar83 = 0;
                        uVar81 = 0;
                        do {
                          iVar54 = (((int)uVar81 - uVar22) + 1) * iVar20 + iVar65;
                          if (((-1 < iVar54) && (iVar55 = iVar54 / iVar64, iVar54 % iVar64 == 0)) &&
                             ((0 < (int)uVar21 && (iVar55 < iVar79)))) {
                            uVar75 = (ulong)uVar21;
                            uVar68 = uVar83;
                            iVar54 = iVar57;
                            do {
                              if (((-1 < iVar54) && (iVar56 = iVar54 / iVar62, iVar54 % iVar62 == 0)
                                  ) && (iVar56 < iVar73)) {
                                pfVar67 = (float *)((long)pvVar72 + (uVar68 & 0xffffffff) * 4);
                                pfVar1 = (float *)((long)pvVar29 +
                                                  (long)(iVar56 << 3) * 4 +
                                                  (long)iVar55 * (long)iVar53 * sVar32 +
                                                  sVar33 * sVar32 * uVar63);
                                fVar101 = *pfVar67 * *pfVar1 + fVar101;
                                fVar130 = pfVar67[1] * pfVar1[1] + fVar130;
                                fVar131 = pfVar67[2] * pfVar1[2] + fVar131;
                                fVar237 = pfVar67[3] * pfVar1[3] + fVar237;
                                fVar132 = pfVar67[4] * pfVar1[4] + fVar132;
                                fVar234 = pfVar67[5] * pfVar1[5] + fVar234;
                                fVar236 = pfVar67[6] * pfVar1[6] + fVar236;
                                fVar181 = pfVar67[7] + fVar181;
                              }
                              uVar68 = uVar68 + 8;
                              iVar54 = iVar54 + iVar19;
                              uVar75 = uVar75 - 1;
                            } while (uVar75 != 0);
                          }
                          uVar81 = uVar81 + 1;
                          uVar83 = uVar83 + (ulong)uVar21 * 8;
                        } while (uVar81 != uVar22);
                      }
                      pvVar72 = (void *)((long)pvVar72 + (long)(int)(uVar21 * uVar22 * 8) * 4);
                      uVar63 = uVar63 + 1;
                    } while (uVar63 != uVar24);
                  }
                  auVar110._0_4_ = fVar132 + fVar101;
                  auVar110._4_4_ = fVar234 + fVar130;
                  auVar110._8_4_ = fVar236 + fVar131;
                  auVar110._12_4_ = fVar181 + fVar237;
                  auVar182 = vshufpd_avx(auVar110,auVar110,1);
                  auVar111._0_4_ = auVar182._0_4_ + auVar110._0_4_;
                  auVar111._4_4_ = auVar182._4_4_ + auVar110._4_4_;
                  auVar111._8_4_ = auVar182._8_4_ + auVar110._8_4_;
                  auVar111._12_4_ = auVar182._12_4_ + auVar110._12_4_;
                  auVar182 = vmovshdup_avx(auVar111);
                  fVar85 = auVar182._0_4_ + fVar85 + auVar111._0_4_;
                  auVar182 = ZEXT416((uint)fVar85);
                  fVar101 = fVar85;
                  switch(uVar23) {
                  case 1:
                    auVar182 = vmaxss_avx(ZEXT416((uint)fVar85),ZEXT416(0));
                    fVar101 = auVar182._0_4_;
                    break;
                  case 2:
                    auVar91._0_12_ = ZEXT812(0);
                    auVar91._12_4_ = 0;
                    auVar182 = vcmpss_avx(auVar91,auVar182,1);
                    auVar142._8_4_ = 0x3f800000;
                    auVar142._0_8_ = 0x3f8000003f800000;
                    auVar142._12_4_ = 0x3f800000;
                    auVar182 = vblendvps_avx(ZEXT416((uint)*pfVar66),auVar142,auVar182);
                    fVar101 = auVar182._0_4_;
LAB_00297f01:
                    fVar101 = fVar101 * fVar85;
                    break;
                  case 3:
                    auVar182 = vmaxss_avx(auVar182,ZEXT416((uint)*pfVar66));
                    fVar101 = auVar182._0_4_;
                    if (pfVar66[1] < auVar182._0_4_) {
                      fVar101 = pfVar66[1];
                    }
                    break;
                  case 4:
                    auVar182 = vminss_avx(auVar182,ZEXT416(0x42b0c0a5));
                    auVar112._0_8_ = auVar182._0_8_ ^ 0x8000000080000000;
                    auVar112._8_4_ = auVar182._8_4_ ^ 0x80000000;
                    auVar112._12_4_ = auVar182._12_4_ ^ 0x80000000;
                    auVar182 = vcmpss_avx(auVar182,ZEXT416(0xc2b0c0a5),1);
                    auVar141._8_4_ = 0x42b0c0a5;
                    auVar141._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar141._12_4_ = 0x42b0c0a5;
                    auVar182 = vblendvps_avx(auVar112,auVar141,auVar182);
                    fVar85 = expf(auVar182._0_4_);
                    fVar101 = 1.0 / (fVar85 + 1.0);
                    break;
                  case 5:
                    fVar101 = expf(fVar85);
                    fVar101 = logf(fVar101 + 1.0);
                    fVar101 = tanhf(fVar101);
                    fVar101 = fVar101 * fVar85;
                    break;
                  case 6:
                    fVar130 = *pfVar66;
                    fVar131 = -pfVar66[1] / fVar130;
                    fVar101 = 0.0;
                    if ((fVar131 <= fVar85) && (fVar101 = fVar85, fVar85 <= fVar131 + 1.0 / fVar130)
                       ) {
                      fVar101 = fVar130 * fVar85 + pfVar66[1];
                      goto LAB_00297f01;
                    }
                  }
                  *(float *)&local_228->_vptr_Allocator = fVar101;
                  local_228 = (Allocator *)((long)&local_228->_vptr_Allocator + 4);
                  uVar78 = uVar78 + 1;
                  iVar57 = iVar57 + 1;
                } while (uVar78 != iVar82);
              }
              iVar65 = iVar65 + 1;
            } while (iVar65 != iVar61);
          }
          local_270 = local_270 + 1;
        } while (local_270 != local_120);
      }
      iVar20 = local_1a8.h;
      iVar19 = local_1a8.w;
      if ((((int)local_160 == 4) && (uVar77 == 4)) && (0 < (long)local_1a8.c)) {
        p_Var25 = local_148[-3];
        iVar82 = *(int *)(&this->field_0xdc + (long)p_Var25);
        iVar61 = *(int *)(&this->field_0xe0 + (long)p_Var25);
        iVar62 = *(int *)(&this->field_0xe4 + (long)p_Var25);
        iVar64 = *(int *)(&this->field_0xe8 + (long)p_Var25);
        uVar23 = *(undefined4 *)(&this->field_0x114 + (long)p_Var25);
        lVar80 = *(long *)(&this->field_0x1a8 + (long)p_Var25);
        uVar21 = *(uint *)(&this->field_0xd4 + (long)p_Var25);
        uVar22 = *(uint *)(&this->field_0xd8 + (long)p_Var25);
        local_270 = 0;
        auVar250._8_4_ = 0x3f000000;
        auVar250._0_8_ = 0x3f0000003f000000;
        auVar250._12_4_ = 0x3f000000;
        auVar254 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        do {
          if (0 < local_1a8.h) {
            iVar73 = bottom_blob->w;
            iVar79 = bottom_blob->h;
            pAVar71 = (Allocator *)
                      ((long)(_func_int ***)local_1a8.data +
                      local_1a8.cstep * local_270 *
                      CONCAT44(local_1a8.elemsize._4_4_,(int)local_1a8.elemsize));
            uVar24 = bottom_blob->c;
            iVar65 = 0;
            do {
              if (0 < local_1a8.w) {
                uVar78 = 0;
                iVar57 = (1 - uVar21) * iVar82;
                do {
                  if (lVar80 == 0) {
                    auVar113 = ZEXT816(0) << 0x40;
                  }
                  else {
                    auVar113 = *(undefined1 (*) [16])(lVar80 + local_270 * 0x10);
                  }
                  auVar319 = ZEXT1664(auVar113);
                  if (0 < (int)uVar24) {
                    pvVar84 = (void *)((this->weight_data_tm).cstep * local_270 *
                                       (this->weight_data_tm).elemsize +
                                      (long)(this->weight_data_tm).data);
                    pvVar29 = bottom_blob->data;
                    uVar63 = 0;
                    do {
                      if (0 < (int)uVar22) {
                        uVar83 = 0;
                        uVar81 = 0;
                        do {
                          iVar53 = (((int)uVar81 - uVar22) + 1) * iVar61 + iVar65;
                          if (((-1 < iVar53) && (iVar54 = iVar53 / iVar64, iVar53 % iVar64 == 0)) &&
                             ((0 < (int)uVar21 && (iVar54 < iVar79)))) {
                            lVar74 = (long)iVar54 * (long)bottom_blob->w * bottom_blob->elemsize +
                                     bottom_blob->cstep * bottom_blob->elemsize * uVar63;
                            uVar75 = uVar83;
                            uVar68 = (ulong)uVar21;
                            iVar53 = iVar57;
                            do {
                              if (((-1 < iVar53) && (iVar54 = iVar53 / iVar62, iVar53 % iVar62 == 0)
                                  ) && (iVar54 < iVar73)) {
                                lVar59 = (long)(iVar54 << 2);
                                fVar85 = *(float *)((long)pvVar29 + lVar59 * 4 + lVar74);
                                fVar101 = *(float *)((long)pvVar29 + lVar59 * 4 + lVar74 + 4);
                                fVar130 = *(float *)((long)pvVar29 + lVar59 * 4 + lVar74 + 8);
                                fVar131 = *(float *)((long)pvVar29 + lVar59 * 4 + lVar74 + 0xc);
                                uVar60 = uVar75 & 0xffffffff;
                                pfVar66 = (float *)((long)pvVar84 + uVar60 * 4);
                                pfVar67 = (float *)((long)pvVar84 + uVar60 * 4 + 0x10);
                                pfVar1 = (float *)((long)pvVar84 + uVar60 * 4 + 0x20);
                                pfVar2 = (float *)((long)pvVar84 + uVar60 * 4 + 0x30);
                                auVar319 = ZEXT1664(CONCAT412(fVar85 * pfVar66[3] + auVar319._12_4_
                                                              + fVar101 * pfVar67[3] +
                                                                fVar130 * pfVar1[3] +
                                                              fVar131 * pfVar2[3],
                                                              CONCAT48(fVar85 * pfVar66[2] +
                                                                       auVar319._8_4_ +
                                                                       fVar101 * pfVar67[2] +
                                                                       fVar130 * pfVar1[2] +
                                                                       fVar131 * pfVar2[2],
                                                                       CONCAT44(fVar85 * pfVar66[1]
                                                                                + auVar319._4_4_ +
                                                                                fVar101 * pfVar67[1]
                                                                                + fVar130 * pfVar1[1
                                                  ] + fVar131 * pfVar2[1],
                                                  fVar85 * *pfVar66 + auVar319._0_4_ +
                                                  fVar101 * *pfVar67 + fVar130 * *pfVar1 +
                                                  fVar131 * *pfVar2))));
                              }
                              uVar75 = uVar75 + 0x10;
                              iVar53 = iVar53 + iVar82;
                              uVar68 = uVar68 - 1;
                            } while (uVar68 != 0);
                          }
                          uVar81 = uVar81 + 1;
                          uVar83 = uVar83 + (ulong)uVar21 * 0x10;
                        } while (uVar81 != uVar22);
                      }
                      auVar113 = auVar319._0_16_;
                      pvVar84 = (void *)((long)pvVar84 + (long)(int)(uVar21 * uVar22 * 0x10) * 4);
                      uVar63 = uVar63 + 1;
                    } while (uVar63 != uVar24);
                  }
                  auVar182 = auVar254._0_16_;
                  fVar85 = auVar254._0_4_;
                  fVar101 = auVar254._4_4_;
                  fVar130 = auVar254._8_4_;
                  fVar131 = auVar254._12_4_;
                  fVar237 = auVar113._4_4_;
                  fVar132 = auVar113._8_4_;
                  fVar234 = auVar113._12_4_;
                  switch(uVar23) {
                  case 1:
                    auVar113 = vmaxps_avx(auVar113,_DAT_005930d0);
                    break;
                  case 2:
                    auVar182 = vmaxps_avx(auVar113,ZEXT816(0) << 0x40);
                    auVar258 = vminps_avx(auVar113,ZEXT816(0) << 0x40);
                    fVar85 = **(float **)(&this->field_0x118 + (long)p_Var25);
                    auVar113._0_4_ = fVar85 * auVar258._0_4_ + auVar182._0_4_;
                    auVar113._4_4_ = fVar85 * auVar258._4_4_ + auVar182._4_4_;
                    auVar113._8_4_ = fVar85 * auVar258._8_4_ + auVar182._8_4_;
                    auVar113._12_4_ = fVar85 * auVar258._12_4_ + auVar182._12_4_;
                    break;
                  case 3:
                    uVar7 = **(undefined4 **)(&this->field_0x118 + (long)p_Var25);
                    auVar273._4_4_ = uVar7;
                    auVar273._0_4_ = uVar7;
                    auVar273._8_4_ = uVar7;
                    auVar273._12_4_ = uVar7;
                    uVar7 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var25))[1];
                    auVar343._4_4_ = uVar7;
                    auVar343._0_4_ = uVar7;
                    auVar343._8_4_ = uVar7;
                    auVar343._12_4_ = uVar7;
                    auVar182 = vmaxps_avx(auVar113,auVar273);
                    auVar113 = vminps_avx(auVar343,auVar182);
                    break;
                  case 4:
                    auVar114._0_8_ = auVar113._0_8_ ^ 0x8000000080000000;
                    auVar114._8_4_ = -fVar132;
                    auVar114._12_4_ = -fVar234;
                    auVar148._8_4_ = 0x42b0c0a5;
                    auVar148._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar148._12_4_ = 0x42b0c0a5;
                    auVar258 = vminps_avx(auVar114,auVar148);
                    auVar149._8_4_ = 0xc2b0c0a5;
                    auVar149._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar149._12_4_ = 0xc2b0c0a5;
                    auVar305 = vmaxps_avx(auVar258,auVar149);
                    auVar274._0_4_ = auVar305._0_4_ * 1.442695 + 0.5;
                    auVar274._4_4_ = auVar305._4_4_ * 1.442695 + 0.5;
                    auVar274._8_4_ = auVar305._8_4_ * 1.442695 + 0.5;
                    auVar274._12_4_ = auVar305._12_4_ * 1.442695 + 0.5;
                    auVar344._0_4_ = (int)auVar274._0_4_;
                    auVar344._4_4_ = (int)auVar274._4_4_;
                    auVar344._8_4_ = (int)auVar274._8_4_;
                    auVar344._12_4_ = (int)auVar274._12_4_;
                    auVar323 = vcvtdq2ps_avx(auVar344);
                    auVar258 = vcmpps_avx(auVar274,auVar323,1);
                    auVar258 = vandps_avx(auVar258,auVar182);
                    auVar258 = vsubps_avx(auVar323,auVar258);
                    fVar237 = auVar258._0_4_ * -0.6931472 + auVar305._0_4_;
                    fVar132 = auVar258._4_4_ * -0.6931472 + auVar305._4_4_;
                    fVar234 = auVar258._8_4_ * -0.6931472 + auVar305._8_4_;
                    fVar236 = auVar258._12_4_ * -0.6931472 + auVar305._12_4_;
                    auVar275._0_4_ = (int)auVar258._0_4_;
                    auVar275._4_4_ = (int)auVar258._4_4_;
                    auVar275._8_4_ = (int)auVar258._8_4_;
                    auVar275._12_4_ = (int)auVar258._12_4_;
                    auVar258 = vpslld_avx(auVar275,0x17);
                    auVar258 = vpaddd_avx(auVar258,auVar182);
                    auVar115._0_4_ =
                         (fVar237 * fVar237 *
                          (((((fVar237 * 0.00019875691 + 0.0013981999) * fVar237 + 0.008333452) *
                             fVar237 + 0.041665796) * fVar237 + 0.16666666) * fVar237 + 0.5) +
                         fVar237 + fVar85) * auVar258._0_4_ + fVar85;
                    auVar115._4_4_ =
                         (fVar132 * fVar132 *
                          (((((fVar132 * 0.00019875691 + 0.0013981999) * fVar132 + 0.008333452) *
                             fVar132 + 0.041665796) * fVar132 + 0.16666666) * fVar132 + 0.5) +
                         fVar132 + fVar101) * auVar258._4_4_ + fVar101;
                    auVar115._8_4_ =
                         (fVar234 * fVar234 *
                          (((((fVar234 * 0.00019875691 + 0.0013981999) * fVar234 + 0.008333452) *
                             fVar234 + 0.041665796) * fVar234 + 0.16666666) * fVar234 + 0.5) +
                         fVar234 + fVar130) * auVar258._8_4_ + fVar130;
                    auVar115._12_4_ =
                         (fVar236 * fVar236 *
                          (((((fVar236 * 0.00019875691 + 0.0013981999) * fVar236 + 0.008333452) *
                             fVar236 + 0.041665796) * fVar236 + 0.16666666) * fVar236 + 0.5) +
                         fVar236 + fVar131) * auVar258._12_4_ + fVar131;
                    auVar258 = vrcpps_avx(auVar115);
                    fVar85 = auVar258._0_4_;
                    auVar116._0_4_ = auVar115._0_4_ * fVar85;
                    fVar101 = auVar258._4_4_;
                    auVar116._4_4_ = auVar115._4_4_ * fVar101;
                    fVar130 = auVar258._8_4_;
                    auVar116._8_4_ = auVar115._8_4_ * fVar130;
                    fVar131 = auVar258._12_4_;
                    auVar116._12_4_ = auVar115._12_4_ * fVar131;
                    auVar182 = vsubps_avx(auVar182,auVar116);
                    auVar113._0_4_ = fVar85 + fVar85 * auVar182._0_4_;
                    auVar113._4_4_ = fVar101 + fVar101 * auVar182._4_4_;
                    auVar113._8_4_ = fVar130 + fVar130 * auVar182._8_4_;
                    auVar113._12_4_ = fVar131 + fVar131 * auVar182._12_4_;
                    break;
                  case 5:
                    auVar241._8_4_ = 0x42b0c0a5;
                    auVar241._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar241._12_4_ = 0x42b0c0a5;
                    auVar258 = vminps_avx(auVar113,auVar241);
                    auVar307._8_4_ = 0xc2b0c0a5;
                    auVar307._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar307._12_4_ = 0xc2b0c0a5;
                    auVar305 = vmaxps_avx(auVar307,auVar258);
                    auVar324._0_4_ = auVar305._0_4_ * 1.442695 + 0.5;
                    auVar324._4_4_ = auVar305._4_4_ * 1.442695 + 0.5;
                    auVar324._8_4_ = auVar305._8_4_ * 1.442695 + 0.5;
                    auVar324._12_4_ = auVar305._12_4_ * 1.442695 + 0.5;
                    auVar341._0_4_ = (int)auVar324._0_4_;
                    auVar341._4_4_ = (int)auVar324._4_4_;
                    auVar341._8_4_ = (int)auVar324._8_4_;
                    auVar341._12_4_ = (int)auVar324._12_4_;
                    auVar323 = vcvtdq2ps_avx(auVar341);
                    auVar258 = vcmpps_avx(auVar324,auVar323,1);
                    auVar258 = vandps_avx(auVar258,auVar182);
                    auVar258 = vsubps_avx(auVar323,auVar258);
                    auVar342._0_4_ = auVar258._0_4_ * 0.6931472;
                    auVar342._4_4_ = auVar258._4_4_ * 0.6931472;
                    auVar342._8_4_ = auVar258._8_4_ * 0.6931472;
                    auVar342._12_4_ = auVar258._12_4_ * 0.6931472;
                    auVar323 = vsubps_avx(auVar305,auVar342);
                    fVar236 = auVar323._0_4_;
                    fVar181 = auVar323._4_4_;
                    fVar229 = auVar323._8_4_;
                    fVar230 = auVar323._12_4_;
                    auVar269._0_4_ = (int)auVar258._0_4_;
                    auVar269._4_4_ = (int)auVar258._4_4_;
                    auVar269._8_4_ = (int)auVar258._8_4_;
                    auVar269._12_4_ = (int)auVar258._12_4_;
                    auVar258 = vpslld_avx(auVar269,0x17);
                    auVar258 = vpaddd_avx(auVar258,auVar182);
                    auVar270._0_4_ =
                         (fVar236 + fVar85 +
                         fVar236 * fVar236 *
                         (((((fVar236 * 0.00019875691 + 0.0013981999) * fVar236 + 0.008333452) *
                            fVar236 + 0.041665796) * fVar236 + 0.16666666) * fVar236 + 0.5)) *
                         auVar258._0_4_ + fVar85;
                    auVar270._4_4_ =
                         (fVar181 + fVar101 +
                         fVar181 * fVar181 *
                         (((((fVar181 * 0.00019875691 + 0.0013981999) * fVar181 + 0.008333452) *
                            fVar181 + 0.041665796) * fVar181 + 0.16666666) * fVar181 + 0.5)) *
                         auVar258._4_4_ + fVar101;
                    auVar270._8_4_ =
                         (fVar229 + fVar130 +
                         fVar229 * fVar229 *
                         (((((fVar229 * 0.00019875691 + 0.0013981999) * fVar229 + 0.008333452) *
                            fVar229 + 0.041665796) * fVar229 + 0.16666666) * fVar229 + 0.5)) *
                         auVar258._8_4_ + fVar130;
                    auVar270._12_4_ =
                         (fVar230 + fVar131 +
                         fVar230 * fVar230 *
                         (((((fVar230 * 0.00019875691 + 0.0013981999) * fVar230 + 0.008333452) *
                            fVar230 + 0.041665796) * fVar230 + 0.16666666) * fVar230 + 0.5)) *
                         auVar258._12_4_ + fVar131;
                    auVar143._8_4_ = 0x800000;
                    auVar143._0_8_ = 0x80000000800000;
                    auVar143._12_4_ = 0x800000;
                    auVar258 = vmaxps_avx(auVar270,auVar143);
                    auVar323 = vpsrld_avx(auVar258,0x17);
                    auVar196._8_4_ = 0xffffff82;
                    auVar196._0_8_ = 0xffffff82ffffff82;
                    auVar196._12_4_ = 0xffffff82;
                    auVar323 = vpaddd_avx(auVar323,auVar196);
                    auVar197._8_4_ = 0x807fffff;
                    auVar197._0_8_ = 0x807fffff807fffff;
                    auVar197._12_4_ = 0x807fffff;
                    auVar258 = vandps_avx(auVar258,auVar197);
                    auVar88 = vorps_avx(auVar258,auVar250);
                    auVar305 = vcvtdq2ps_avx(auVar323);
                    auVar198._8_4_ = 0x3f3504f3;
                    auVar198._0_8_ = 0x3f3504f33f3504f3;
                    auVar198._12_4_ = 0x3f3504f3;
                    auVar323 = vcmpps_avx(auVar88,auVar198,1);
                    auVar258 = vandps_avx(auVar323,auVar88);
                    fVar236 = auVar88._0_4_ + -1.0 + auVar258._0_4_;
                    fVar181 = auVar88._4_4_ + -1.0 + auVar258._4_4_;
                    fVar229 = auVar88._8_4_ + -1.0 + auVar258._8_4_;
                    fVar230 = auVar88._12_4_ + -1.0 + auVar258._12_4_;
                    auVar258 = vandps_avx(auVar323,auVar182);
                    auVar323 = vsubps_avx(auVar305,auVar258);
                    auVar258 = vcmpps_avx(auVar270,_DAT_005930d0,2);
                    auVar144._0_4_ =
                         (fVar236 * fVar236 *
                          (((((((((fVar236 * 0.070376836 + -0.1151461) * fVar236 + 0.116769984) *
                                 fVar236 + -0.12420141) * fVar236 + 0.14249323) * fVar236 +
                              -0.16668057) * fVar236 + 0.20000714) * fVar236 + -0.24999994) *
                            fVar236 + 0.3333333) * fVar236 + -0.5) +
                         auVar323._0_4_ * 0.6931472 + fVar236) * -2.0;
                    auVar144._4_4_ =
                         (fVar181 * fVar181 *
                          (((((((((fVar181 * 0.070376836 + -0.1151461) * fVar181 + 0.116769984) *
                                 fVar181 + -0.12420141) * fVar181 + 0.14249323) * fVar181 +
                              -0.16668057) * fVar181 + 0.20000714) * fVar181 + -0.24999994) *
                            fVar181 + 0.3333333) * fVar181 + -0.5) +
                         auVar323._4_4_ * 0.6931472 + fVar181) * -2.0;
                    auVar144._8_4_ =
                         (fVar229 * fVar229 *
                          (((((((((fVar229 * 0.070376836 + -0.1151461) * fVar229 + 0.116769984) *
                                 fVar229 + -0.12420141) * fVar229 + 0.14249323) * fVar229 +
                              -0.16668057) * fVar229 + 0.20000714) * fVar229 + -0.24999994) *
                            fVar229 + 0.3333333) * fVar229 + -0.5) +
                         auVar323._8_4_ * 0.6931472 + fVar229) * -2.0;
                    auVar144._12_4_ =
                         (fVar230 * fVar230 *
                          (((((((((fVar230 * 0.070376836 + -0.1151461) * fVar230 + 0.116769984) *
                                 fVar230 + -0.12420141) * fVar230 + 0.14249323) * fVar230 +
                              -0.16668057) * fVar230 + 0.20000714) * fVar230 + -0.24999994) *
                            fVar230 + 0.3333333) * fVar230 + -0.5) +
                         auVar323._12_4_ * 0.6931472 + fVar230) * -2.0;
                    auVar199._8_4_ = 0x7fffffff;
                    auVar199._0_8_ = 0x7fffffff7fffffff;
                    auVar199._12_4_ = 0x7fffffff;
                    auVar258 = vblendvps_avx(auVar144,auVar199,auVar258);
                    auVar200._8_4_ = 0x42b0c0a5;
                    auVar200._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar200._12_4_ = 0x42b0c0a5;
                    auVar258 = vminps_avx(auVar258,auVar200);
                    auVar201._8_4_ = 0xc2b0c0a5;
                    auVar201._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar201._12_4_ = 0xc2b0c0a5;
                    auVar305 = vmaxps_avx(auVar258,auVar201);
                    auVar202._0_4_ = auVar305._0_4_ * 1.442695 + 0.5;
                    auVar202._4_4_ = auVar305._4_4_ * 1.442695 + 0.5;
                    auVar202._8_4_ = auVar305._8_4_ * 1.442695 + 0.5;
                    auVar202._12_4_ = auVar305._12_4_ * 1.442695 + 0.5;
                    auVar271._0_4_ = (int)auVar202._0_4_;
                    auVar271._4_4_ = (int)auVar202._4_4_;
                    auVar271._8_4_ = (int)auVar202._8_4_;
                    auVar271._12_4_ = (int)auVar202._12_4_;
                    auVar323 = vcvtdq2ps_avx(auVar271);
                    auVar258 = vcmpps_avx(auVar202,auVar323,1);
                    auVar258 = vandps_avx(auVar258,auVar182);
                    auVar258 = vsubps_avx(auVar323,auVar258);
                    auVar272._0_4_ = auVar258._0_4_ * 0.6931472;
                    auVar272._4_4_ = auVar258._4_4_ * 0.6931472;
                    auVar272._8_4_ = auVar258._8_4_ * 0.6931472;
                    auVar272._12_4_ = auVar258._12_4_ * 0.6931472;
                    auVar254 = ZEXT1664(auVar182);
                    auVar323 = vsubps_avx(auVar305,auVar272);
                    fVar236 = auVar323._0_4_;
                    fVar181 = auVar323._4_4_;
                    fVar229 = auVar323._8_4_;
                    fVar230 = auVar323._12_4_;
                    auVar203._0_4_ = (int)auVar258._0_4_;
                    auVar203._4_4_ = (int)auVar258._4_4_;
                    auVar203._8_4_ = (int)auVar258._8_4_;
                    auVar203._12_4_ = (int)auVar258._12_4_;
                    auVar258 = vpslld_avx(auVar203,0x17);
                    auVar182 = vpaddd_avx(auVar258,auVar182);
                    auVar145._0_4_ =
                         (fVar236 + fVar85 +
                         (((((fVar236 * 0.00019875691 + 0.0013981999) * fVar236 + 0.008333452) *
                            fVar236 + 0.041665796) * fVar236 + 0.16666666) * fVar236 + 0.5) *
                         fVar236 * fVar236) * auVar182._0_4_ + fVar85;
                    auVar145._4_4_ =
                         (fVar181 + fVar101 +
                         (((((fVar181 * 0.00019875691 + 0.0013981999) * fVar181 + 0.008333452) *
                            fVar181 + 0.041665796) * fVar181 + 0.16666666) * fVar181 + 0.5) *
                         fVar181 * fVar181) * auVar182._4_4_ + fVar101;
                    auVar145._8_4_ =
                         (fVar229 + fVar130 +
                         (((((fVar229 * 0.00019875691 + 0.0013981999) * fVar229 + 0.008333452) *
                            fVar229 + 0.041665796) * fVar229 + 0.16666666) * fVar229 + 0.5) *
                         fVar229 * fVar229) * auVar182._8_4_ + fVar130;
                    auVar145._12_4_ =
                         (fVar230 + fVar131 +
                         (((((fVar230 * 0.00019875691 + 0.0013981999) * fVar230 + 0.008333452) *
                            fVar230 + 0.041665796) * fVar230 + 0.16666666) * fVar230 + 0.5) *
                         fVar230 * fVar230) * auVar182._12_4_ + fVar131;
                    auVar182 = vrcpps_avx(auVar145);
                    fVar85 = auVar182._0_4_;
                    fVar101 = auVar182._4_4_;
                    fVar130 = auVar182._8_4_;
                    fVar131 = auVar182._12_4_;
                    auVar146._0_4_ = auVar145._0_4_ * (fVar85 + fVar85);
                    auVar146._4_4_ = auVar145._4_4_ * (fVar101 + fVar101);
                    auVar146._8_4_ = auVar145._8_4_ * (fVar130 + fVar130);
                    auVar146._12_4_ = auVar145._12_4_ * (fVar131 + fVar131);
                    auVar242._8_4_ = 0x40000000;
                    auVar242._0_8_ = 0x4000000040000000;
                    auVar242._12_4_ = 0x40000000;
                    auVar182 = vsubps_avx(auVar242,auVar146);
                    auVar147._0_4_ = fVar85 + fVar85 + -1.0 + fVar85 * auVar182._0_4_;
                    auVar147._4_4_ = fVar101 + fVar101 + -1.0 + fVar101 * auVar182._4_4_;
                    auVar147._8_4_ = fVar130 + fVar130 + -1.0 + fVar130 * auVar182._8_4_;
                    auVar147._12_4_ = fVar131 + fVar131 + -1.0 + fVar131 * auVar182._12_4_;
                    goto LAB_00298766;
                  case 6:
                    fVar85 = **(float **)(&this->field_0x118 + (long)p_Var25);
                    fVar101 = (*(float **)(&this->field_0x118 + (long)p_Var25))[1];
                    auVar150._0_4_ = fVar85 * auVar113._0_4_ + fVar101;
                    auVar150._4_4_ = fVar85 * fVar237 + fVar101;
                    auVar150._8_4_ = fVar85 * fVar132 + fVar101;
                    auVar150._12_4_ = fVar85 * fVar234 + fVar101;
                    auVar258 = vmaxps_avx(auVar150,_DAT_005930d0);
                    auVar147 = vminps_avx(auVar258,auVar182);
LAB_00298766:
                    auVar113._0_4_ = auVar147._0_4_ * auVar113._0_4_;
                    auVar113._4_4_ = auVar147._4_4_ * fVar237;
                    auVar113._8_4_ = auVar147._8_4_ * fVar132;
                    auVar113._12_4_ = auVar147._12_4_ * fVar234;
                  }
                  *(undefined1 (*) [16])pAVar71 = auVar113;
                  pAVar71 = pAVar71 + 2;
                  uVar78 = uVar78 + 1;
                  iVar57 = iVar57 + 1;
                } while (uVar78 != local_1a8.w);
              }
              iVar65 = iVar65 + 1;
            } while (iVar65 != local_1a8.h);
          }
          local_270 = local_270 + 1;
        } while (local_270 != local_1a8.c);
      }
      if ((((int)local_160 == 1) && (uVar77 == 4)) && (0 < (long)local_1a8.c)) {
        p_Var25 = local_148[-3];
        iVar82 = *(int *)(&this->field_0xdc + (long)p_Var25);
        iVar61 = *(int *)(&this->field_0xe0 + (long)p_Var25);
        iVar62 = *(int *)(&this->field_0xe4 + (long)p_Var25);
        iVar64 = *(int *)(&this->field_0xe8 + (long)p_Var25);
        uVar23 = *(undefined4 *)(&this->field_0x114 + (long)p_Var25);
        lVar80 = *(long *)(&this->field_0x1a8 + (long)p_Var25);
        uVar21 = *(uint *)(&this->field_0xd4 + (long)p_Var25);
        uVar22 = *(uint *)(&this->field_0xd8 + (long)p_Var25);
        local_270 = 0;
        auVar251._8_4_ = 0x3f000000;
        auVar251._0_8_ = 0x3f0000003f000000;
        auVar251._12_4_ = 0x3f000000;
        auVar254 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        do {
          if (0 < local_1a8.h) {
            iVar73 = bottom_blob->w;
            iVar79 = bottom_blob->h;
            pAVar71 = (Allocator *)
                      ((long)(_func_int ***)local_1a8.data +
                      local_1a8.cstep * local_270 *
                      CONCAT44(local_1a8.elemsize._4_4_,(int)local_1a8.elemsize));
            uVar24 = bottom_blob->c;
            iVar65 = 0;
            do {
              if (0 < local_1a8.w) {
                uVar78 = 0;
                iVar57 = (1 - uVar21) * iVar82;
                do {
                  if (lVar80 == 0) {
                    auVar117 = ZEXT816(0) << 0x40;
                  }
                  else {
                    auVar117 = *(undefined1 (*) [16])(lVar80 + local_270 * 0x10);
                  }
                  auVar319 = ZEXT1664(auVar117);
                  if (0 < (int)uVar24) {
                    pvVar84 = (void *)((this->weight_data_tm).cstep * local_270 *
                                       (this->weight_data_tm).elemsize +
                                      (long)(this->weight_data_tm).data);
                    uVar63 = 0;
                    do {
                      if (0 < (int)uVar22) {
                        uVar83 = 0;
                        uVar81 = 0;
                        do {
                          iVar53 = (((int)uVar81 - uVar22) + 1) * iVar61 + iVar65;
                          if (((-1 < iVar53) && (iVar54 = iVar53 / iVar64, iVar53 % iVar64 == 0)) &&
                             ((iVar54 < iVar79 && (0 < (int)uVar21)))) {
                            uVar75 = uVar83;
                            uVar68 = (ulong)uVar21;
                            iVar53 = iVar57;
                            do {
                              if (((-1 < iVar53) && (iVar55 = iVar53 / iVar62, iVar53 % iVar62 == 0)
                                  ) && (iVar55 < iVar73)) {
                                fVar85 = *(float *)((long)bottom_blob->data +
                                                   (long)iVar55 * 4 +
                                                   (long)iVar54 *
                                                   (long)bottom_blob->w * bottom_blob->elemsize +
                                                   bottom_blob->cstep * bottom_blob->elemsize *
                                                   uVar63);
                                pfVar66 = (float *)((long)pvVar84 + (uVar75 & 0xffffffff) * 4);
                                auVar319 = ZEXT1664(CONCAT412(fVar85 * pfVar66[3] + auVar319._12_4_,
                                                              CONCAT48(fVar85 * pfVar66[2] +
                                                                       auVar319._8_4_,
                                                                       CONCAT44(fVar85 * pfVar66[1]
                                                                                + auVar319._4_4_,
                                                                                fVar85 * *pfVar66 +
                                                                                auVar319._0_4_))));
                              }
                              uVar75 = uVar75 + 4;
                              iVar53 = iVar53 + iVar82;
                              uVar68 = uVar68 - 1;
                            } while (uVar68 != 0);
                          }
                          uVar81 = uVar81 + 1;
                          uVar83 = uVar83 + (ulong)uVar21 * 4;
                        } while (uVar81 != uVar22);
                      }
                      auVar117 = auVar319._0_16_;
                      pvVar84 = (void *)((long)pvVar84 + (long)(int)(uVar21 * uVar22 * 4) * 4);
                      uVar63 = uVar63 + 1;
                    } while (uVar63 != uVar24);
                  }
                  auVar182 = auVar254._0_16_;
                  fVar85 = auVar254._0_4_;
                  fVar101 = auVar254._4_4_;
                  fVar130 = auVar254._8_4_;
                  fVar131 = auVar254._12_4_;
                  fVar237 = auVar117._4_4_;
                  fVar132 = auVar117._8_4_;
                  fVar234 = auVar117._12_4_;
                  switch(uVar23) {
                  case 1:
                    auVar117 = vmaxps_avx(auVar117,_DAT_005930d0);
                    break;
                  case 2:
                    auVar182 = vmaxps_avx(auVar117,ZEXT816(0) << 0x40);
                    auVar258 = vminps_avx(auVar117,ZEXT816(0) << 0x40);
                    fVar85 = **(float **)(&this->field_0x118 + (long)p_Var25);
                    auVar117._0_4_ = fVar85 * auVar258._0_4_ + auVar182._0_4_;
                    auVar117._4_4_ = fVar85 * auVar258._4_4_ + auVar182._4_4_;
                    auVar117._8_4_ = fVar85 * auVar258._8_4_ + auVar182._8_4_;
                    auVar117._12_4_ = fVar85 * auVar258._12_4_ + auVar182._12_4_;
                    break;
                  case 3:
                    uVar7 = **(undefined4 **)(&this->field_0x118 + (long)p_Var25);
                    auVar280._4_4_ = uVar7;
                    auVar280._0_4_ = uVar7;
                    auVar280._8_4_ = uVar7;
                    auVar280._12_4_ = uVar7;
                    uVar7 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var25))[1];
                    auVar347._4_4_ = uVar7;
                    auVar347._0_4_ = uVar7;
                    auVar347._8_4_ = uVar7;
                    auVar347._12_4_ = uVar7;
                    auVar182 = vmaxps_avx(auVar117,auVar280);
                    auVar117 = vminps_avx(auVar347,auVar182);
                    break;
                  case 4:
                    auVar118._0_8_ = auVar117._0_8_ ^ 0x8000000080000000;
                    auVar118._8_4_ = -fVar132;
                    auVar118._12_4_ = -fVar234;
                    auVar156._8_4_ = 0x42b0c0a5;
                    auVar156._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar156._12_4_ = 0x42b0c0a5;
                    auVar258 = vminps_avx(auVar118,auVar156);
                    auVar157._8_4_ = 0xc2b0c0a5;
                    auVar157._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar157._12_4_ = 0xc2b0c0a5;
                    auVar305 = vmaxps_avx(auVar258,auVar157);
                    auVar281._0_4_ = auVar305._0_4_ * 1.442695 + 0.5;
                    auVar281._4_4_ = auVar305._4_4_ * 1.442695 + 0.5;
                    auVar281._8_4_ = auVar305._8_4_ * 1.442695 + 0.5;
                    auVar281._12_4_ = auVar305._12_4_ * 1.442695 + 0.5;
                    auVar348._0_4_ = (int)auVar281._0_4_;
                    auVar348._4_4_ = (int)auVar281._4_4_;
                    auVar348._8_4_ = (int)auVar281._8_4_;
                    auVar348._12_4_ = (int)auVar281._12_4_;
                    auVar323 = vcvtdq2ps_avx(auVar348);
                    auVar258 = vcmpps_avx(auVar281,auVar323,1);
                    auVar258 = vandps_avx(auVar258,auVar182);
                    auVar258 = vsubps_avx(auVar323,auVar258);
                    fVar237 = auVar258._0_4_ * -0.6931472 + auVar305._0_4_;
                    fVar132 = auVar258._4_4_ * -0.6931472 + auVar305._4_4_;
                    fVar234 = auVar258._8_4_ * -0.6931472 + auVar305._8_4_;
                    fVar236 = auVar258._12_4_ * -0.6931472 + auVar305._12_4_;
                    auVar282._0_4_ = (int)auVar258._0_4_;
                    auVar282._4_4_ = (int)auVar258._4_4_;
                    auVar282._8_4_ = (int)auVar258._8_4_;
                    auVar282._12_4_ = (int)auVar258._12_4_;
                    auVar258 = vpslld_avx(auVar282,0x17);
                    auVar258 = vpaddd_avx(auVar258,auVar182);
                    auVar119._0_4_ =
                         (fVar237 * fVar237 *
                          (((((fVar237 * 0.00019875691 + 0.0013981999) * fVar237 + 0.008333452) *
                             fVar237 + 0.041665796) * fVar237 + 0.16666666) * fVar237 + 0.5) +
                         fVar237 + fVar85) * auVar258._0_4_ + fVar85;
                    auVar119._4_4_ =
                         (fVar132 * fVar132 *
                          (((((fVar132 * 0.00019875691 + 0.0013981999) * fVar132 + 0.008333452) *
                             fVar132 + 0.041665796) * fVar132 + 0.16666666) * fVar132 + 0.5) +
                         fVar132 + fVar101) * auVar258._4_4_ + fVar101;
                    auVar119._8_4_ =
                         (fVar234 * fVar234 *
                          (((((fVar234 * 0.00019875691 + 0.0013981999) * fVar234 + 0.008333452) *
                             fVar234 + 0.041665796) * fVar234 + 0.16666666) * fVar234 + 0.5) +
                         fVar234 + fVar130) * auVar258._8_4_ + fVar130;
                    auVar119._12_4_ =
                         (fVar236 * fVar236 *
                          (((((fVar236 * 0.00019875691 + 0.0013981999) * fVar236 + 0.008333452) *
                             fVar236 + 0.041665796) * fVar236 + 0.16666666) * fVar236 + 0.5) +
                         fVar236 + fVar131) * auVar258._12_4_ + fVar131;
                    auVar258 = vrcpps_avx(auVar119);
                    fVar85 = auVar258._0_4_;
                    auVar120._0_4_ = auVar119._0_4_ * fVar85;
                    fVar101 = auVar258._4_4_;
                    auVar120._4_4_ = auVar119._4_4_ * fVar101;
                    fVar130 = auVar258._8_4_;
                    auVar120._8_4_ = auVar119._8_4_ * fVar130;
                    fVar131 = auVar258._12_4_;
                    auVar120._12_4_ = auVar119._12_4_ * fVar131;
                    auVar182 = vsubps_avx(auVar182,auVar120);
                    auVar117._0_4_ = fVar85 + fVar85 * auVar182._0_4_;
                    auVar117._4_4_ = fVar101 + fVar101 * auVar182._4_4_;
                    auVar117._8_4_ = fVar130 + fVar130 * auVar182._8_4_;
                    auVar117._12_4_ = fVar131 + fVar131 * auVar182._12_4_;
                    break;
                  case 5:
                    auVar243._8_4_ = 0x42b0c0a5;
                    auVar243._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar243._12_4_ = 0x42b0c0a5;
                    auVar258 = vminps_avx(auVar117,auVar243);
                    auVar308._8_4_ = 0xc2b0c0a5;
                    auVar308._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar308._12_4_ = 0xc2b0c0a5;
                    auVar305 = vmaxps_avx(auVar308,auVar258);
                    auVar325._0_4_ = auVar305._0_4_ * 1.442695 + 0.5;
                    auVar325._4_4_ = auVar305._4_4_ * 1.442695 + 0.5;
                    auVar325._8_4_ = auVar305._8_4_ * 1.442695 + 0.5;
                    auVar325._12_4_ = auVar305._12_4_ * 1.442695 + 0.5;
                    auVar345._0_4_ = (int)auVar325._0_4_;
                    auVar345._4_4_ = (int)auVar325._4_4_;
                    auVar345._8_4_ = (int)auVar325._8_4_;
                    auVar345._12_4_ = (int)auVar325._12_4_;
                    auVar323 = vcvtdq2ps_avx(auVar345);
                    auVar258 = vcmpps_avx(auVar325,auVar323,1);
                    auVar258 = vandps_avx(auVar258,auVar182);
                    auVar258 = vsubps_avx(auVar323,auVar258);
                    auVar346._0_4_ = auVar258._0_4_ * 0.6931472;
                    auVar346._4_4_ = auVar258._4_4_ * 0.6931472;
                    auVar346._8_4_ = auVar258._8_4_ * 0.6931472;
                    auVar346._12_4_ = auVar258._12_4_ * 0.6931472;
                    auVar323 = vsubps_avx(auVar305,auVar346);
                    fVar236 = auVar323._0_4_;
                    fVar181 = auVar323._4_4_;
                    fVar229 = auVar323._8_4_;
                    fVar230 = auVar323._12_4_;
                    auVar276._0_4_ = (int)auVar258._0_4_;
                    auVar276._4_4_ = (int)auVar258._4_4_;
                    auVar276._8_4_ = (int)auVar258._8_4_;
                    auVar276._12_4_ = (int)auVar258._12_4_;
                    auVar258 = vpslld_avx(auVar276,0x17);
                    auVar258 = vpaddd_avx(auVar258,auVar182);
                    auVar277._0_4_ =
                         (fVar236 + fVar85 +
                         fVar236 * fVar236 *
                         (((((fVar236 * 0.00019875691 + 0.0013981999) * fVar236 + 0.008333452) *
                            fVar236 + 0.041665796) * fVar236 + 0.16666666) * fVar236 + 0.5)) *
                         auVar258._0_4_ + fVar85;
                    auVar277._4_4_ =
                         (fVar181 + fVar101 +
                         fVar181 * fVar181 *
                         (((((fVar181 * 0.00019875691 + 0.0013981999) * fVar181 + 0.008333452) *
                            fVar181 + 0.041665796) * fVar181 + 0.16666666) * fVar181 + 0.5)) *
                         auVar258._4_4_ + fVar101;
                    auVar277._8_4_ =
                         (fVar229 + fVar130 +
                         fVar229 * fVar229 *
                         (((((fVar229 * 0.00019875691 + 0.0013981999) * fVar229 + 0.008333452) *
                            fVar229 + 0.041665796) * fVar229 + 0.16666666) * fVar229 + 0.5)) *
                         auVar258._8_4_ + fVar130;
                    auVar277._12_4_ =
                         (fVar230 + fVar131 +
                         fVar230 * fVar230 *
                         (((((fVar230 * 0.00019875691 + 0.0013981999) * fVar230 + 0.008333452) *
                            fVar230 + 0.041665796) * fVar230 + 0.16666666) * fVar230 + 0.5)) *
                         auVar258._12_4_ + fVar131;
                    auVar151._8_4_ = 0x800000;
                    auVar151._0_8_ = 0x80000000800000;
                    auVar151._12_4_ = 0x800000;
                    auVar258 = vmaxps_avx(auVar277,auVar151);
                    auVar323 = vpsrld_avx(auVar258,0x17);
                    auVar204._8_4_ = 0xffffff82;
                    auVar204._0_8_ = 0xffffff82ffffff82;
                    auVar204._12_4_ = 0xffffff82;
                    auVar323 = vpaddd_avx(auVar323,auVar204);
                    auVar205._8_4_ = 0x807fffff;
                    auVar205._0_8_ = 0x807fffff807fffff;
                    auVar205._12_4_ = 0x807fffff;
                    auVar258 = vandps_avx(auVar258,auVar205);
                    auVar88 = vorps_avx(auVar258,auVar251);
                    auVar305 = vcvtdq2ps_avx(auVar323);
                    auVar206._8_4_ = 0x3f3504f3;
                    auVar206._0_8_ = 0x3f3504f33f3504f3;
                    auVar206._12_4_ = 0x3f3504f3;
                    auVar323 = vcmpps_avx(auVar88,auVar206,1);
                    auVar258 = vandps_avx(auVar323,auVar88);
                    fVar236 = auVar88._0_4_ + -1.0 + auVar258._0_4_;
                    fVar181 = auVar88._4_4_ + -1.0 + auVar258._4_4_;
                    fVar229 = auVar88._8_4_ + -1.0 + auVar258._8_4_;
                    fVar230 = auVar88._12_4_ + -1.0 + auVar258._12_4_;
                    auVar258 = vandps_avx(auVar323,auVar182);
                    auVar323 = vsubps_avx(auVar305,auVar258);
                    auVar258 = vcmpps_avx(auVar277,_DAT_005930d0,2);
                    auVar152._0_4_ =
                         (fVar236 * fVar236 *
                          (((((((((fVar236 * 0.070376836 + -0.1151461) * fVar236 + 0.116769984) *
                                 fVar236 + -0.12420141) * fVar236 + 0.14249323) * fVar236 +
                              -0.16668057) * fVar236 + 0.20000714) * fVar236 + -0.24999994) *
                            fVar236 + 0.3333333) * fVar236 + -0.5) +
                         auVar323._0_4_ * 0.6931472 + fVar236) * -2.0;
                    auVar152._4_4_ =
                         (fVar181 * fVar181 *
                          (((((((((fVar181 * 0.070376836 + -0.1151461) * fVar181 + 0.116769984) *
                                 fVar181 + -0.12420141) * fVar181 + 0.14249323) * fVar181 +
                              -0.16668057) * fVar181 + 0.20000714) * fVar181 + -0.24999994) *
                            fVar181 + 0.3333333) * fVar181 + -0.5) +
                         auVar323._4_4_ * 0.6931472 + fVar181) * -2.0;
                    auVar152._8_4_ =
                         (fVar229 * fVar229 *
                          (((((((((fVar229 * 0.070376836 + -0.1151461) * fVar229 + 0.116769984) *
                                 fVar229 + -0.12420141) * fVar229 + 0.14249323) * fVar229 +
                              -0.16668057) * fVar229 + 0.20000714) * fVar229 + -0.24999994) *
                            fVar229 + 0.3333333) * fVar229 + -0.5) +
                         auVar323._8_4_ * 0.6931472 + fVar229) * -2.0;
                    auVar152._12_4_ =
                         (fVar230 * fVar230 *
                          (((((((((fVar230 * 0.070376836 + -0.1151461) * fVar230 + 0.116769984) *
                                 fVar230 + -0.12420141) * fVar230 + 0.14249323) * fVar230 +
                              -0.16668057) * fVar230 + 0.20000714) * fVar230 + -0.24999994) *
                            fVar230 + 0.3333333) * fVar230 + -0.5) +
                         auVar323._12_4_ * 0.6931472 + fVar230) * -2.0;
                    auVar207._8_4_ = 0x7fffffff;
                    auVar207._0_8_ = 0x7fffffff7fffffff;
                    auVar207._12_4_ = 0x7fffffff;
                    auVar258 = vblendvps_avx(auVar152,auVar207,auVar258);
                    auVar208._8_4_ = 0x42b0c0a5;
                    auVar208._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar208._12_4_ = 0x42b0c0a5;
                    auVar258 = vminps_avx(auVar258,auVar208);
                    auVar209._8_4_ = 0xc2b0c0a5;
                    auVar209._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar209._12_4_ = 0xc2b0c0a5;
                    auVar305 = vmaxps_avx(auVar258,auVar209);
                    auVar210._0_4_ = auVar305._0_4_ * 1.442695 + 0.5;
                    auVar210._4_4_ = auVar305._4_4_ * 1.442695 + 0.5;
                    auVar210._8_4_ = auVar305._8_4_ * 1.442695 + 0.5;
                    auVar210._12_4_ = auVar305._12_4_ * 1.442695 + 0.5;
                    auVar278._0_4_ = (int)auVar210._0_4_;
                    auVar278._4_4_ = (int)auVar210._4_4_;
                    auVar278._8_4_ = (int)auVar210._8_4_;
                    auVar278._12_4_ = (int)auVar210._12_4_;
                    auVar323 = vcvtdq2ps_avx(auVar278);
                    auVar258 = vcmpps_avx(auVar210,auVar323,1);
                    auVar258 = vandps_avx(auVar258,auVar182);
                    auVar258 = vsubps_avx(auVar323,auVar258);
                    auVar279._0_4_ = auVar258._0_4_ * 0.6931472;
                    auVar279._4_4_ = auVar258._4_4_ * 0.6931472;
                    auVar279._8_4_ = auVar258._8_4_ * 0.6931472;
                    auVar279._12_4_ = auVar258._12_4_ * 0.6931472;
                    auVar254 = ZEXT1664(auVar182);
                    auVar323 = vsubps_avx(auVar305,auVar279);
                    fVar236 = auVar323._0_4_;
                    fVar181 = auVar323._4_4_;
                    fVar229 = auVar323._8_4_;
                    fVar230 = auVar323._12_4_;
                    auVar211._0_4_ = (int)auVar258._0_4_;
                    auVar211._4_4_ = (int)auVar258._4_4_;
                    auVar211._8_4_ = (int)auVar258._8_4_;
                    auVar211._12_4_ = (int)auVar258._12_4_;
                    auVar258 = vpslld_avx(auVar211,0x17);
                    auVar182 = vpaddd_avx(auVar258,auVar182);
                    auVar153._0_4_ =
                         (fVar236 + fVar85 +
                         (((((fVar236 * 0.00019875691 + 0.0013981999) * fVar236 + 0.008333452) *
                            fVar236 + 0.041665796) * fVar236 + 0.16666666) * fVar236 + 0.5) *
                         fVar236 * fVar236) * auVar182._0_4_ + fVar85;
                    auVar153._4_4_ =
                         (fVar181 + fVar101 +
                         (((((fVar181 * 0.00019875691 + 0.0013981999) * fVar181 + 0.008333452) *
                            fVar181 + 0.041665796) * fVar181 + 0.16666666) * fVar181 + 0.5) *
                         fVar181 * fVar181) * auVar182._4_4_ + fVar101;
                    auVar153._8_4_ =
                         (fVar229 + fVar130 +
                         (((((fVar229 * 0.00019875691 + 0.0013981999) * fVar229 + 0.008333452) *
                            fVar229 + 0.041665796) * fVar229 + 0.16666666) * fVar229 + 0.5) *
                         fVar229 * fVar229) * auVar182._8_4_ + fVar130;
                    auVar153._12_4_ =
                         (fVar230 + fVar131 +
                         (((((fVar230 * 0.00019875691 + 0.0013981999) * fVar230 + 0.008333452) *
                            fVar230 + 0.041665796) * fVar230 + 0.16666666) * fVar230 + 0.5) *
                         fVar230 * fVar230) * auVar182._12_4_ + fVar131;
                    auVar182 = vrcpps_avx(auVar153);
                    fVar85 = auVar182._0_4_;
                    fVar101 = auVar182._4_4_;
                    fVar130 = auVar182._8_4_;
                    fVar131 = auVar182._12_4_;
                    auVar154._0_4_ = auVar153._0_4_ * (fVar85 + fVar85);
                    auVar154._4_4_ = auVar153._4_4_ * (fVar101 + fVar101);
                    auVar154._8_4_ = auVar153._8_4_ * (fVar130 + fVar130);
                    auVar154._12_4_ = auVar153._12_4_ * (fVar131 + fVar131);
                    auVar244._8_4_ = 0x40000000;
                    auVar244._0_8_ = 0x4000000040000000;
                    auVar244._12_4_ = 0x40000000;
                    auVar182 = vsubps_avx(auVar244,auVar154);
                    auVar155._0_4_ = fVar85 + fVar85 + -1.0 + fVar85 * auVar182._0_4_;
                    auVar155._4_4_ = fVar101 + fVar101 + -1.0 + fVar101 * auVar182._4_4_;
                    auVar155._8_4_ = fVar130 + fVar130 + -1.0 + fVar130 * auVar182._8_4_;
                    auVar155._12_4_ = fVar131 + fVar131 + -1.0 + fVar131 * auVar182._12_4_;
                    goto LAB_00298f1e;
                  case 6:
                    fVar85 = **(float **)(&this->field_0x118 + (long)p_Var25);
                    fVar101 = (*(float **)(&this->field_0x118 + (long)p_Var25))[1];
                    auVar158._0_4_ = fVar85 * auVar117._0_4_ + fVar101;
                    auVar158._4_4_ = fVar85 * fVar237 + fVar101;
                    auVar158._8_4_ = fVar85 * fVar132 + fVar101;
                    auVar158._12_4_ = fVar85 * fVar234 + fVar101;
                    auVar258 = vmaxps_avx(auVar158,_DAT_005930d0);
                    auVar155 = vminps_avx(auVar258,auVar182);
LAB_00298f1e:
                    auVar117._0_4_ = auVar155._0_4_ * auVar117._0_4_;
                    auVar117._4_4_ = auVar155._4_4_ * fVar237;
                    auVar117._8_4_ = auVar155._8_4_ * fVar132;
                    auVar117._12_4_ = auVar155._12_4_ * fVar234;
                  }
                  *(undefined1 (*) [16])pAVar71 = auVar117;
                  pAVar71 = pAVar71 + 2;
                  uVar78 = uVar78 + 1;
                  iVar57 = iVar57 + 1;
                } while (uVar78 != local_1a8.w);
              }
              iVar65 = iVar65 + 1;
            } while (iVar65 != local_1a8.h);
          }
          local_270 = local_270 + 1;
        } while (local_270 != local_1a8.c);
      }
      if ((((int)local_160 == 4) && (uVar77 == 1)) && (local_120 = (long)local_1a8.c, 0 < local_120)
         ) {
        p_Var25 = local_148[-3];
        iVar82 = *(int *)(&this->field_0xdc + (long)p_Var25);
        iVar61 = *(int *)(&this->field_0xe0 + (long)p_Var25);
        iVar62 = *(int *)(&this->field_0xe4 + (long)p_Var25);
        iVar64 = *(int *)(&this->field_0xe8 + (long)p_Var25);
        uVar23 = *(undefined4 *)(&this->field_0x114 + (long)p_Var25);
        lVar80 = *(long *)(&this->field_0x1a8 + (long)p_Var25);
        uVar21 = *(uint *)(&this->field_0xd4 + (long)p_Var25);
        uVar22 = *(uint *)(&this->field_0xd8 + (long)p_Var25);
        local_130 = CONCAT44(local_1a8.elemsize._4_4_,(int)local_1a8.elemsize) * local_1a8.cstep;
        local_138 = (Allocator *)local_1a8.data;
        iVar73 = bottom_blob->w;
        iVar79 = bottom_blob->h;
        uVar24 = bottom_blob->c;
        local_270 = 0;
        do {
          if (0 < iVar20) {
            sVar30 = (this->weight_data_tm).cstep;
            sVar31 = (this->weight_data_tm).elemsize;
            local_228 = (Allocator *)((long)&local_138->_vptr_Allocator + local_130 * local_270);
            pvVar84 = (this->weight_data_tm).data;
            iVar65 = 0;
            do {
              if (0 < iVar19) {
                iVar53 = bottom_blob->w;
                pvVar29 = bottom_blob->data;
                sVar32 = bottom_blob->elemsize;
                sVar33 = bottom_blob->cstep;
                pfVar66 = *(float **)(&this->field_0x118 + (long)p_Var25);
                uVar78 = 0;
                iVar57 = (1 - uVar21) * iVar82;
                do {
                  if (lVar80 == 0) {
                    fVar85 = 0.0;
                  }
                  else {
                    fVar85 = *(float *)(lVar80 + local_270 * 4);
                  }
                  if ((int)uVar24 < 1) {
                    auVar182 = SUB6416(ZEXT864(0),0);
                  }
                  else {
                    auVar254 = ZEXT864(0);
                    uVar63 = 0;
                    pvVar72 = (void *)(sVar30 * local_270 * sVar31 + (long)pvVar84);
                    do {
                      if (0 < (int)uVar22) {
                        uVar83 = 0;
                        uVar81 = 0;
                        do {
                          iVar54 = (((int)uVar81 - uVar22) + 1) * iVar61 + iVar65;
                          if (((-1 < iVar54) && (iVar55 = iVar54 / iVar64, iVar54 % iVar64 == 0)) &&
                             ((0 < (int)uVar21 && (iVar55 < iVar79)))) {
                            uVar75 = (ulong)uVar21;
                            uVar68 = uVar83;
                            iVar54 = iVar57;
                            do {
                              if (((-1 < iVar54) && (iVar56 = iVar54 / iVar62, iVar54 % iVar62 == 0)
                                  ) && (iVar56 < iVar73)) {
                                pfVar67 = (float *)((long)pvVar72 + (uVar68 & 0xffffffff) * 4);
                                pfVar1 = (float *)((long)pvVar29 +
                                                  (long)(iVar56 << 2) * 4 +
                                                  (long)iVar55 * (long)iVar53 * sVar32 +
                                                  sVar33 * sVar32 * uVar63);
                                auVar254 = ZEXT1664(CONCAT412(pfVar67[3] * pfVar1[3] +
                                                              auVar254._12_4_,
                                                              CONCAT48(pfVar67[2] * pfVar1[2] +
                                                                       auVar254._8_4_,
                                                                       CONCAT44(pfVar67[1] *
                                                                                pfVar1[1] +
                                                                                auVar254._4_4_,
                                                                                *pfVar67 * *pfVar1 +
                                                                                auVar254._0_4_))));
                              }
                              uVar68 = uVar68 + 4;
                              iVar54 = iVar54 + iVar82;
                              uVar75 = uVar75 - 1;
                            } while (uVar75 != 0);
                          }
                          uVar81 = uVar81 + 1;
                          uVar83 = uVar83 + (ulong)uVar21 * 4;
                        } while (uVar81 != uVar22);
                      }
                      auVar182 = auVar254._0_16_;
                      pvVar72 = (void *)((long)pvVar72 + (long)(int)(uVar21 * uVar22 * 4) * 4);
                      uVar63 = uVar63 + 1;
                    } while (uVar63 != uVar24);
                  }
                  auVar258 = vshufpd_avx(auVar182,auVar182,1);
                  auVar121._0_4_ = auVar258._0_4_ + auVar182._0_4_;
                  auVar121._4_4_ = auVar258._4_4_ + auVar182._4_4_;
                  auVar121._8_4_ = auVar258._8_4_ + auVar182._8_4_;
                  auVar121._12_4_ = auVar258._12_4_ + auVar182._12_4_;
                  auVar182 = vmovshdup_avx(auVar121);
                  fVar85 = auVar182._0_4_ + fVar85 + auVar121._0_4_;
                  auVar182 = ZEXT416((uint)fVar85);
                  fVar101 = fVar85;
                  switch(uVar23) {
                  case 1:
                    auVar182 = vmaxss_avx(ZEXT416((uint)fVar85),ZEXT416(0));
                    fVar101 = auVar182._0_4_;
                    break;
                  case 2:
                    auVar92._0_12_ = ZEXT812(0);
                    auVar92._12_4_ = 0;
                    auVar182 = vcmpss_avx(auVar92,auVar182,1);
                    auVar160._8_4_ = 0x3f800000;
                    auVar160._0_8_ = 0x3f8000003f800000;
                    auVar160._12_4_ = 0x3f800000;
                    auVar182 = vblendvps_avx(ZEXT416((uint)*pfVar66),auVar160,auVar182);
                    fVar101 = auVar182._0_4_;
LAB_0029939c:
                    fVar101 = fVar101 * fVar85;
                    break;
                  case 3:
                    auVar182 = vmaxss_avx(auVar182,ZEXT416((uint)*pfVar66));
                    fVar101 = auVar182._0_4_;
                    if (pfVar66[1] < auVar182._0_4_) {
                      fVar101 = pfVar66[1];
                    }
                    break;
                  case 4:
                    auVar182 = vminss_avx(auVar182,ZEXT416(0x42b0c0a5));
                    auVar122._0_8_ = auVar182._0_8_ ^ 0x8000000080000000;
                    auVar122._8_4_ = auVar182._8_4_ ^ 0x80000000;
                    auVar122._12_4_ = auVar182._12_4_ ^ 0x80000000;
                    auVar182 = vcmpss_avx(auVar182,ZEXT416(0xc2b0c0a5),1);
                    auVar159._8_4_ = 0x42b0c0a5;
                    auVar159._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar159._12_4_ = 0x42b0c0a5;
                    auVar182 = vblendvps_avx(auVar122,auVar159,auVar182);
                    fVar85 = expf(auVar182._0_4_);
                    fVar101 = 1.0 / (fVar85 + 1.0);
                    break;
                  case 5:
                    fVar101 = expf(fVar85);
                    fVar101 = logf(fVar101 + 1.0);
                    fVar101 = tanhf(fVar101);
                    fVar101 = fVar101 * fVar85;
                    break;
                  case 6:
                    fVar130 = *pfVar66;
                    fVar131 = -pfVar66[1] / fVar130;
                    fVar101 = 0.0;
                    if ((fVar131 <= fVar85) && (fVar101 = fVar85, fVar85 <= fVar131 + 1.0 / fVar130)
                       ) {
                      fVar101 = fVar130 * fVar85 + pfVar66[1];
                      goto LAB_0029939c;
                    }
                  }
                  *(float *)&local_228->_vptr_Allocator = fVar101;
                  local_228 = (Allocator *)((long)&local_228->_vptr_Allocator + 4);
                  uVar78 = uVar78 + 1;
                  iVar57 = iVar57 + 1;
                } while (uVar78 != iVar19);
              }
              iVar65 = iVar65 + 1;
            } while (iVar65 != iVar20);
          }
          local_270 = local_270 + 1;
        } while (local_270 != local_120);
      }
      iVar20 = local_1a8.h;
      iVar19 = local_1a8.w;
      pvVar84 = local_1a8.data;
      if ((((int)local_160 == 1) && (uVar77 == 1)) &&
         (pp_Var27 = this->_vptr_Deconvolution_x86_avx,
         0 < *(int *)(&this->field_0xd0 + (long)pp_Var27[-3]))) {
        lVar80 = local_1a8.cstep * CONCAT44(local_1a8.elemsize._4_4_,(int)local_1a8.elemsize);
        iVar82 = bottom_blob->w;
        iVar61 = bottom_blob->h;
        uVar77 = bottom_blob->c;
        uVar63 = (ulong)(uint)local_1a8.w;
        lVar59 = (long)local_154;
        lVar74 = (long)local_1a8.w;
        local_150 = -local_150;
        local_1e8 = 0;
        do {
          if (0 < iVar20) {
            local_1d0 = (Allocator *)((long)(_func_int ***)pvVar84 + lVar80 * local_1e8);
            pp_Var34 = this->_vptr_Deconvolution_x86_avx;
            sVar30 = (this->weight_data_tm).cstep;
            sVar31 = (this->weight_data_tm).elemsize;
            pvVar29 = (this->weight_data_tm).data;
            iVar62 = 0;
            do {
              if (0 < iVar19) {
                iVar64 = bottom_blob->w;
                pvVar72 = bottom_blob->data;
                sVar32 = bottom_blob->elemsize;
                sVar33 = bottom_blob->cstep;
                pp_Var35 = this->_vptr_Deconvolution_x86_avx;
                iVar73 = iVar62 - local_14c;
                local_230 = local_150;
                uVar81 = 0;
                do {
                  p_Var25 = pp_Var34[-3];
                  if (*(int *)(&this->field_0x10c + (long)p_Var25) == 0) {
                    auVar254 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  else {
                    auVar254 = ZEXT464(*(uint *)(*(long *)(&this->field_0x1a8 + (long)p_Var25) +
                                                local_1e8 * 4));
                  }
                  auVar182 = auVar254._0_16_;
                  if (0 < (int)uVar77) {
                    p_Var25 = pp_Var35[-3];
                    uVar83 = 0;
                    local_250 = (void *)(sVar30 * sVar31 * local_1e8 + (long)pvVar29);
                    do {
                      if (0 < *(int *)(&this->field_0xd8 + (long)p_Var25)) {
                        iVar79 = 0;
                        do {
                          iVar65 = *(int *)(&this->field_0xe0 + (long)p_Var25) * iVar79 + iVar73;
                          if (((-1 < iVar65) &&
                              (iVar57 = iVar65 / *(int *)(&this->field_0xe8 + (long)p_Var25),
                              iVar65 % *(int *)(&this->field_0xe8 + (long)p_Var25) == 0)) &&
                             (iVar57 < iVar61)) {
                            iVar65 = *(int *)(&this->field_0xd4 + (long)p_Var25);
                            if (0 < (long)iVar65) {
                              lVar76 = 0;
                              iVar53 = local_230;
                              do {
                                if (((-1 < iVar53) &&
                                    (iVar54 = iVar53 / *(int *)(&this->field_0xe4 + (long)p_Var25),
                                    iVar53 % *(int *)(&this->field_0xe4 + (long)p_Var25) == 0)) &&
                                   (iVar54 < iVar82)) {
                                  auVar254 = ZEXT464((uint)(*(float *)((long)local_250 +
                                                                      lVar76 * 4 +
                                                                      (ulong)(uint)(iVar65 * iVar79)
                                                                      * 4) *
                                                            *(float *)((long)pvVar72 +
                                                                      (long)iVar54 * 4 +
                                                                      (long)iVar57 *
                                                                      (long)iVar64 * sVar32 +
                                                                      sVar33 * sVar32 * uVar83) +
                                                           auVar254._0_4_));
                                }
                                lVar76 = lVar76 + 1;
                                iVar53 = iVar53 + *(int *)(&this->field_0xdc + (long)p_Var25);
                              } while (iVar65 != lVar76);
                            }
                          }
                          iVar79 = iVar79 + 1;
                        } while (iVar79 != *(int *)(&this->field_0xd8 + (long)p_Var25));
                      }
                      auVar182 = auVar254._0_16_;
                      uVar83 = uVar83 + 1;
                      local_250 = (void *)((long)local_250 + lVar59 * 4);
                    } while (uVar83 != uVar77);
                  }
                  p_Var25 = pp_Var34[-3];
                  fVar101 = auVar182._0_4_;
                  fVar85 = fVar101;
                  switch(*(undefined4 *)(&this->field_0x114 + (long)p_Var25)) {
                  case 1:
                    auVar182 = vmaxss_avx(auVar182,ZEXT416(0));
                    fVar85 = auVar182._0_4_;
                    break;
                  case 2:
                    auVar182 = vcmpss_avx(ZEXT816(0) << 0x40,auVar182,1);
                    auVar162._8_4_ = 0x3f800000;
                    auVar162._0_8_ = 0x3f8000003f800000;
                    auVar162._12_4_ = 0x3f800000;
                    auVar182 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var25)
                                                    ),auVar162,auVar182);
                    fVar85 = auVar182._0_4_ * fVar101;
                    break;
                  case 3:
                    fVar101 = (float)(*(uint **)(&this->field_0x118 + (long)p_Var25))[1];
                    auVar182 = vmaxss_avx(auVar182,ZEXT416(**(uint **)(&this->field_0x118 +
                                                                      (long)p_Var25)));
                    fVar85 = auVar182._0_4_;
                    if (fVar101 < auVar182._0_4_) {
                      fVar85 = fVar101;
                    }
                    break;
                  case 4:
                    auVar182 = vminss_avx(auVar182,ZEXT416(0x42b0c0a5));
                    auVar123._0_8_ = auVar182._0_8_ ^ 0x8000000080000000;
                    auVar123._8_4_ = auVar182._8_4_ ^ 0x80000000;
                    auVar123._12_4_ = auVar182._12_4_ ^ 0x80000000;
                    auVar182 = vcmpss_avx(auVar182,ZEXT416(0xc2b0c0a5),1);
                    auVar161._8_4_ = 0x42b0c0a5;
                    auVar161._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar161._12_4_ = 0x42b0c0a5;
                    auVar182 = vblendvps_avx(auVar123,auVar161,auVar182);
                    fVar85 = expf(auVar182._0_4_);
                    fVar85 = 1.0 / (fVar85 + 1.0);
                    break;
                  case 5:
                    fVar85 = expf(fVar101);
                    fVar85 = logf(fVar85 + 1.0);
                    fVar85 = tanhf(fVar85);
                    fVar85 = fVar85 * fVar101;
                    break;
                  case 6:
                    fVar130 = **(float **)(&this->field_0x118 + (long)p_Var25);
                    fVar131 = (*(float **)(&this->field_0x118 + (long)p_Var25))[1];
                    fVar237 = -fVar131 / fVar130;
                    fVar85 = 0.0;
                    if ((fVar237 <= fVar101) &&
                       (fVar85 = fVar101, fVar101 <= fVar237 + 1.0 / fVar130)) {
                      fVar85 = (fVar130 * fVar101 + fVar131) * fVar101;
                    }
                  }
                  *(float *)((long)&local_1d0->_vptr_Allocator + uVar81 * 4) = fVar85;
                  uVar81 = uVar81 + 1;
                  local_230 = local_230 + 1;
                } while (uVar81 != uVar63);
              }
              local_1d0 = (Allocator *)((long)&local_1d0->_vptr_Allocator + lVar74 * 4);
              iVar62 = iVar62 + 1;
            } while (iVar62 != iVar20);
          }
          local_1e8 = local_1e8 + 1;
        } while (local_1e8 < *(int *)(&this->field_0xd0 + (long)pp_Var27[-3]));
      }
    }
    pMVar52 = local_128;
    Deconvolution::cut_padding
              ((Deconvolution *)
               ((long)&this->_vptr_Deconvolution_x86_avx +
               (long)this->_vptr_Deconvolution_x86_avx[-3]),&local_1a8,local_128,local_140);
    iVar62 = -100;
    if ((pMVar52->data != (void *)0x0) && (iVar62 = -100, (long)pMVar52->c * pMVar52->cstep != 0)) {
      iVar62 = 0;
    }
  }
  piVar26 = (int *)CONCAT44(local_1a8.refcount._4_4_,(int)local_1a8.refcount);
  if (piVar26 != (int *)0x0) {
    LOCK();
    *piVar26 = *piVar26 + -1;
    UNLOCK();
    if (*piVar26 == 0) {
      if (local_1a8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_1a8.data != (Allocator *)0x0) {
          free(local_1a8.data);
        }
      }
      else {
        (*(local_1a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar62;
}

Assistant:

int Deconvolution_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    int out_channels = num_output / out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    if (opt.use_sgemm_convolution)
    {
        // sgemm
        Mat bottom_blob_2 = bottom_blob;
        {
            bottom_blob_2.w = bottom_blob.w * bottom_blob.h;
            bottom_blob_2.h = 1;
        }
        Mat top_col2im;
        Option opt_b = opt;
        opt_b.blob_allocator = top_blob_bordered.allocator;
        gemm->forward(bottom_blob_2, top_col2im, opt_b);

        {
            // col2im
            const int gap = (outw * stride_h - w * stride_w) * out_elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 16)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm512_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm512_load_ps((const float*)bias_data + p * 16));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 16;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m512 _val = _mm512_load_ps(ptr);
                                    __m512 _s = _mm512_load_ps(sptr);
                                    _val = _mm512_add_ps(_val, _s);
                                    _mm512_store_ps(ptr, _val);

                                    ptr += stride_w * 16;
                                    sptr += 16;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX512F__

            if (out_elempack == 8)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm256_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm256_load_ps((const float*)bias_data + p * 8));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 8;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m256 _val = _mm256_load_ps(ptr);
                                    __m256 _s = _mm256_load_ps(sptr);
                                    _val = _mm256_add_ps(_val, _s);
                                    _mm256_store_ps(ptr, _val);

                                    ptr += stride_w * 8;
                                    sptr += 8;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX__

            if (out_elempack == 4)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm_load_ps((const float*)bias_data + p * 4));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 4;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m128 _val = _mm_load_ps(ptr);
                                    __m128 _s = _mm_load_ps(sptr);
                                    _val = _mm_add_ps(_val, _s);
                                    _mm_store_ps(ptr, _val);

                                    ptr += stride_w * 4;
                                    sptr += 4;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __SSE2__

            if (out_elempack == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    const float bias = bias_data.empty() ? 0.f : bias_data[p];
                    outm.fill(bias);

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    ptr[0] += sptr[0];

                                    ptr += stride_w;
                                    sptr += 1;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
        }

        if (activation)
        {
            activation->forward_inplace(top_blob_bordered, opt);
        }
    }
    else
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 16)
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 16)
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 8)
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 16)
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 4)
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 16)
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 1)
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX512F__

        if (elempack == 8 && out_elempack == 8)
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 8)
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 4)
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 8)
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 1)
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX__

        if (elempack == 4 && out_elempack == 4)
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 4)
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 1)
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __SSE2__

        if (elempack == 1 && out_elempack == 1)
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}